

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::avx::CurveNiMBIntersectorK<8,8>::
     intersect_h<embree::avx::RibbonCurve1IntersectorK<embree::HermiteCurveT,8,8>,embree::avx::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  float *pfVar8;
  undefined1 (*pauVar9) [28];
  undefined1 (*pauVar10) [32];
  undefined4 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  Primitive PVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  undefined4 uVar35;
  __int_type_conflict _Var36;
  long lVar37;
  RTCFilterFunctionN p_Var38;
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  float fVar133;
  float fVar134;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [16];
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [28];
  undefined1 auVar153 [28];
  undefined1 auVar154 [28];
  undefined1 auVar155 [24];
  uint uVar156;
  uint uVar157;
  uint uVar158;
  ulong uVar159;
  ulong uVar160;
  long lVar161;
  uint uVar162;
  long lVar163;
  long lVar164;
  Geometry *pGVar165;
  long lVar166;
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  float fVar167;
  float fVar191;
  float fVar192;
  float fVar194;
  float fVar196;
  float fVar198;
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  float fVar200;
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  float fVar193;
  float fVar195;
  float fVar197;
  float fVar199;
  float fVar201;
  float fVar202;
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [64];
  float fVar203;
  float fVar223;
  float fVar225;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar226;
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  float fVar224;
  float fVar227;
  float fVar228;
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  float fVar229;
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  float fVar230;
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  float fVar247;
  float fVar248;
  undefined1 auVar240 [32];
  float fVar250;
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  float fVar249;
  float fVar251;
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  float fVar252;
  float fVar269;
  undefined1 auVar253 [16];
  undefined1 auVar255 [16];
  float fVar266;
  float fVar268;
  float fVar270;
  float fVar272;
  float fVar274;
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar254 [16];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  float fVar271;
  float fVar273;
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  float fVar267;
  undefined1 auVar264 [32];
  undefined1 auVar265 [64];
  float fVar275;
  float fVar283;
  float fVar284;
  float fVar285;
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  float fVar286;
  float fVar287;
  float fVar288;
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  float fVar289;
  undefined1 auVar282 [32];
  float fVar290;
  float fVar291;
  float fVar297;
  float fVar299;
  undefined1 auVar292 [16];
  float fVar303;
  float fVar304;
  float fVar306;
  undefined1 auVar293 [32];
  float fVar298;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar308;
  undefined1 auVar294 [32];
  float fVar305;
  float fVar307;
  float fVar309;
  undefined1 auVar295 [32];
  undefined1 auVar296 [32];
  undefined1 auVar310 [16];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  float fVar317;
  undefined1 auVar316 [32];
  float fVar318;
  undefined1 auVar320 [16];
  float fVar327;
  float fVar328;
  float fVar329;
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  float fVar330;
  undefined1 auVar333 [16];
  float fVar331;
  float fVar343;
  float fVar345;
  float fVar348;
  undefined1 auVar334 [32];
  undefined1 auVar335 [32];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  float fVar344;
  float fVar346;
  undefined1 auVar340 [32];
  float fVar347;
  float fVar349;
  undefined1 auVar341 [32];
  undefined1 auVar342 [64];
  float fVar350;
  float fVar360;
  float fVar361;
  float fVar362;
  float fVar363;
  float fVar364;
  float fVar365;
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  float fVar366;
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [64];
  float fVar367;
  float fVar375;
  float fVar376;
  float fVar377;
  float fVar378;
  float fVar379;
  float fVar380;
  float fVar381;
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [64];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  undefined1 auVar387 [32];
  float in_register_0000151c;
  undefined1 auVar388 [32];
  undefined1 auVar389 [32];
  undefined1 auVar390 [32];
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  undefined1 auVar393 [32];
  undefined1 auVar394 [32];
  undefined1 auVar395 [32];
  undefined1 auVar396 [32];
  undefined1 auVar397 [32];
  float fVar398;
  float fVar403;
  float fVar404;
  float fVar406;
  undefined1 auVar399 [32];
  undefined1 auVar400 [32];
  float fVar405;
  float fVar407;
  undefined1 auVar401 [32];
  undefined1 auVar402 [32];
  float fVar408;
  float fVar409;
  float fVar410;
  float fVar411;
  float fVar415;
  float fVar418;
  float fVar419;
  float fVar421;
  float fVar422;
  float in_register_0000159c;
  undefined1 auVar413 [32];
  float fVar416;
  float fVar417;
  float fVar420;
  float fVar423;
  undefined1 auVar414 [32];
  float fVar424;
  float fVar428;
  float fVar429;
  float fVar430;
  float in_register_000015dc;
  undefined1 auVar425 [32];
  undefined1 auVar426 [32];
  undefined1 auVar427 [64];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  undefined8 uStack_928;
  undefined8 uStack_918;
  undefined8 local_8d0;
  undefined8 uStack_8c8;
  undefined8 uStack_8b8;
  RTCFilterFunctionNArguments local_8b0;
  undefined1 local_880 [32];
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined1 local_800 [32];
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined1 *local_7b8;
  undefined1 (*local_7b0) [16];
  undefined1 (*local_7a8) [32];
  undefined1 local_7a0 [16];
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float local_740;
  float fStack_73c;
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  float fStack_724;
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [8];
  float fStack_6f8;
  float fStack_6f4;
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  float fStack_6d0;
  float fStack_6cc;
  float fStack_6c8;
  float fStack_6c4;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [32];
  LinearSpace3fa *local_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float local_480;
  float fStack_47c;
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [32];
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  uint local_380;
  uint local_37c;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  float local_300 [4];
  float fStack_2f0;
  float fStack_2ec;
  float fStack_2e8;
  float fStack_2e4;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  RTCHitN local_220 [16];
  undefined1 auStack_210 [16];
  undefined1 local_200 [16];
  undefined1 auStack_1f0 [16];
  undefined1 local_1e0 [16];
  undefined1 auStack_1d0 [16];
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined4 local_1a0;
  undefined4 uStack_19c;
  undefined4 uStack_198;
  undefined4 uStack_194;
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined4 uStack_188;
  undefined4 uStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint uStack_130;
  uint uStack_12c;
  uint uStack_128;
  uint uStack_124;
  uint local_120;
  uint uStack_11c;
  uint uStack_118;
  uint uStack_114;
  uint uStack_110;
  uint uStack_10c;
  uint uStack_108;
  uint uStack_104;
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  undefined1 auVar319 [16];
  undefined1 auVar332 [16];
  undefined1 auVar412 [16];
  
  PVar31 = prim[1];
  uVar159 = (ulong)(byte)PVar31;
  lVar163 = uVar159 * 0x25;
  auVar169 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                           0x10);
  auVar169 = vinsertps_avx(auVar169,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar235 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                           ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar235 = vinsertps_avx(auVar235,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar169 = vsubps_avx(auVar169,*(undefined1 (*) [16])(prim + lVar163 + 6));
  fVar252 = *(float *)(prim + lVar163 + 0x12);
  auVar204._0_4_ = fVar252 * auVar169._0_4_;
  auVar204._4_4_ = fVar252 * auVar169._4_4_;
  auVar204._8_4_ = fVar252 * auVar169._8_4_;
  auVar204._12_4_ = fVar252 * auVar169._12_4_;
  auVar169 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar159 * 4 + 6)));
  auVar292._0_4_ = fVar252 * auVar235._0_4_;
  auVar292._4_4_ = fVar252 * auVar235._4_4_;
  auVar292._8_4_ = fVar252 * auVar235._8_4_;
  auVar292._12_4_ = fVar252 * auVar235._12_4_;
  auVar235 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar159 * 4 + 10)));
  auVar173._16_16_ = auVar235;
  auVar173._0_16_ = auVar169;
  auVar173 = vcvtdq2ps_avx(auVar173);
  lVar166 = uVar159 * 5;
  auVar169 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar166 + 6)));
  auVar235 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar166 + 10)));
  auVar240._16_16_ = auVar235;
  auVar240._0_16_ = auVar169;
  auVar169 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar159 * 6 + 6)));
  auVar235 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar159 * 6 + 10)));
  auVar180 = vcvtdq2ps_avx(auVar240);
  auVar256._16_16_ = auVar235;
  auVar256._0_16_ = auVar169;
  auVar39 = vcvtdq2ps_avx(auVar256);
  auVar169 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar159 * 0xf + 6)));
  auVar235 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar159 * 0xf + 10)));
  auVar257._16_16_ = auVar235;
  auVar257._0_16_ = auVar169;
  auVar40 = vcvtdq2ps_avx(auVar257);
  lVar164 = (ulong)(byte)PVar31 * 0x10;
  auVar169 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar164 + 6)));
  auVar235 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar164 + 10)));
  auVar311._16_16_ = auVar235;
  auVar311._0_16_ = auVar169;
  auVar169 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar164 + uVar159 + 6)));
  auVar41 = vcvtdq2ps_avx(auVar311);
  auVar235 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + lVar164 + uVar159 + 10)));
  auVar321._16_16_ = auVar235;
  auVar321._0_16_ = auVar169;
  auVar169 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar159 * 0x1a + 6)));
  auVar42 = vcvtdq2ps_avx(auVar321);
  auVar235 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar159 * 0x1a + 10)));
  auVar322._16_16_ = auVar235;
  auVar322._0_16_ = auVar169;
  auVar43 = vcvtdq2ps_avx(auVar322);
  auVar169 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar159 * 0x1b + 6)));
  auVar235 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar159 * 0x1b + 10)));
  auVar351._16_16_ = auVar235;
  auVar351._0_16_ = auVar169;
  auVar169 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar159 * 0x1c + 6)));
  auVar235 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar159 * 0x1c + 10)));
  auVar44 = vcvtdq2ps_avx(auVar351);
  auVar368._16_16_ = auVar235;
  auVar368._0_16_ = auVar169;
  auVar45 = vcvtdq2ps_avx(auVar368);
  auVar169 = vshufps_avx(auVar292,auVar292,0);
  auVar235 = vshufps_avx(auVar292,auVar292,0x55);
  auVar255 = vshufps_avx(auVar292,auVar292,0xaa);
  fVar252 = auVar255._0_4_;
  fVar223 = auVar255._4_4_;
  fVar266 = auVar255._8_4_;
  fVar226 = auVar255._12_4_;
  fVar250 = auVar235._0_4_;
  fVar267 = auVar235._4_4_;
  fVar269 = auVar235._8_4_;
  fVar251 = auVar235._12_4_;
  fVar270 = auVar169._0_4_;
  fVar272 = auVar169._4_4_;
  fVar274 = auVar169._8_4_;
  fVar275 = auVar169._12_4_;
  auVar388._0_4_ = fVar270 * auVar173._0_4_ + fVar250 * auVar180._0_4_ + fVar252 * auVar39._0_4_;
  auVar388._4_4_ = fVar272 * auVar173._4_4_ + fVar267 * auVar180._4_4_ + fVar223 * auVar39._4_4_;
  auVar388._8_4_ = fVar274 * auVar173._8_4_ + fVar269 * auVar180._8_4_ + fVar266 * auVar39._8_4_;
  auVar388._12_4_ = fVar275 * auVar173._12_4_ + fVar251 * auVar180._12_4_ + fVar226 * auVar39._12_4_
  ;
  auVar388._16_4_ = fVar270 * auVar173._16_4_ + fVar250 * auVar180._16_4_ + fVar252 * auVar39._16_4_
  ;
  auVar388._20_4_ = fVar272 * auVar173._20_4_ + fVar267 * auVar180._20_4_ + fVar223 * auVar39._20_4_
  ;
  auVar388._24_4_ = fVar274 * auVar173._24_4_ + fVar269 * auVar180._24_4_ + fVar266 * auVar39._24_4_
  ;
  auVar388._28_4_ = fVar251 + in_register_000015dc + in_register_0000151c;
  auVar382._0_4_ = fVar270 * auVar40._0_4_ + fVar250 * auVar41._0_4_ + auVar42._0_4_ * fVar252;
  auVar382._4_4_ = fVar272 * auVar40._4_4_ + fVar267 * auVar41._4_4_ + auVar42._4_4_ * fVar223;
  auVar382._8_4_ = fVar274 * auVar40._8_4_ + fVar269 * auVar41._8_4_ + auVar42._8_4_ * fVar266;
  auVar382._12_4_ = fVar275 * auVar40._12_4_ + fVar251 * auVar41._12_4_ + auVar42._12_4_ * fVar226;
  auVar382._16_4_ = fVar270 * auVar40._16_4_ + fVar250 * auVar41._16_4_ + auVar42._16_4_ * fVar252;
  auVar382._20_4_ = fVar272 * auVar40._20_4_ + fVar267 * auVar41._20_4_ + auVar42._20_4_ * fVar223;
  auVar382._24_4_ = fVar274 * auVar40._24_4_ + fVar269 * auVar41._24_4_ + auVar42._24_4_ * fVar266;
  auVar382._28_4_ = fVar251 + in_register_000015dc + in_register_0000159c;
  auVar293._0_4_ = fVar270 * auVar43._0_4_ + fVar250 * auVar44._0_4_ + auVar45._0_4_ * fVar252;
  auVar293._4_4_ = fVar272 * auVar43._4_4_ + fVar267 * auVar44._4_4_ + auVar45._4_4_ * fVar223;
  auVar293._8_4_ = fVar274 * auVar43._8_4_ + fVar269 * auVar44._8_4_ + auVar45._8_4_ * fVar266;
  auVar293._12_4_ = fVar275 * auVar43._12_4_ + fVar251 * auVar44._12_4_ + auVar45._12_4_ * fVar226;
  auVar293._16_4_ = fVar270 * auVar43._16_4_ + fVar250 * auVar44._16_4_ + auVar45._16_4_ * fVar252;
  auVar293._20_4_ = fVar272 * auVar43._20_4_ + fVar267 * auVar44._20_4_ + auVar45._20_4_ * fVar223;
  auVar293._24_4_ = fVar274 * auVar43._24_4_ + fVar269 * auVar44._24_4_ + auVar45._24_4_ * fVar266;
  auVar293._28_4_ = fVar275 + fVar251 + fVar226;
  auVar169 = vshufps_avx(auVar204,auVar204,0);
  auVar235 = vshufps_avx(auVar204,auVar204,0x55);
  auVar255 = vshufps_avx(auVar204,auVar204,0xaa);
  fVar252 = auVar255._0_4_;
  fVar223 = auVar255._4_4_;
  fVar266 = auVar255._8_4_;
  fVar226 = auVar255._12_4_;
  fVar272 = auVar235._0_4_;
  fVar274 = auVar235._4_4_;
  fVar275 = auVar235._8_4_;
  fVar283 = auVar235._12_4_;
  fVar250 = auVar180._28_4_ + auVar39._28_4_;
  fVar267 = auVar169._0_4_;
  fVar269 = auVar169._4_4_;
  fVar251 = auVar169._8_4_;
  fVar270 = auVar169._12_4_;
  auVar210._0_4_ = fVar267 * auVar173._0_4_ + fVar272 * auVar180._0_4_ + fVar252 * auVar39._0_4_;
  auVar210._4_4_ = fVar269 * auVar173._4_4_ + fVar274 * auVar180._4_4_ + fVar223 * auVar39._4_4_;
  auVar210._8_4_ = fVar251 * auVar173._8_4_ + fVar275 * auVar180._8_4_ + fVar266 * auVar39._8_4_;
  auVar210._12_4_ = fVar270 * auVar173._12_4_ + fVar283 * auVar180._12_4_ + fVar226 * auVar39._12_4_
  ;
  auVar210._16_4_ = fVar267 * auVar173._16_4_ + fVar272 * auVar180._16_4_ + fVar252 * auVar39._16_4_
  ;
  auVar210._20_4_ = fVar269 * auVar173._20_4_ + fVar274 * auVar180._20_4_ + fVar223 * auVar39._20_4_
  ;
  auVar210._24_4_ = fVar251 * auVar173._24_4_ + fVar275 * auVar180._24_4_ + fVar266 * auVar39._24_4_
  ;
  auVar210._28_4_ = auVar173._28_4_ + fVar250;
  auVar174._0_4_ = fVar267 * auVar40._0_4_ + auVar42._0_4_ * fVar252 + fVar272 * auVar41._0_4_;
  auVar174._4_4_ = fVar269 * auVar40._4_4_ + auVar42._4_4_ * fVar223 + fVar274 * auVar41._4_4_;
  auVar174._8_4_ = fVar251 * auVar40._8_4_ + auVar42._8_4_ * fVar266 + fVar275 * auVar41._8_4_;
  auVar174._12_4_ = fVar270 * auVar40._12_4_ + auVar42._12_4_ * fVar226 + fVar283 * auVar41._12_4_;
  auVar174._16_4_ = fVar267 * auVar40._16_4_ + auVar42._16_4_ * fVar252 + fVar272 * auVar41._16_4_;
  auVar174._20_4_ = fVar269 * auVar40._20_4_ + auVar42._20_4_ * fVar223 + fVar274 * auVar41._20_4_;
  auVar174._24_4_ = fVar251 * auVar40._24_4_ + auVar42._24_4_ * fVar266 + fVar275 * auVar41._24_4_;
  auVar174._28_4_ = auVar173._28_4_ + auVar42._28_4_ + auVar39._28_4_;
  auVar334._8_4_ = 0x7fffffff;
  auVar334._0_8_ = 0x7fffffff7fffffff;
  auVar334._12_4_ = 0x7fffffff;
  auVar334._16_4_ = 0x7fffffff;
  auVar334._20_4_ = 0x7fffffff;
  auVar334._24_4_ = 0x7fffffff;
  auVar334._28_4_ = 0x7fffffff;
  auVar258._8_4_ = 0x219392ef;
  auVar258._0_8_ = 0x219392ef219392ef;
  auVar258._12_4_ = 0x219392ef;
  auVar258._16_4_ = 0x219392ef;
  auVar258._20_4_ = 0x219392ef;
  auVar258._24_4_ = 0x219392ef;
  auVar258._28_4_ = 0x219392ef;
  auVar173 = vandps_avx(auVar388,auVar334);
  auVar173 = vcmpps_avx(auVar173,auVar258,1);
  auVar180 = vblendvps_avx(auVar388,auVar258,auVar173);
  auVar173 = vandps_avx(auVar382,auVar334);
  auVar173 = vcmpps_avx(auVar173,auVar258,1);
  auVar39 = vblendvps_avx(auVar382,auVar258,auVar173);
  auVar173 = vandps_avx(auVar334,auVar293);
  auVar173 = vcmpps_avx(auVar173,auVar258,1);
  auVar173 = vblendvps_avx(auVar293,auVar258,auVar173);
  auVar241._0_4_ = fVar267 * auVar43._0_4_ + fVar272 * auVar44._0_4_ + auVar45._0_4_ * fVar252;
  auVar241._4_4_ = fVar269 * auVar43._4_4_ + fVar274 * auVar44._4_4_ + auVar45._4_4_ * fVar223;
  auVar241._8_4_ = fVar251 * auVar43._8_4_ + fVar275 * auVar44._8_4_ + auVar45._8_4_ * fVar266;
  auVar241._12_4_ = fVar270 * auVar43._12_4_ + fVar283 * auVar44._12_4_ + auVar45._12_4_ * fVar226;
  auVar241._16_4_ = fVar267 * auVar43._16_4_ + fVar272 * auVar44._16_4_ + auVar45._16_4_ * fVar252;
  auVar241._20_4_ = fVar269 * auVar43._20_4_ + fVar274 * auVar44._20_4_ + auVar45._20_4_ * fVar223;
  auVar241._24_4_ = fVar251 * auVar43._24_4_ + fVar275 * auVar44._24_4_ + auVar45._24_4_ * fVar266;
  auVar241._28_4_ = fVar250 + auVar41._28_4_ + fVar226;
  auVar40 = vrcpps_avx(auVar180);
  fVar252 = auVar40._0_4_;
  fVar266 = auVar40._4_4_;
  auVar41._4_4_ = auVar180._4_4_ * fVar266;
  auVar41._0_4_ = auVar180._0_4_ * fVar252;
  fVar250 = auVar40._8_4_;
  auVar41._8_4_ = auVar180._8_4_ * fVar250;
  fVar269 = auVar40._12_4_;
  auVar41._12_4_ = auVar180._12_4_ * fVar269;
  fVar270 = auVar40._16_4_;
  auVar41._16_4_ = auVar180._16_4_ * fVar270;
  fVar272 = auVar40._20_4_;
  auVar41._20_4_ = auVar180._20_4_ * fVar272;
  fVar274 = auVar40._24_4_;
  auVar41._24_4_ = auVar180._24_4_ * fVar274;
  auVar41._28_4_ = auVar180._28_4_;
  auVar335._8_4_ = 0x3f800000;
  auVar335._0_8_ = 0x3f8000003f800000;
  auVar335._12_4_ = 0x3f800000;
  auVar335._16_4_ = 0x3f800000;
  auVar335._20_4_ = 0x3f800000;
  auVar335._24_4_ = 0x3f800000;
  auVar335._28_4_ = 0x3f800000;
  auVar42 = vsubps_avx(auVar335,auVar41);
  auVar41 = vrcpps_avx(auVar39);
  fVar252 = fVar252 + fVar252 * auVar42._0_4_;
  fVar266 = fVar266 + fVar266 * auVar42._4_4_;
  fVar250 = fVar250 + fVar250 * auVar42._8_4_;
  fVar269 = fVar269 + fVar269 * auVar42._12_4_;
  fVar270 = fVar270 + fVar270 * auVar42._16_4_;
  fVar272 = fVar272 + fVar272 * auVar42._20_4_;
  fVar274 = fVar274 + fVar274 * auVar42._24_4_;
  fVar275 = auVar41._0_4_;
  fVar283 = auVar41._4_4_;
  auVar180._4_4_ = fVar283 * auVar39._4_4_;
  auVar180._0_4_ = fVar275 * auVar39._0_4_;
  fVar284 = auVar41._8_4_;
  auVar180._8_4_ = fVar284 * auVar39._8_4_;
  fVar285 = auVar41._12_4_;
  auVar180._12_4_ = fVar285 * auVar39._12_4_;
  fVar286 = auVar41._16_4_;
  auVar180._16_4_ = fVar286 * auVar39._16_4_;
  fVar287 = auVar41._20_4_;
  auVar180._20_4_ = fVar287 * auVar39._20_4_;
  fVar288 = auVar41._24_4_;
  auVar180._24_4_ = fVar288 * auVar39._24_4_;
  auVar180._28_4_ = auVar42._28_4_;
  auVar39 = vsubps_avx(auVar335,auVar180);
  fVar275 = fVar275 + fVar275 * auVar39._0_4_;
  fVar283 = fVar283 + fVar283 * auVar39._4_4_;
  fVar284 = fVar284 + fVar284 * auVar39._8_4_;
  fVar285 = fVar285 + fVar285 * auVar39._12_4_;
  fVar286 = fVar286 + fVar286 * auVar39._16_4_;
  fVar287 = fVar287 + fVar287 * auVar39._20_4_;
  fVar288 = fVar288 + fVar288 * auVar39._24_4_;
  auVar180 = vrcpps_avx(auVar173);
  fVar290 = auVar180._0_4_;
  fVar297 = auVar180._4_4_;
  auVar43._4_4_ = fVar297 * auVar173._4_4_;
  auVar43._0_4_ = fVar290 * auVar173._0_4_;
  fVar299 = auVar180._8_4_;
  auVar43._8_4_ = fVar299 * auVar173._8_4_;
  fVar301 = auVar180._12_4_;
  auVar43._12_4_ = fVar301 * auVar173._12_4_;
  fVar303 = auVar180._16_4_;
  auVar43._16_4_ = fVar303 * auVar173._16_4_;
  fVar304 = auVar180._20_4_;
  auVar43._20_4_ = fVar304 * auVar173._20_4_;
  fVar306 = auVar180._24_4_;
  auVar43._24_4_ = fVar306 * auVar173._24_4_;
  auVar43._28_4_ = auVar173._28_4_;
  auVar173 = vsubps_avx(auVar335,auVar43);
  fVar290 = fVar290 + fVar290 * auVar173._0_4_;
  fVar297 = fVar297 + fVar297 * auVar173._4_4_;
  fVar299 = fVar299 + fVar299 * auVar173._8_4_;
  fVar301 = fVar301 + fVar301 * auVar173._12_4_;
  fVar303 = fVar303 + fVar303 * auVar173._16_4_;
  fVar304 = fVar304 + fVar304 * auVar173._20_4_;
  fVar306 = fVar306 + fVar306 * auVar173._24_4_;
  auVar169 = ZEXT416((uint)((*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar163 + 0x16)) *
                           *(float *)(prim + lVar163 + 0x1a)));
  auVar46 = vshufps_avx(auVar169,auVar169,0);
  auVar169._8_8_ = 0;
  auVar169._0_8_ = *(ulong *)(prim + uVar159 * 7 + 6);
  auVar169 = vpmovsxwd_avx(auVar169);
  auVar235._8_8_ = 0;
  auVar235._0_8_ = *(ulong *)(prim + uVar159 * 7 + 0xe);
  auVar235 = vpmovsxwd_avx(auVar235);
  auVar323._16_16_ = auVar235;
  auVar323._0_16_ = auVar169;
  auVar173 = vcvtdq2ps_avx(auVar323);
  auVar255._8_8_ = 0;
  auVar255._0_8_ = *(ulong *)(prim + uVar159 * 0xb + 6);
  auVar169 = vpmovsxwd_avx(auVar255);
  auVar237._8_8_ = 0;
  auVar237._0_8_ = *(ulong *)(prim + uVar159 * 0xb + 0xe);
  auVar235 = vpmovsxwd_avx(auVar237);
  auVar336._16_16_ = auVar235;
  auVar336._0_16_ = auVar169;
  auVar180 = vcvtdq2ps_avx(auVar336);
  auVar180 = vsubps_avx(auVar180,auVar173);
  fVar223 = auVar46._0_4_;
  fVar226 = auVar46._4_4_;
  fVar267 = auVar46._8_4_;
  fVar251 = auVar46._12_4_;
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + uVar159 * 9 + 6);
  auVar169 = vpmovsxwd_avx(auVar46);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar159 * 9 + 0xe);
  auVar235 = vpmovsxwd_avx(auVar12);
  auVar324._0_4_ = auVar180._0_4_ * fVar223 + auVar173._0_4_;
  auVar324._4_4_ = auVar180._4_4_ * fVar226 + auVar173._4_4_;
  auVar324._8_4_ = auVar180._8_4_ * fVar267 + auVar173._8_4_;
  auVar324._12_4_ = auVar180._12_4_ * fVar251 + auVar173._12_4_;
  auVar324._16_4_ = auVar180._16_4_ * fVar223 + auVar173._16_4_;
  auVar324._20_4_ = auVar180._20_4_ * fVar226 + auVar173._20_4_;
  auVar324._24_4_ = auVar180._24_4_ * fVar267 + auVar173._24_4_;
  auVar324._28_4_ = auVar180._28_4_ + auVar173._28_4_;
  auVar337._16_16_ = auVar235;
  auVar337._0_16_ = auVar169;
  auVar173 = vcvtdq2ps_avx(auVar337);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar159 * 0xd + 6);
  auVar169 = vpmovsxwd_avx(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar159 * 0xd + 0xe);
  auVar235 = vpmovsxwd_avx(auVar14);
  auVar352._16_16_ = auVar235;
  auVar352._0_16_ = auVar169;
  auVar180 = vcvtdq2ps_avx(auVar352);
  auVar180 = vsubps_avx(auVar180,auVar173);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar159 * 0x12 + 6);
  auVar169 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar159 * 0x12 + 0xe);
  auVar235 = vpmovsxwd_avx(auVar16);
  auVar338._0_4_ = auVar173._0_4_ + auVar180._0_4_ * fVar223;
  auVar338._4_4_ = auVar173._4_4_ + auVar180._4_4_ * fVar226;
  auVar338._8_4_ = auVar173._8_4_ + auVar180._8_4_ * fVar267;
  auVar338._12_4_ = auVar173._12_4_ + auVar180._12_4_ * fVar251;
  auVar338._16_4_ = auVar173._16_4_ + auVar180._16_4_ * fVar223;
  auVar338._20_4_ = auVar173._20_4_ + auVar180._20_4_ * fVar226;
  auVar338._24_4_ = auVar173._24_4_ + auVar180._24_4_ * fVar267;
  auVar338._28_4_ = auVar173._28_4_ + auVar180._28_4_;
  auVar353._16_16_ = auVar235;
  auVar353._0_16_ = auVar169;
  auVar173 = vcvtdq2ps_avx(auVar353);
  uVar160 = (ulong)(uint)((int)lVar166 << 2);
  lVar163 = uVar159 * 2 + uVar160;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + lVar163 + 6);
  auVar169 = vpmovsxwd_avx(auVar17);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + lVar163 + 0xe);
  auVar235 = vpmovsxwd_avx(auVar18);
  auVar369._16_16_ = auVar235;
  auVar369._0_16_ = auVar169;
  auVar180 = vcvtdq2ps_avx(auVar369);
  auVar180 = vsubps_avx(auVar180,auVar173);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar160 + 6);
  auVar169 = vpmovsxwd_avx(auVar19);
  auVar354._0_4_ = auVar173._0_4_ + auVar180._0_4_ * fVar223;
  auVar354._4_4_ = auVar173._4_4_ + auVar180._4_4_ * fVar226;
  auVar354._8_4_ = auVar173._8_4_ + auVar180._8_4_ * fVar267;
  auVar354._12_4_ = auVar173._12_4_ + auVar180._12_4_ * fVar251;
  auVar354._16_4_ = auVar173._16_4_ + auVar180._16_4_ * fVar223;
  auVar354._20_4_ = auVar173._20_4_ + auVar180._20_4_ * fVar226;
  auVar354._24_4_ = auVar173._24_4_ + auVar180._24_4_ * fVar267;
  auVar354._28_4_ = auVar173._28_4_ + auVar180._28_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar160 + 0xe);
  auVar235 = vpmovsxwd_avx(auVar20);
  auVar370._16_16_ = auVar235;
  auVar370._0_16_ = auVar169;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar159 * 0x18 + 6);
  auVar169 = vpmovsxwd_avx(auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar159 * 0x18 + 0xe);
  auVar235 = vpmovsxwd_avx(auVar22);
  auVar173 = vcvtdq2ps_avx(auVar370);
  auVar383._16_16_ = auVar235;
  auVar383._0_16_ = auVar169;
  auVar180 = vcvtdq2ps_avx(auVar383);
  auVar180 = vsubps_avx(auVar180,auVar173);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)(prim + uVar159 * 0x1d + 6);
  auVar169 = vpmovsxwd_avx(auVar23);
  auVar371._0_4_ = auVar173._0_4_ + auVar180._0_4_ * fVar223;
  auVar371._4_4_ = auVar173._4_4_ + auVar180._4_4_ * fVar226;
  auVar371._8_4_ = auVar173._8_4_ + auVar180._8_4_ * fVar267;
  auVar371._12_4_ = auVar173._12_4_ + auVar180._12_4_ * fVar251;
  auVar371._16_4_ = auVar173._16_4_ + auVar180._16_4_ * fVar223;
  auVar371._20_4_ = auVar173._20_4_ + auVar180._20_4_ * fVar226;
  auVar371._24_4_ = auVar173._24_4_ + auVar180._24_4_ * fVar267;
  auVar371._28_4_ = auVar173._28_4_ + auVar180._28_4_;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = *(ulong *)(prim + uVar159 * 0x1d + 0xe);
  auVar235 = vpmovsxwd_avx(auVar24);
  auVar384._16_16_ = auVar235;
  auVar384._0_16_ = auVar169;
  auVar173 = vcvtdq2ps_avx(auVar384);
  lVar163 = uVar159 + (ulong)(byte)PVar31 * 0x20;
  auVar25._8_8_ = 0;
  auVar25._0_8_ = *(ulong *)(prim + lVar163 + 6);
  auVar169 = vpmovsxwd_avx(auVar25);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = *(ulong *)(prim + lVar163 + 0xe);
  auVar235 = vpmovsxwd_avx(auVar26);
  auVar389._16_16_ = auVar235;
  auVar389._0_16_ = auVar169;
  auVar180 = vcvtdq2ps_avx(auVar389);
  auVar180 = vsubps_avx(auVar180,auVar173);
  auVar385._0_4_ = auVar173._0_4_ + auVar180._0_4_ * fVar223;
  auVar385._4_4_ = auVar173._4_4_ + auVar180._4_4_ * fVar226;
  auVar385._8_4_ = auVar173._8_4_ + auVar180._8_4_ * fVar267;
  auVar385._12_4_ = auVar173._12_4_ + auVar180._12_4_ * fVar251;
  auVar385._16_4_ = auVar173._16_4_ + auVar180._16_4_ * fVar223;
  auVar385._20_4_ = auVar173._20_4_ + auVar180._20_4_ * fVar226;
  auVar385._24_4_ = auVar173._24_4_ + auVar180._24_4_ * fVar267;
  auVar385._28_4_ = auVar173._28_4_ + auVar180._28_4_;
  lVar163 = (ulong)(byte)PVar31 * 0x20 - uVar159;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = *(ulong *)(prim + lVar163 + 6);
  auVar169 = vpmovsxwd_avx(auVar27);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = *(ulong *)(prim + lVar163 + 0xe);
  auVar235 = vpmovsxwd_avx(auVar28);
  auVar390._16_16_ = auVar235;
  auVar390._0_16_ = auVar169;
  auVar29._8_8_ = 0;
  auVar29._0_8_ = *(ulong *)(prim + uVar159 * 0x23 + 6);
  auVar169 = vpmovsxwd_avx(auVar29);
  auVar30._8_8_ = 0;
  auVar30._0_8_ = *(ulong *)(prim + uVar159 * 0x23 + 0xe);
  auVar235 = vpmovsxwd_avx(auVar30);
  auVar399._16_16_ = auVar235;
  auVar399._0_16_ = auVar169;
  auVar173 = vcvtdq2ps_avx(auVar390);
  auVar180 = vcvtdq2ps_avx(auVar399);
  auVar180 = vsubps_avx(auVar180,auVar173);
  auVar391._0_4_ = auVar173._0_4_ + auVar180._0_4_ * fVar223;
  auVar391._4_4_ = auVar173._4_4_ + auVar180._4_4_ * fVar226;
  auVar391._8_4_ = auVar173._8_4_ + auVar180._8_4_ * fVar267;
  auVar391._12_4_ = auVar173._12_4_ + auVar180._12_4_ * fVar251;
  auVar391._16_4_ = auVar173._16_4_ + auVar180._16_4_ * fVar223;
  auVar391._20_4_ = auVar173._20_4_ + auVar180._20_4_ * fVar226;
  auVar391._24_4_ = auVar173._24_4_ + auVar180._24_4_ * fVar267;
  auVar391._28_4_ = auVar173._28_4_ + fVar251;
  auVar173 = vsubps_avx(auVar324,auVar210);
  auVar310._0_4_ = fVar252 * auVar173._0_4_;
  auVar310._4_4_ = fVar266 * auVar173._4_4_;
  auVar310._8_4_ = fVar250 * auVar173._8_4_;
  auVar310._12_4_ = fVar269 * auVar173._12_4_;
  auVar44._16_4_ = fVar270 * auVar173._16_4_;
  auVar44._0_16_ = auVar310;
  auVar44._20_4_ = fVar272 * auVar173._20_4_;
  auVar44._24_4_ = fVar274 * auVar173._24_4_;
  auVar44._28_4_ = auVar173._28_4_;
  auVar173 = vsubps_avx(auVar338,auVar210);
  auVar253._0_4_ = fVar252 * auVar173._0_4_;
  auVar253._4_4_ = fVar266 * auVar173._4_4_;
  auVar253._8_4_ = fVar250 * auVar173._8_4_;
  auVar253._12_4_ = fVar269 * auVar173._12_4_;
  auVar45._16_4_ = fVar270 * auVar173._16_4_;
  auVar45._0_16_ = auVar253;
  auVar45._20_4_ = fVar272 * auVar173._20_4_;
  auVar45._24_4_ = fVar274 * auVar173._24_4_;
  auVar45._28_4_ = auVar40._28_4_ + auVar42._28_4_;
  auVar173 = vsubps_avx(auVar354,auVar174);
  auVar205._0_4_ = fVar275 * auVar173._0_4_;
  auVar205._4_4_ = fVar283 * auVar173._4_4_;
  auVar205._8_4_ = fVar284 * auVar173._8_4_;
  auVar205._12_4_ = fVar285 * auVar173._12_4_;
  auVar40._16_4_ = fVar286 * auVar173._16_4_;
  auVar40._0_16_ = auVar205;
  auVar40._20_4_ = fVar287 * auVar173._20_4_;
  auVar40._24_4_ = fVar288 * auVar173._24_4_;
  auVar40._28_4_ = auVar173._28_4_;
  auVar173 = vsubps_avx(auVar371,auVar174);
  auVar276._0_4_ = fVar275 * auVar173._0_4_;
  auVar276._4_4_ = fVar283 * auVar173._4_4_;
  auVar276._8_4_ = fVar284 * auVar173._8_4_;
  auVar276._12_4_ = fVar285 * auVar173._12_4_;
  auVar42._16_4_ = fVar286 * auVar173._16_4_;
  auVar42._0_16_ = auVar276;
  auVar42._20_4_ = fVar287 * auVar173._20_4_;
  auVar42._24_4_ = fVar288 * auVar173._24_4_;
  auVar42._28_4_ = auVar41._28_4_ + auVar39._28_4_;
  auVar173 = vsubps_avx(auVar385,auVar241);
  auVar168._0_4_ = fVar290 * auVar173._0_4_;
  auVar168._4_4_ = fVar297 * auVar173._4_4_;
  auVar168._8_4_ = fVar299 * auVar173._8_4_;
  auVar168._12_4_ = fVar301 * auVar173._12_4_;
  auVar39._16_4_ = fVar303 * auVar173._16_4_;
  auVar39._0_16_ = auVar168;
  auVar39._20_4_ = fVar304 * auVar173._20_4_;
  auVar39._24_4_ = fVar306 * auVar173._24_4_;
  auVar39._28_4_ = auVar173._28_4_;
  auVar173 = vsubps_avx(auVar391,auVar241);
  auVar231._0_4_ = fVar290 * auVar173._0_4_;
  auVar231._4_4_ = fVar297 * auVar173._4_4_;
  auVar231._8_4_ = fVar299 * auVar173._8_4_;
  auVar231._12_4_ = fVar301 * auVar173._12_4_;
  auVar47._16_4_ = fVar303 * auVar173._16_4_;
  auVar47._0_16_ = auVar231;
  auVar47._20_4_ = fVar304 * auVar173._20_4_;
  auVar47._24_4_ = fVar306 * auVar173._24_4_;
  auVar47._28_4_ = auVar173._28_4_;
  auVar169 = vpminsd_avx(auVar44._16_16_,auVar45._16_16_);
  auVar235 = vpminsd_avx(auVar310,auVar253);
  auVar339._16_16_ = auVar169;
  auVar339._0_16_ = auVar235;
  auVar169 = vpminsd_avx(auVar40._16_16_,auVar42._16_16_);
  auVar235 = vpminsd_avx(auVar205,auVar276);
  auVar386._16_16_ = auVar169;
  auVar386._0_16_ = auVar235;
  auVar173 = vmaxps_avx(auVar339,auVar386);
  auVar169 = vpminsd_avx(auVar39._16_16_,auVar47._16_16_);
  auVar235 = vpminsd_avx(auVar168,auVar231);
  auVar400._16_16_ = auVar169;
  auVar400._0_16_ = auVar235;
  uVar11 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar413._4_4_ = uVar11;
  auVar413._0_4_ = uVar11;
  auVar413._8_4_ = uVar11;
  auVar413._12_4_ = uVar11;
  auVar413._16_4_ = uVar11;
  auVar413._20_4_ = uVar11;
  auVar413._24_4_ = uVar11;
  auVar413._28_4_ = uVar11;
  auVar180 = vmaxps_avx(auVar400,auVar413);
  auVar173 = vmaxps_avx(auVar173,auVar180);
  local_80._4_4_ = auVar173._4_4_ * 0.99999964;
  local_80._0_4_ = auVar173._0_4_ * 0.99999964;
  local_80._8_4_ = auVar173._8_4_ * 0.99999964;
  local_80._12_4_ = auVar173._12_4_ * 0.99999964;
  local_80._16_4_ = auVar173._16_4_ * 0.99999964;
  local_80._20_4_ = auVar173._20_4_ * 0.99999964;
  local_80._24_4_ = auVar173._24_4_ * 0.99999964;
  local_80._28_4_ = auVar173._28_4_;
  auVar169 = vpmaxsd_avx(auVar44._16_16_,auVar45._16_16_);
  auVar235 = vpmaxsd_avx(auVar310,auVar253);
  auVar259._16_16_ = auVar169;
  auVar259._0_16_ = auVar235;
  auVar169 = vpmaxsd_avx(auVar40._16_16_,auVar42._16_16_);
  auVar235 = vpmaxsd_avx(auVar205,auVar276);
  auVar211._16_16_ = auVar169;
  auVar211._0_16_ = auVar235;
  auVar173 = vminps_avx(auVar259,auVar211);
  auVar169 = vpmaxsd_avx(auVar39._16_16_,auVar47._16_16_);
  auVar235 = vpmaxsd_avx(auVar168,auVar231);
  uVar11 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar242._4_4_ = uVar11;
  auVar242._0_4_ = uVar11;
  auVar242._8_4_ = uVar11;
  auVar242._12_4_ = uVar11;
  auVar242._16_4_ = uVar11;
  auVar242._20_4_ = uVar11;
  auVar242._24_4_ = uVar11;
  auVar242._28_4_ = uVar11;
  auVar175._16_16_ = auVar169;
  auVar175._0_16_ = auVar235;
  auVar180 = vminps_avx(auVar175,auVar242);
  auVar173 = vminps_avx(auVar173,auVar180);
  auVar48._4_4_ = auVar173._4_4_ * 1.0000004;
  auVar48._0_4_ = auVar173._0_4_ * 1.0000004;
  auVar48._8_4_ = auVar173._8_4_ * 1.0000004;
  auVar48._12_4_ = auVar173._12_4_ * 1.0000004;
  auVar48._16_4_ = auVar173._16_4_ * 1.0000004;
  auVar48._20_4_ = auVar173._20_4_ * 1.0000004;
  auVar48._24_4_ = auVar173._24_4_ * 1.0000004;
  auVar48._28_4_ = auVar173._28_4_;
  auVar173 = vcmpps_avx(local_80,auVar48,2);
  auVar169 = vpshufd_avx(ZEXT116((byte)PVar31),0);
  auVar212._16_16_ = auVar169;
  auVar212._0_16_ = auVar169;
  auVar180 = vcvtdq2ps_avx(auVar212);
  auVar180 = vcmpps_avx(_DAT_01faff40,auVar180,1);
  auVar173 = vandps_avx(auVar173,auVar180);
  uVar156 = vmovmskps_avx(auVar173);
  if (uVar156 != 0) {
    uVar156 = uVar156 & 0xff;
    local_668 = pre->ray_space + k;
    local_660 = mm_lookupmask_ps._16_8_;
    uStack_658 = mm_lookupmask_ps._24_8_;
    uStack_650 = mm_lookupmask_ps._16_8_;
    uStack_648 = mm_lookupmask_ps._24_8_;
    uVar162 = 1 << ((byte)k & 0x1f);
    local_7a8 = (undefined1 (*) [32])&local_140;
    local_7b0 = (undefined1 (*) [16])(mm_lookupmask_ps + ((uVar162 & 0xf) << 4));
    local_7b8 = mm_lookupmask_ps + (long)((int)uVar162 >> 4) * 0x10;
    do {
      lVar163 = 0;
      if (uVar156 != 0) {
        for (; (uVar156 >> lVar163 & 1) == 0; lVar163 = lVar163 + 1) {
        }
      }
      uVar32 = *(uint *)(prim + 2);
      uVar33 = *(uint *)(prim + lVar163 * 4 + 6);
      pGVar165 = (context->scene->geometries).items[uVar32].ptr;
      uVar159 = (ulong)*(uint *)(*(long *)&pGVar165->field_0x58 +
                                (ulong)uVar33 *
                                pGVar165[1].super_RefCount.refCounter.
                                super___atomic_base<unsigned_long>._M_i);
      fVar252 = (pGVar165->time_range).lower;
      fVar252 = pGVar165->fnumTimeSegments *
                ((*(float *)(ray + k * 4 + 0xe0) - fVar252) /
                ((pGVar165->time_range).upper - fVar252));
      auVar169 = vroundss_avx(ZEXT416((uint)fVar252),ZEXT416((uint)fVar252),9);
      auVar169 = vminss_avx(auVar169,ZEXT416((uint)(pGVar165->fnumTimeSegments + -1.0)));
      auVar169 = vmaxss_avx(ZEXT816(0) << 0x20,auVar169);
      fVar252 = fVar252 - auVar169._0_4_;
      _Var36 = pGVar165[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar161 = (long)(int)auVar169._0_4_ * 0x38;
      lVar166 = *(long *)(_Var36 + 0x10 + lVar161);
      lVar164 = *(long *)(_Var36 + 0x38 + lVar161);
      lVar37 = *(long *)(_Var36 + 0x48 + lVar161);
      auVar169 = vshufps_avx(ZEXT416((uint)fVar252),ZEXT416((uint)fVar252),0);
      pfVar1 = (float *)(lVar164 + lVar37 * uVar159);
      fVar223 = auVar169._0_4_;
      fVar266 = auVar169._4_4_;
      fVar226 = auVar169._8_4_;
      fVar250 = auVar169._12_4_;
      lVar163 = uVar159 + 1;
      pfVar2 = (float *)(lVar164 + lVar37 * lVar163);
      p_Var38 = pGVar165[4].occlusionFilterN;
      auVar169 = vshufps_avx(ZEXT416((uint)(1.0 - fVar252)),ZEXT416((uint)(1.0 - fVar252)),0);
      pfVar3 = (float *)(*(long *)(_Var36 + lVar161) + lVar166 * uVar159);
      fVar252 = auVar169._0_4_;
      fVar267 = auVar169._4_4_;
      fVar269 = auVar169._8_4_;
      fVar251 = auVar169._12_4_;
      pfVar4 = (float *)(*(long *)(_Var36 + lVar161) + lVar166 * lVar163);
      pfVar5 = (float *)(*(long *)(p_Var38 + lVar161 + 0x38) +
                        uVar159 * *(long *)(p_Var38 + lVar161 + 0x48));
      pfVar6 = (float *)(*(long *)(p_Var38 + lVar161 + 0x38) +
                        *(long *)(p_Var38 + lVar161 + 0x48) * lVar163);
      pfVar7 = (float *)(*(long *)(p_Var38 + lVar161) +
                        *(long *)(p_Var38 + lVar161 + 0x10) * uVar159);
      pfVar8 = (float *)(*(long *)(p_Var38 + lVar161) +
                        *(long *)(p_Var38 + lVar161 + 0x10) * lVar163);
      uVar34 = (uint)pGVar165[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar163 = (long)(int)uVar34 * 0x44;
      fVar330 = fVar252 * *pfVar3 + fVar223 * *pfVar1;
      fVar343 = fVar267 * pfVar3[1] + fVar266 * pfVar1[1];
      auVar332._0_8_ = CONCAT44(fVar343,fVar330);
      auVar332._8_4_ = fVar269 * pfVar3[2] + fVar226 * pfVar1[2];
      auVar332._12_4_ = fVar251 * pfVar3[3] + fVar250 * pfVar1[3];
      fVar408 = fVar252 * *pfVar4 + fVar223 * *pfVar2;
      fVar415 = fVar267 * pfVar4[1] + fVar266 * pfVar2[1];
      auVar412._0_8_ = CONCAT44(fVar415,fVar408);
      auVar412._8_4_ = fVar269 * pfVar4[2] + fVar226 * pfVar2[2];
      auVar412._12_4_ = fVar251 * pfVar4[3] + fVar250 * pfVar2[3];
      auVar169 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar237 = vinsertps_avx(auVar169,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      fVar318 = fVar330 + (fVar252 * *pfVar7 + fVar223 * *pfVar5) * 0.33333334;
      fVar327 = fVar343 + (fVar267 * pfVar7[1] + fVar266 * pfVar5[1]) * 0.33333334;
      auVar319._0_8_ = CONCAT44(fVar327,fVar318);
      auVar319._8_4_ = auVar332._8_4_ + (fVar269 * pfVar7[2] + fVar226 * pfVar5[2]) * 0.33333334;
      auVar319._12_4_ = auVar332._12_4_ + (fVar251 * pfVar7[3] + fVar250 * pfVar5[3]) * 0.33333334;
      auVar206._0_4_ = (fVar252 * *pfVar8 + fVar223 * *pfVar6) * 0.33333334;
      auVar206._4_4_ = (fVar267 * pfVar8[1] + fVar266 * pfVar6[1]) * 0.33333334;
      auVar206._8_4_ = (fVar269 * pfVar8[2] + fVar226 * pfVar6[2]) * 0.33333334;
      auVar206._12_4_ = (fVar251 * pfVar8[3] + fVar250 * pfVar6[3]) * 0.33333334;
      auVar13 = vsubps_avx(auVar412,auVar206);
      auVar255 = vsubps_avx(auVar332,auVar237);
      auVar169 = vshufps_avx(auVar255,auVar255,0);
      auVar235 = vshufps_avx(auVar255,auVar255,0x55);
      auVar255 = vshufps_avx(auVar255,auVar255,0xaa);
      fVar252 = (local_668->vx).field_0.m128[0];
      fVar223 = (local_668->vx).field_0.m128[1];
      fVar266 = (local_668->vx).field_0.m128[2];
      fVar226 = (local_668->vx).field_0.m128[3];
      fVar250 = (local_668->vy).field_0.m128[0];
      fVar267 = (local_668->vy).field_0.m128[1];
      fVar269 = (local_668->vy).field_0.m128[2];
      fVar251 = (local_668->vy).field_0.m128[3];
      fVar270 = (local_668->vz).field_0.m128[0];
      fVar272 = (local_668->vz).field_0.m128[1];
      fVar274 = (local_668->vz).field_0.m128[2];
      fVar275 = (local_668->vz).field_0.m128[3];
      auVar254._0_8_ =
           CONCAT44(auVar169._4_4_ * fVar223 + auVar235._4_4_ * fVar267 + fVar272 * auVar255._4_4_,
                    auVar169._0_4_ * fVar252 + auVar235._0_4_ * fVar250 + fVar270 * auVar255._0_4_);
      auVar254._8_4_ =
           auVar169._8_4_ * fVar266 + auVar235._8_4_ * fVar269 + fVar274 * auVar255._8_4_;
      auVar254._12_4_ =
           auVar169._12_4_ * fVar226 + auVar235._12_4_ * fVar251 + fVar275 * auVar255._12_4_;
      auVar169 = vblendps_avx(auVar254,auVar332,8);
      auVar46 = vsubps_avx(auVar319,auVar237);
      auVar235 = vshufps_avx(auVar46,auVar46,0);
      auVar255 = vshufps_avx(auVar46,auVar46,0x55);
      auVar46 = vshufps_avx(auVar46,auVar46,0xaa);
      auVar320._0_4_ = auVar235._0_4_ * fVar252 + auVar255._0_4_ * fVar250 + fVar270 * auVar46._0_4_
      ;
      auVar320._4_4_ = auVar235._4_4_ * fVar223 + auVar255._4_4_ * fVar267 + fVar272 * auVar46._4_4_
      ;
      auVar320._8_4_ = auVar235._8_4_ * fVar266 + auVar255._8_4_ * fVar269 + fVar274 * auVar46._8_4_
      ;
      auVar320._12_4_ =
           auVar235._12_4_ * fVar226 + auVar255._12_4_ * fVar251 + fVar275 * auVar46._12_4_;
      auVar235 = vblendps_avx(auVar320,auVar319,8);
      auVar12 = vsubps_avx(auVar13,auVar237);
      auVar255 = vshufps_avx(auVar12,auVar12,0);
      auVar46 = vshufps_avx(auVar12,auVar12,0x55);
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      auVar333._0_4_ = auVar255._0_4_ * fVar252 + auVar46._0_4_ * fVar250 + auVar12._0_4_ * fVar270;
      auVar333._4_4_ = auVar255._4_4_ * fVar223 + auVar46._4_4_ * fVar267 + auVar12._4_4_ * fVar272;
      auVar333._8_4_ = auVar255._8_4_ * fVar266 + auVar46._8_4_ * fVar269 + auVar12._8_4_ * fVar274;
      auVar333._12_4_ =
           auVar255._12_4_ * fVar226 + auVar46._12_4_ * fVar251 + auVar12._12_4_ * fVar275;
      auVar255 = vblendps_avx(auVar333,auVar13,8);
      auVar12 = vsubps_avx(auVar412,auVar237);
      auVar237 = vshufps_avx(auVar12,auVar12,0);
      auVar46 = vshufps_avx(auVar12,auVar12,0x55);
      auVar12 = vshufps_avx(auVar12,auVar12,0xaa);
      auVar207._0_4_ = auVar237._0_4_ * fVar252 + auVar46._0_4_ * fVar250 + fVar270 * auVar12._0_4_;
      auVar207._4_4_ = auVar237._4_4_ * fVar223 + auVar46._4_4_ * fVar267 + fVar272 * auVar12._4_4_;
      auVar207._8_4_ = auVar237._8_4_ * fVar266 + auVar46._8_4_ * fVar269 + fVar274 * auVar12._8_4_;
      auVar207._12_4_ =
           auVar237._12_4_ * fVar226 + auVar46._12_4_ * fVar251 + fVar275 * auVar12._12_4_;
      auVar237 = vblendps_avx(auVar207,auVar412,8);
      auVar277._8_4_ = 0x7fffffff;
      auVar277._0_8_ = 0x7fffffff7fffffff;
      auVar277._12_4_ = 0x7fffffff;
      auVar169 = vandps_avx(auVar169,auVar277);
      auVar235 = vandps_avx(auVar235,auVar277);
      auVar46 = vmaxps_avx(auVar169,auVar235);
      auVar169 = vandps_avx(auVar255,auVar277);
      auVar235 = vandps_avx(auVar237,auVar277);
      auVar169 = vmaxps_avx(auVar169,auVar235);
      auVar169 = vmaxps_avx(auVar46,auVar169);
      auVar235 = vmovshdup_avx(auVar169);
      auVar235 = vmaxss_avx(auVar235,auVar169);
      auVar169 = vshufpd_avx(auVar169,auVar169,1);
      auVar169 = vmaxss_avx(auVar169,auVar235);
      fVar285 = *(float *)(bezier_basis0 + lVar163 + 0x908);
      fVar286 = *(float *)(bezier_basis0 + lVar163 + 0x90c);
      fVar287 = *(float *)(bezier_basis0 + lVar163 + 0x910);
      fVar288 = *(float *)(bezier_basis0 + lVar163 + 0x914);
      fVar290 = *(float *)(bezier_basis0 + lVar163 + 0x918);
      fVar297 = *(float *)(bezier_basis0 + lVar163 + 0x91c);
      fVar299 = *(float *)(bezier_basis0 + lVar163 + 0x920);
      auVar235 = vshufps_avx(auVar333,auVar333,0);
      register0x00001310 = auVar235;
      _local_460 = auVar235;
      auVar255 = vshufps_avx(auVar333,auVar333,0x55);
      fVar301 = *(float *)(bezier_basis0 + lVar163 + 0xd8c);
      fVar303 = *(float *)(bezier_basis0 + lVar163 + 0xd90);
      fVar304 = *(float *)(bezier_basis0 + lVar163 + 0xd94);
      fVar306 = *(float *)(bezier_basis0 + lVar163 + 0xd98);
      fVar347 = *(float *)(bezier_basis0 + lVar163 + 0xd9c);
      fVar271 = *(float *)(bezier_basis0 + lVar163 + 0xda0);
      fVar305 = *(float *)(bezier_basis0 + lVar163 + 0xda4);
      auVar237 = vshufps_avx(auVar207,auVar207,0);
      register0x00001550 = auVar237;
      _local_580 = auVar237;
      fVar364 = auVar237._0_4_;
      fVar365 = auVar237._4_4_;
      fVar404 = auVar237._8_4_;
      fVar406 = auVar237._12_4_;
      fVar309 = auVar235._0_4_;
      fVar375 = auVar235._4_4_;
      fVar377 = auVar235._8_4_;
      fVar379 = auVar235._12_4_;
      auVar235 = vshufps_avx(auVar207,auVar207,0x55);
      register0x00001250 = auVar235;
      _local_6e0 = auVar235;
      fVar203 = auVar235._0_4_;
      fVar224 = auVar235._4_4_;
      fVar225 = auVar235._8_4_;
      fVar227 = auVar235._12_4_;
      fVar230 = auVar255._0_4_;
      fVar247 = auVar255._4_4_;
      fVar248 = auVar255._8_4_;
      fVar249 = auVar255._12_4_;
      auVar235 = vshufps_avx(auVar13,auVar13,0xff);
      register0x00001390 = auVar235;
      _local_400 = auVar235;
      auVar255 = vshufps_avx(auVar412,auVar412,0xff);
      register0x00001590 = auVar255;
      _local_280 = auVar255;
      fVar409 = auVar255._0_4_;
      fVar416 = auVar255._4_4_;
      fVar419 = auVar255._8_4_;
      fVar422 = auVar255._12_4_;
      fVar270 = auVar235._0_4_;
      fVar272 = auVar235._4_4_;
      fVar274 = auVar235._8_4_;
      auVar255 = vshufps_avx(auVar320,auVar320,0);
      register0x000015d0 = auVar255;
      _local_780 = auVar255;
      local_5c0 = *(float *)(bezier_basis0 + lVar163 + 0x484);
      fStack_5bc = *(float *)(bezier_basis0 + lVar163 + 0x488);
      fStack_5b8 = *(float *)(bezier_basis0 + lVar163 + 0x48c);
      fStack_5b4 = *(float *)(bezier_basis0 + lVar163 + 0x490);
      fStack_5b0 = *(float *)(bezier_basis0 + lVar163 + 0x494);
      fStack_5ac = *(float *)(bezier_basis0 + lVar163 + 0x498);
      fStack_5a8 = *(float *)(bezier_basis0 + lVar163 + 0x49c);
      fStack_5a4 = *(float *)(bezier_basis0 + lVar163 + 0x4a0);
      fVar381 = auVar255._0_4_;
      fVar411 = auVar255._4_4_;
      fVar418 = auVar255._8_4_;
      fVar421 = auVar255._12_4_;
      auVar255 = vshufps_avx(auVar320,auVar320,0x55);
      local_640._16_16_ = auVar255;
      local_640._0_16_ = auVar255;
      fVar360 = auVar255._0_4_;
      fVar361 = auVar255._4_4_;
      fVar362 = auVar255._8_4_;
      fVar363 = auVar255._12_4_;
      auVar237 = vpermilps_avx(auVar319,0xff);
      register0x00001410 = auVar237;
      _local_a0 = auVar237;
      fVar275 = auVar237._0_4_;
      fVar283 = auVar237._4_4_;
      fVar284 = auVar237._8_4_;
      fVar251 = *(float *)(bezier_basis0 + lVar163 + 0x924) + 0.0 + 0.0;
      auVar143._8_4_ = auVar254._8_4_;
      auVar143._0_8_ = auVar254._0_8_;
      auVar143._12_4_ = auVar254._12_4_;
      auVar255 = vshufps_avx(auVar143,auVar143,0);
      register0x00001310 = auVar255;
      _local_240 = auVar255;
      local_480 = *(float *)(bezier_basis0 + lVar163);
      fStack_47c = *(float *)(bezier_basis0 + lVar163 + 4);
      fStack_478 = *(float *)(bezier_basis0 + lVar163 + 8);
      fStack_474 = *(float *)(bezier_basis0 + lVar163 + 0xc);
      fStack_470 = *(float *)(bezier_basis0 + lVar163 + 0x10);
      fStack_46c = *(float *)(bezier_basis0 + lVar163 + 0x14);
      fStack_468 = *(float *)(bezier_basis0 + lVar163 + 0x18);
      fStack_464 = *(float *)(bezier_basis0 + lVar163 + 0x1c);
      fVar367 = auVar255._0_4_;
      fVar376 = auVar255._4_4_;
      fVar378 = auVar255._8_4_;
      fVar380 = auVar255._12_4_;
      auVar392._0_4_ =
           fVar367 * local_480 + fVar381 * local_5c0 + fVar309 * fVar285 + fVar364 * fVar301;
      auVar392._4_4_ =
           fVar376 * fStack_47c + fVar411 * fStack_5bc + fVar375 * fVar286 + fVar365 * fVar303;
      auVar392._8_4_ =
           fVar378 * fStack_478 + fVar418 * fStack_5b8 + fVar377 * fVar287 + fVar404 * fVar304;
      auVar392._12_4_ =
           fVar380 * fStack_474 + fVar421 * fStack_5b4 + fVar379 * fVar288 + fVar406 * fVar306;
      auVar392._16_4_ =
           fVar367 * fStack_470 + fVar381 * fStack_5b0 + fVar309 * fVar290 + fVar364 * fVar347;
      auVar392._20_4_ =
           fVar376 * fStack_46c + fVar411 * fStack_5ac + fVar375 * fVar297 + fVar365 * fVar271;
      auVar392._24_4_ =
           fVar378 * fStack_468 + fVar418 * fStack_5a8 + fVar377 * fVar299 + fVar404 * fVar305;
      auVar392._28_4_ = fStack_5a4 + 0.0;
      auVar255 = vshufps_avx(auVar143,auVar143,0x55);
      register0x00001350 = auVar255;
      _local_260 = auVar255;
      fVar291 = auVar255._0_4_;
      fVar298 = auVar255._4_4_;
      fVar300 = auVar255._8_4_;
      fVar302 = auVar255._12_4_;
      auVar355._0_4_ =
           fVar291 * local_480 + fVar360 * local_5c0 + fVar230 * fVar285 + fVar203 * fVar301;
      auVar355._4_4_ =
           fVar298 * fStack_47c + fVar361 * fStack_5bc + fVar247 * fVar286 + fVar224 * fVar303;
      auVar355._8_4_ =
           fVar300 * fStack_478 + fVar362 * fStack_5b8 + fVar248 * fVar287 + fVar225 * fVar304;
      auVar355._12_4_ =
           fVar302 * fStack_474 + fVar363 * fStack_5b4 + fVar249 * fVar288 + fVar227 * fVar306;
      auVar355._16_4_ =
           fVar291 * fStack_470 + fVar360 * fStack_5b0 + fVar230 * fVar290 + fVar203 * fVar347;
      auVar355._20_4_ =
           fVar298 * fStack_46c + fVar361 * fStack_5ac + fVar247 * fVar297 + fVar224 * fVar271;
      auVar355._24_4_ =
           fVar300 * fStack_468 + fVar362 * fStack_5a8 + fVar248 * fVar299 + fVar225 * fVar305;
      auVar355._28_4_ = fVar249 + fVar227 + 0.0 + 0.0;
      auVar255 = vpermilps_avx(auVar332,0xff);
      register0x00001490 = auVar255;
      _local_2a0 = auVar255;
      fVar328 = auVar255._0_4_;
      fVar329 = auVar255._4_4_;
      fVar350 = auVar255._8_4_;
      local_980._0_4_ =
           fVar328 * local_480 + fVar275 * local_5c0 + fVar270 * fVar285 + fVar409 * fVar301;
      local_980._4_4_ =
           fVar329 * fStack_47c + fVar283 * fStack_5bc + fVar272 * fVar286 + fVar416 * fVar303;
      fStack_978 = fVar350 * fStack_478 +
                   fVar284 * fStack_5b8 + fVar274 * fVar287 + fVar419 * fVar304;
      fStack_974 = auVar255._12_4_ * fStack_474 +
                   auVar237._12_4_ * fStack_5b4 + auVar235._12_4_ * fVar288 + fVar422 * fVar306;
      fStack_970 = fVar328 * fStack_470 +
                   fVar275 * fStack_5b0 + fVar270 * fVar290 + fVar409 * fVar347;
      fStack_96c = fVar329 * fStack_46c +
                   fVar283 * fStack_5ac + fVar272 * fVar297 + fVar416 * fVar271;
      fStack_968 = fVar350 * fStack_468 +
                   fVar284 * fStack_5a8 + fVar274 * fVar299 + fVar419 * fVar305;
      fStack_964 = fVar251 + 0.0;
      fVar348 = *(float *)(bezier_basis1 + lVar163 + 0x908);
      fVar349 = *(float *)(bezier_basis1 + lVar163 + 0x90c);
      fVar273 = *(float *)(bezier_basis1 + lVar163 + 0x910);
      fVar307 = *(float *)(bezier_basis1 + lVar163 + 0x914);
      fStack_5d0 = *(float *)(bezier_basis1 + lVar163 + 0x918);
      fStack_5cc = *(float *)(bezier_basis1 + lVar163 + 0x91c);
      fStack_5c8 = *(float *)(bezier_basis1 + lVar163 + 0x920);
      fStack_5c4 = *(float *)(bezier_basis1 + lVar163 + 0x924);
      pauVar10 = (undefined1 (*) [32])(bezier_basis1 + lVar163 + 0xd8c);
      fVar252 = *(float *)*pauVar10;
      fVar223 = *(float *)(bezier_basis1 + lVar163 + 0xd90);
      fVar266 = *(float *)(bezier_basis1 + lVar163 + 0xd94);
      fVar226 = *(float *)(bezier_basis1 + lVar163 + 0xd98);
      fVar250 = *(float *)(bezier_basis1 + lVar163 + 0xd9c);
      fVar267 = *(float *)(bezier_basis1 + lVar163 + 0xda0);
      fVar269 = *(float *)(bezier_basis1 + lVar163 + 0xda4);
      auVar152 = *(undefined1 (*) [28])*pauVar10;
      fVar202 = *(float *)(bezier_basis1 + lVar163 + 0x484);
      fVar229 = *(float *)(bezier_basis1 + lVar163 + 0x488);
      fVar317 = *(float *)(bezier_basis1 + lVar163 + 0x48c);
      fVar228 = *(float *)(bezier_basis1 + lVar163 + 0x490);
      fVar167 = *(float *)(bezier_basis1 + lVar163 + 0x494);
      fVar191 = *(float *)(bezier_basis1 + lVar163 + 0x498);
      fVar192 = *(float *)(bezier_basis1 + lVar163 + 0x49c);
      fVar251 = fVar406 + fVar251 + 0.0;
      fVar193 = *(float *)(bezier_basis1 + lVar163);
      fVar195 = *(float *)(bezier_basis1 + lVar163 + 4);
      fVar197 = *(float *)(bezier_basis1 + lVar163 + 8);
      fVar199 = *(float *)(bezier_basis1 + lVar163 + 0xc);
      fVar201 = *(float *)(bezier_basis1 + lVar163 + 0x10);
      fVar289 = *(float *)(bezier_basis1 + lVar163 + 0x14);
      fVar268 = *(float *)(bezier_basis1 + lVar163 + 0x18);
      auVar278._0_4_ = fVar367 * fVar193 + fVar381 * fVar202 + fVar309 * fVar348 + fVar364 * fVar252
      ;
      auVar278._4_4_ = fVar376 * fVar195 + fVar411 * fVar229 + fVar375 * fVar349 + fVar365 * fVar223
      ;
      auVar278._8_4_ = fVar378 * fVar197 + fVar418 * fVar317 + fVar377 * fVar273 + fVar404 * fVar266
      ;
      auVar278._12_4_ =
           fVar380 * fVar199 + fVar421 * fVar228 + fVar379 * fVar307 + fVar406 * fVar226;
      auVar278._16_4_ =
           fVar367 * fVar201 + fVar381 * fVar167 + fVar309 * fStack_5d0 + fVar364 * fVar250;
      auVar278._20_4_ =
           fVar376 * fVar289 + fVar411 * fVar191 + fVar375 * fStack_5cc + fVar365 * fVar267;
      auVar278._24_4_ =
           fVar378 * fVar268 + fVar418 * fVar192 + fVar377 * fStack_5c8 + fVar404 * fVar269;
      auVar278._28_4_ = fVar422 + fVar251;
      auVar260._0_4_ = fVar291 * fVar193 + fVar360 * fVar202 + fVar348 * fVar230 + fVar252 * fVar203
      ;
      auVar260._4_4_ = fVar298 * fVar195 + fVar361 * fVar229 + fVar349 * fVar247 + fVar223 * fVar224
      ;
      auVar260._8_4_ = fVar300 * fVar197 + fVar362 * fVar317 + fVar273 * fVar248 + fVar266 * fVar225
      ;
      auVar260._12_4_ =
           fVar302 * fVar199 + fVar363 * fVar228 + fVar307 * fVar249 + fVar226 * fVar227;
      auVar260._16_4_ =
           fVar291 * fVar201 + fVar360 * fVar167 + fStack_5d0 * fVar230 + fVar250 * fVar203;
      auVar260._20_4_ =
           fVar298 * fVar289 + fVar361 * fVar191 + fStack_5cc * fVar247 + fVar267 * fVar224;
      auVar260._24_4_ =
           fVar300 * fVar268 + fVar362 * fVar192 + fStack_5c8 * fVar248 + fVar269 * fVar225;
      auVar260._28_4_ = fVar251 + fVar406 + fVar302 + 0.0;
      local_880._0_4_ =
           fVar275 * fVar202 + fVar348 * fVar270 + fVar409 * fVar252 + fVar328 * fVar193;
      local_880._4_4_ =
           fVar283 * fVar229 + fVar349 * fVar272 + fVar416 * fVar223 + fVar329 * fVar195;
      local_880._8_4_ =
           fVar284 * fVar317 + fVar273 * fVar274 + fVar419 * fVar266 + fVar350 * fVar197;
      local_880._12_4_ =
           auVar237._12_4_ * fVar228 + fVar307 * auVar235._12_4_ + fVar422 * fVar226 +
           auVar255._12_4_ * fVar199;
      local_880._16_4_ =
           fVar275 * fVar167 + fStack_5d0 * fVar270 + fVar409 * fVar250 + fVar328 * fVar201;
      local_880._20_4_ =
           fVar283 * fVar191 + fStack_5cc * fVar272 + fVar416 * fVar267 + fVar329 * fVar289;
      local_880._24_4_ =
           fVar284 * fVar192 + fStack_5c8 * fVar274 + fVar419 * fVar269 + fVar350 * fVar268;
      local_880._28_4_ = fVar406 + fVar379 + fVar302 + fVar251;
      local_4e0 = vsubps_avx(auVar278,auVar392);
      auVar39 = vsubps_avx(auVar260,auVar355);
      fVar252 = local_4e0._0_4_;
      fVar266 = local_4e0._4_4_;
      auVar49._4_4_ = auVar355._4_4_ * fVar266;
      auVar49._0_4_ = auVar355._0_4_ * fVar252;
      fVar250 = local_4e0._8_4_;
      auVar49._8_4_ = auVar355._8_4_ * fVar250;
      fVar269 = local_4e0._12_4_;
      auVar49._12_4_ = auVar355._12_4_ * fVar269;
      fVar270 = local_4e0._16_4_;
      auVar49._16_4_ = auVar355._16_4_ * fVar270;
      fVar274 = local_4e0._20_4_;
      auVar49._20_4_ = auVar355._20_4_ * fVar274;
      fVar283 = local_4e0._24_4_;
      auVar49._24_4_ = auVar355._24_4_ * fVar283;
      auVar49._28_4_ = fVar251;
      fVar223 = auVar39._0_4_;
      fVar226 = auVar39._4_4_;
      auVar50._4_4_ = auVar392._4_4_ * fVar226;
      auVar50._0_4_ = auVar392._0_4_ * fVar223;
      fVar267 = auVar39._8_4_;
      auVar50._8_4_ = auVar392._8_4_ * fVar267;
      fVar251 = auVar39._12_4_;
      auVar50._12_4_ = auVar392._12_4_ * fVar251;
      fVar272 = auVar39._16_4_;
      auVar50._16_4_ = auVar392._16_4_ * fVar272;
      fVar275 = auVar39._20_4_;
      auVar50._20_4_ = auVar392._20_4_ * fVar275;
      fVar284 = auVar39._24_4_;
      auVar50._24_4_ = auVar392._24_4_ * fVar284;
      auVar50._28_4_ = auVar260._28_4_;
      auVar180 = vsubps_avx(auVar49,auVar50);
      auVar173 = vmaxps_avx(_local_980,local_880);
      auVar51._4_4_ = auVar173._4_4_ * auVar173._4_4_ * (fVar266 * fVar266 + fVar226 * fVar226);
      auVar51._0_4_ = auVar173._0_4_ * auVar173._0_4_ * (fVar252 * fVar252 + fVar223 * fVar223);
      auVar51._8_4_ = auVar173._8_4_ * auVar173._8_4_ * (fVar250 * fVar250 + fVar267 * fVar267);
      auVar51._12_4_ = auVar173._12_4_ * auVar173._12_4_ * (fVar269 * fVar269 + fVar251 * fVar251);
      auVar51._16_4_ = auVar173._16_4_ * auVar173._16_4_ * (fVar270 * fVar270 + fVar272 * fVar272);
      auVar51._20_4_ = auVar173._20_4_ * auVar173._20_4_ * (fVar274 * fVar274 + fVar275 * fVar275);
      auVar51._24_4_ = auVar173._24_4_ * auVar173._24_4_ * (fVar283 * fVar283 + fVar284 * fVar284);
      auVar51._28_4_ = auVar278._28_4_ + auVar260._28_4_;
      auVar52._4_4_ = auVar180._4_4_ * auVar180._4_4_;
      auVar52._0_4_ = auVar180._0_4_ * auVar180._0_4_;
      auVar52._8_4_ = auVar180._8_4_ * auVar180._8_4_;
      auVar52._12_4_ = auVar180._12_4_ * auVar180._12_4_;
      auVar52._16_4_ = auVar180._16_4_ * auVar180._16_4_;
      auVar52._20_4_ = auVar180._20_4_ * auVar180._20_4_;
      auVar52._24_4_ = auVar180._24_4_ * auVar180._24_4_;
      auVar52._28_4_ = auVar180._28_4_;
      auVar173 = vcmpps_avx(auVar52,auVar51,2);
      auVar235 = ZEXT416((uint)(float)(int)uVar34);
      local_5a0._0_16_ = auVar235;
      auVar235 = vshufps_avx(auVar235,auVar235,0);
      auVar261._16_16_ = auVar235;
      auVar261._0_16_ = auVar235;
      auVar180 = vcmpps_avx(_DAT_01faff40,auVar261,1);
      auVar265 = ZEXT3264(auVar180);
      auVar144._8_4_ = auVar254._8_4_;
      auVar144._0_8_ = auVar254._0_8_;
      auVar144._12_4_ = auVar254._12_4_;
      auVar235 = vpermilps_avx(auVar144,0xaa);
      register0x00001410 = auVar235;
      _local_760 = auVar235;
      auVar255 = vpermilps_avx(auVar320,0xaa);
      register0x00001550 = auVar255;
      _local_440 = auVar255;
      auVar237 = vpermilps_avx(auVar333,0xaa);
      register0x00001590 = auVar237;
      _local_420 = auVar237;
      auVar46 = vpermilps_avx(auVar207,0xaa);
      register0x000015d0 = auVar46;
      _local_860 = auVar46;
      auVar40 = auVar180 & auVar173;
      uVar162 = *(uint *)(ray + k * 4 + 0x60);
      auVar169 = ZEXT416((uint)(auVar169._0_4_ * 4.7683716e-07));
      local_840._0_16_ = auVar169;
      uStack_918 = auVar332._8_8_;
      uStack_928 = auVar319._8_8_;
      local_8d0._0_4_ = auVar13._0_4_;
      fVar252 = (float)local_8d0;
      local_8d0._4_4_ = auVar13._4_4_;
      fVar223 = local_8d0._4_4_;
      uStack_8c8._0_4_ = auVar13._8_4_;
      fVar266 = (float)uStack_8c8;
      uStack_8c8._4_4_ = auVar13._12_4_;
      fVar226 = uStack_8c8._4_4_;
      local_8d0 = auVar13._0_8_;
      uStack_8c8 = auVar13._8_8_;
      uStack_8b8 = auVar412._8_8_;
      fVar250 = fVar381;
      fVar267 = fVar411;
      fVar269 = fVar418;
      if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar40 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar40 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar40 >> 0x7f,0) == '\0') &&
            (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar40 >> 0xbf,0) == '\0') &&
          (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar40[0x1f])
      {
        auVar374 = ZEXT3264(_local_760);
        auVar173 = local_620;
      }
      else {
        local_4c0 = vandps_avx(auVar173,auVar180);
        fVar331 = auVar235._0_4_;
        fVar344 = auVar235._4_4_;
        fVar345 = auVar235._8_4_;
        fVar346 = auVar235._12_4_;
        fVar398 = auVar255._0_4_;
        fVar403 = auVar255._4_4_;
        fVar405 = auVar255._8_4_;
        fVar407 = auVar255._12_4_;
        fVar410 = auVar237._0_4_;
        fVar417 = auVar237._4_4_;
        fVar420 = auVar237._8_4_;
        fVar423 = auVar237._12_4_;
        local_4a0._0_4_ = auVar152._0_4_;
        local_4a0._4_4_ = auVar152._4_4_;
        fStack_498 = auVar152._8_4_;
        fStack_494 = auVar152._12_4_;
        fStack_490 = auVar152._16_4_;
        fStack_48c = auVar152._20_4_;
        fStack_488 = auVar152._24_4_;
        fVar424 = auVar46._0_4_;
        fVar428 = auVar46._4_4_;
        fVar429 = auVar46._8_4_;
        fVar430 = auVar46._12_4_;
        fVar251 = auVar180._28_4_ + local_4e0._28_4_ + *(float *)(bezier_basis1 + lVar163 + 0x4a0);
        local_5e0 = fVar331 * fVar193 +
                    fVar398 * fVar202 + fVar410 * fVar348 + fVar424 * (float)local_4a0._0_4_;
        fStack_5dc = fVar344 * fVar195 +
                     fVar403 * fVar229 + fVar417 * fVar349 + fVar428 * (float)local_4a0._4_4_;
        fStack_5d8 = fVar345 * fVar197 +
                     fVar405 * fVar317 + fVar420 * fVar273 + fVar429 * fStack_498;
        fStack_5d4 = fVar346 * fVar199 +
                     fVar407 * fVar228 + fVar423 * fVar307 + fVar430 * fStack_494;
        fStack_5d0 = fVar331 * fVar201 +
                     fVar398 * fVar167 + fVar410 * fStack_5d0 + fVar424 * fStack_490;
        fStack_5cc = fVar344 * fVar289 +
                     fVar403 * fVar191 + fVar417 * fStack_5cc + fVar428 * fStack_48c;
        fStack_5c8 = fVar345 * fVar268 +
                     fVar405 * fVar192 + fVar420 * fStack_5c8 + fVar429 * fStack_488;
        fStack_5c4 = local_4c0._28_4_ + fVar251;
        local_6c0 = fVar331 * local_480 +
                    fVar398 * local_5c0 + fVar410 * fVar285 + fVar424 * fVar301;
        fStack_6bc = fVar344 * fStack_47c +
                     fVar403 * fStack_5bc + fVar417 * fVar286 + fVar428 * fVar303;
        fStack_6b8 = fVar345 * fStack_478 +
                     fVar405 * fStack_5b8 + fVar420 * fVar287 + fVar429 * fVar304;
        fStack_6b4 = fVar346 * fStack_474 +
                     fVar407 * fStack_5b4 + fVar423 * fVar288 + fVar430 * fVar306;
        fVar194 = fVar331 * fStack_470 +
                  fVar398 * fStack_5b0 + fVar410 * fVar290 + fVar424 * fVar347;
        fVar196 = fVar344 * fStack_46c +
                  fVar403 * fStack_5ac + fVar417 * fVar297 + fVar428 * fVar271;
        fVar198 = fVar345 * fStack_468 +
                  fVar405 * fStack_5a8 + fVar420 * fVar299 + fVar429 * fVar305;
        fVar200 = fStack_5c4 + fVar251 + local_4c0._28_4_ + auVar180._28_4_;
        fVar251 = *(float *)(bezier_basis0 + lVar163 + 0x1210);
        fVar270 = *(float *)(bezier_basis0 + lVar163 + 0x1214);
        fVar272 = *(float *)(bezier_basis0 + lVar163 + 0x1218);
        fVar274 = *(float *)(bezier_basis0 + lVar163 + 0x121c);
        fVar275 = *(float *)(bezier_basis0 + lVar163 + 0x1220);
        fVar283 = *(float *)(bezier_basis0 + lVar163 + 0x1224);
        fVar284 = *(float *)(bezier_basis0 + lVar163 + 0x1228);
        fVar285 = *(float *)(bezier_basis0 + lVar163 + 0x1694);
        fVar286 = *(float *)(bezier_basis0 + lVar163 + 0x1698);
        fVar287 = *(float *)(bezier_basis0 + lVar163 + 0x169c);
        fVar288 = *(float *)(bezier_basis0 + lVar163 + 0x16a0);
        fVar290 = *(float *)(bezier_basis0 + lVar163 + 0x16a4);
        fVar297 = *(float *)(bezier_basis0 + lVar163 + 0x16a8);
        fVar299 = *(float *)(bezier_basis0 + lVar163 + 0x16ac);
        fVar301 = *(float *)(bezier_basis0 + lVar163 + 0x1b18);
        fVar303 = *(float *)(bezier_basis0 + lVar163 + 0x1b1c);
        fVar304 = *(float *)(bezier_basis0 + lVar163 + 0x1b20);
        fVar306 = *(float *)(bezier_basis0 + lVar163 + 0x1b24);
        fVar347 = *(float *)(bezier_basis0 + lVar163 + 0x1b28);
        fVar271 = *(float *)(bezier_basis0 + lVar163 + 0x1b2c);
        fVar305 = *(float *)(bezier_basis0 + lVar163 + 0x1b30);
        fVar348 = *(float *)(bezier_basis0 + lVar163 + 0x1f9c);
        fVar349 = *(float *)(bezier_basis0 + lVar163 + 0x1fa0);
        fVar273 = *(float *)(bezier_basis0 + lVar163 + 0x1fa4);
        fVar307 = *(float *)(bezier_basis0 + lVar163 + 0x1fa8);
        fVar202 = *(float *)(bezier_basis0 + lVar163 + 0x1fac);
        fVar229 = *(float *)(bezier_basis0 + lVar163 + 0x1fb0);
        fVar317 = *(float *)(bezier_basis0 + lVar163 + 0x1fb4);
        fVar308 = auVar355._28_4_ + *(float *)(bezier_basis1 + lVar163 + 0x4a0);
        fVar228 = *(float *)(bezier_basis0 + lVar163 + 0x1b34) +
                  *(float *)(bezier_basis0 + lVar163 + 0x1fb8);
        fVar366 = *(float *)(bezier_basis0 + lVar163 + 0x16b0) + fVar228;
        auVar213._0_4_ =
             fVar230 * fVar301 + fVar203 * fVar348 + fVar360 * fVar285 + fVar291 * fVar251;
        auVar213._4_4_ =
             fVar247 * fVar303 + fVar224 * fVar349 + fVar361 * fVar286 + fVar298 * fVar270;
        auVar213._8_4_ =
             fVar248 * fVar304 + fVar225 * fVar273 + fVar362 * fVar287 + fVar300 * fVar272;
        auVar213._12_4_ =
             fVar249 * fVar306 + fVar227 * fVar307 + fVar363 * fVar288 + fVar302 * fVar274;
        auVar213._16_4_ =
             fVar230 * fVar347 + fVar203 * fVar202 + fVar360 * fVar290 + fVar291 * fVar275;
        auVar213._20_4_ =
             fVar247 * fVar271 + fVar224 * fVar229 + fVar361 * fVar297 + fVar298 * fVar283;
        auVar213._24_4_ =
             fVar248 * fVar305 + fVar225 * fVar317 + fVar362 * fVar299 + fVar300 * fVar284;
        auVar213._28_4_ =
             auVar355._28_4_ + *(float *)(bezier_basis1 + lVar163 + 0x1c) + fVar308 + fVar228;
        auVar393._0_4_ =
             fVar398 * fVar285 + fVar410 * fVar301 + fVar424 * fVar348 + fVar331 * fVar251;
        auVar393._4_4_ =
             fVar403 * fVar286 + fVar417 * fVar303 + fVar428 * fVar349 + fVar344 * fVar270;
        auVar393._8_4_ =
             fVar405 * fVar287 + fVar420 * fVar304 + fVar429 * fVar273 + fVar345 * fVar272;
        auVar393._12_4_ =
             fVar407 * fVar288 + fVar423 * fVar306 + fVar430 * fVar307 + fVar346 * fVar274;
        auVar393._16_4_ =
             fVar398 * fVar290 + fVar410 * fVar347 + fVar424 * fVar202 + fVar331 * fVar275;
        auVar393._20_4_ =
             fVar403 * fVar297 + fVar417 * fVar271 + fVar428 * fVar229 + fVar344 * fVar283;
        auVar393._24_4_ =
             fVar405 * fVar299 + fVar420 * fVar305 + fVar429 * fVar317 + fVar345 * fVar284;
        auVar393._28_4_ = fVar366 + *(float *)(bezier_basis0 + lVar163 + 0x122c);
        fVar228 = *(float *)(bezier_basis1 + lVar163 + 0x1b18);
        fVar167 = *(float *)(bezier_basis1 + lVar163 + 0x1b1c);
        fVar191 = *(float *)(bezier_basis1 + lVar163 + 0x1b20);
        fVar192 = *(float *)(bezier_basis1 + lVar163 + 0x1b24);
        fVar193 = *(float *)(bezier_basis1 + lVar163 + 0x1b28);
        fVar195 = *(float *)(bezier_basis1 + lVar163 + 0x1b2c);
        fVar197 = *(float *)(bezier_basis1 + lVar163 + 0x1b30);
        fVar199 = *(float *)(bezier_basis1 + lVar163 + 0x1f9c);
        fVar201 = *(float *)(bezier_basis1 + lVar163 + 0x1fa0);
        fVar289 = *(float *)(bezier_basis1 + lVar163 + 0x1fa4);
        fVar268 = *(float *)(bezier_basis1 + lVar163 + 0x1fa8);
        fVar328 = *(float *)(bezier_basis1 + lVar163 + 0x1fac);
        fVar329 = *(float *)(bezier_basis1 + lVar163 + 0x1fb0);
        fVar350 = *(float *)(bezier_basis1 + lVar163 + 0x1fb4);
        fVar409 = *(float *)(bezier_basis1 + lVar163 + 0x1694);
        fVar416 = *(float *)(bezier_basis1 + lVar163 + 0x1698);
        fVar419 = *(float *)(bezier_basis1 + lVar163 + 0x169c);
        fVar422 = *(float *)(bezier_basis1 + lVar163 + 0x16a0);
        fVar133 = *(float *)(bezier_basis1 + lVar163 + 0x16a4);
        fVar134 = *(float *)(bezier_basis1 + lVar163 + 0x16a8);
        fVar135 = *(float *)(bezier_basis1 + lVar163 + 0x16ac);
        fVar136 = *(float *)(bezier_basis1 + lVar163 + 0x1210);
        fVar137 = *(float *)(bezier_basis1 + lVar163 + 0x1214);
        fVar138 = *(float *)(bezier_basis1 + lVar163 + 0x1218);
        fVar139 = *(float *)(bezier_basis1 + lVar163 + 0x121c);
        fVar140 = *(float *)(bezier_basis1 + lVar163 + 0x1220);
        fVar141 = *(float *)(bezier_basis1 + lVar163 + 0x1224);
        fVar142 = *(float *)(bezier_basis1 + lVar163 + 0x1228);
        auVar312._0_4_ =
             fVar367 * fVar136 + fVar409 * fVar381 + fVar309 * fVar228 + fVar364 * fVar199;
        auVar312._4_4_ =
             fVar376 * fVar137 + fVar416 * fVar411 + fVar375 * fVar167 + fVar365 * fVar201;
        auVar312._8_4_ =
             fVar378 * fVar138 + fVar419 * fVar418 + fVar377 * fVar191 + fVar404 * fVar289;
        auVar312._12_4_ =
             fVar380 * fVar139 + fVar422 * fVar421 + fVar379 * fVar192 + fVar406 * fVar268;
        auVar312._16_4_ =
             fVar367 * fVar140 + fVar133 * fVar381 + fVar309 * fVar193 + fVar364 * fVar328;
        auVar312._20_4_ =
             fVar376 * fVar141 + fVar134 * fVar411 + fVar375 * fVar195 + fVar365 * fVar329;
        auVar312._24_4_ =
             fVar378 * fVar142 + fVar135 * fVar418 + fVar377 * fVar197 + fVar404 * fVar350;
        auVar312._28_4_ = fVar249 + fVar249 + fVar366 + fVar406;
        auVar356._0_4_ =
             fVar291 * fVar136 + fVar360 * fVar409 + fVar230 * fVar228 + fVar203 * fVar199;
        auVar356._4_4_ =
             fVar298 * fVar137 + fVar361 * fVar416 + fVar247 * fVar167 + fVar224 * fVar201;
        auVar356._8_4_ =
             fVar300 * fVar138 + fVar362 * fVar419 + fVar248 * fVar191 + fVar225 * fVar289;
        auVar356._12_4_ =
             fVar302 * fVar139 + fVar363 * fVar422 + fVar249 * fVar192 + fVar227 * fVar268;
        auVar356._16_4_ =
             fVar291 * fVar140 + fVar360 * fVar133 + fVar230 * fVar193 + fVar203 * fVar328;
        auVar356._20_4_ =
             fVar298 * fVar141 + fVar361 * fVar134 + fVar247 * fVar195 + fVar224 * fVar329;
        auVar356._24_4_ =
             fVar300 * fVar142 + fVar362 * fVar135 + fVar248 * fVar197 + fVar225 * fVar350;
        auVar356._28_4_ = fVar249 + fVar249 + fVar249 + fVar366;
        auVar243._0_4_ =
             fVar331 * fVar136 + fVar398 * fVar409 + fVar410 * fVar228 + fVar424 * fVar199;
        auVar243._4_4_ =
             fVar344 * fVar137 + fVar403 * fVar416 + fVar417 * fVar167 + fVar428 * fVar201;
        auVar243._8_4_ =
             fVar345 * fVar138 + fVar405 * fVar419 + fVar420 * fVar191 + fVar429 * fVar289;
        auVar243._12_4_ =
             fVar346 * fVar139 + fVar407 * fVar422 + fVar423 * fVar192 + fVar430 * fVar268;
        auVar243._16_4_ =
             fVar331 * fVar140 + fVar398 * fVar133 + fVar410 * fVar193 + fVar424 * fVar328;
        auVar243._20_4_ =
             fVar344 * fVar141 + fVar403 * fVar134 + fVar417 * fVar195 + fVar428 * fVar329;
        auVar243._24_4_ =
             fVar345 * fVar142 + fVar405 * fVar135 + fVar420 * fVar197 + fVar429 * fVar350;
        auVar243._28_4_ =
             *(float *)(bezier_basis1 + lVar163 + 0x122c) +
             *(float *)(bezier_basis1 + lVar163 + 0x16b0) +
             *(float *)(bezier_basis1 + lVar163 + 0x1b34) +
             *(float *)(bezier_basis1 + lVar163 + 0x1fb8);
        auVar279._8_4_ = 0x7fffffff;
        auVar279._0_8_ = 0x7fffffff7fffffff;
        auVar279._12_4_ = 0x7fffffff;
        auVar279._16_4_ = 0x7fffffff;
        auVar279._20_4_ = 0x7fffffff;
        auVar279._24_4_ = 0x7fffffff;
        auVar279._28_4_ = 0x7fffffff;
        auVar146._4_4_ =
             fVar376 * fVar270 + fVar286 * fVar411 + fVar375 * fVar303 + fVar365 * fVar349;
        auVar146._0_4_ =
             fVar367 * fVar251 + fVar285 * fVar381 + fVar309 * fVar301 + fVar364 * fVar348;
        auVar146._8_4_ =
             fVar378 * fVar272 + fVar287 * fVar418 + fVar377 * fVar304 + fVar404 * fVar273;
        auVar146._12_4_ =
             fVar380 * fVar274 + fVar288 * fVar421 + fVar379 * fVar306 + fVar406 * fVar307;
        auVar146._16_4_ =
             fVar367 * fVar275 + fVar290 * fVar381 + fVar309 * fVar347 + fVar364 * fVar202;
        auVar146._20_4_ =
             fVar376 * fVar283 + fVar297 * fVar411 + fVar375 * fVar271 + fVar365 * fVar229;
        auVar146._24_4_ =
             fVar378 * fVar284 + fVar299 * fVar418 + fVar377 * fVar305 + fVar404 * fVar317;
        auVar146._28_4_ =
             *(float *)(bezier_basis0 + lVar163 + 0x16b0) +
             *(float *)(bezier_basis0 + lVar163 + 0x1fb8) + fVar308;
        auVar173 = vandps_avx(auVar146,auVar279);
        auVar180 = vandps_avx(auVar213,auVar279);
        auVar180 = vmaxps_avx(auVar173,auVar180);
        auVar173 = vandps_avx(auVar393,auVar279);
        auVar173 = vmaxps_avx(auVar180,auVar173);
        auVar169 = vpermilps_avx(auVar169,0);
        auVar294._16_16_ = auVar169;
        auVar294._0_16_ = auVar169;
        auVar173 = vcmpps_avx(auVar173,auVar294,1);
        auVar40 = vblendvps_avx(auVar146,local_4e0,auVar173);
        auVar41 = vblendvps_avx(auVar213,auVar39,auVar173);
        auVar173 = vandps_avx(auVar312,auVar279);
        auVar180 = vandps_avx(auVar356,auVar279);
        auVar42 = vmaxps_avx(auVar173,auVar180);
        auVar173 = vandps_avx(auVar243,auVar279);
        auVar173 = vmaxps_avx(auVar42,auVar173);
        auVar42 = vcmpps_avx(auVar173,auVar294,1);
        auVar173 = vblendvps_avx(auVar312,local_4e0,auVar42);
        auVar39 = vblendvps_avx(auVar356,auVar39,auVar42);
        fVar167 = auVar40._0_4_;
        fVar191 = auVar40._4_4_;
        fVar192 = auVar40._8_4_;
        fVar193 = auVar40._12_4_;
        fVar195 = auVar40._16_4_;
        fVar197 = auVar40._20_4_;
        fVar199 = auVar40._24_4_;
        fVar309 = -auVar40._28_4_;
        fVar201 = auVar173._0_4_;
        fVar289 = auVar173._4_4_;
        fVar268 = auVar173._8_4_;
        fVar203 = auVar173._12_4_;
        fVar224 = auVar173._16_4_;
        fVar225 = auVar173._20_4_;
        fVar227 = auVar173._24_4_;
        fVar251 = auVar41._0_4_;
        fVar275 = auVar41._4_4_;
        fVar286 = auVar41._8_4_;
        fVar297 = auVar41._12_4_;
        fVar304 = auVar41._16_4_;
        fVar305 = auVar41._20_4_;
        fVar307 = auVar41._24_4_;
        auVar176._0_4_ = fVar251 * fVar251 + fVar167 * fVar167;
        auVar176._4_4_ = fVar275 * fVar275 + fVar191 * fVar191;
        auVar176._8_4_ = fVar286 * fVar286 + fVar192 * fVar192;
        auVar176._12_4_ = fVar297 * fVar297 + fVar193 * fVar193;
        auVar176._16_4_ = fVar304 * fVar304 + fVar195 * fVar195;
        auVar176._20_4_ = fVar305 * fVar305 + fVar197 * fVar197;
        auVar176._24_4_ = fVar307 * fVar307 + fVar199 * fVar199;
        auVar176._28_4_ = auVar356._28_4_ + auVar40._28_4_;
        auVar40 = vrsqrtps_avx(auVar176);
        fVar270 = auVar40._0_4_;
        fVar272 = auVar40._4_4_;
        auVar53._4_4_ = fVar272 * 1.5;
        auVar53._0_4_ = fVar270 * 1.5;
        fVar274 = auVar40._8_4_;
        auVar53._8_4_ = fVar274 * 1.5;
        fVar283 = auVar40._12_4_;
        auVar53._12_4_ = fVar283 * 1.5;
        fVar284 = auVar40._16_4_;
        auVar53._16_4_ = fVar284 * 1.5;
        fVar285 = auVar40._20_4_;
        auVar53._20_4_ = fVar285 * 1.5;
        fVar287 = auVar40._24_4_;
        fVar228 = auVar180._28_4_;
        auVar53._24_4_ = fVar287 * 1.5;
        auVar53._28_4_ = fVar228;
        auVar54._4_4_ = fVar272 * fVar272 * fVar272 * auVar176._4_4_ * 0.5;
        auVar54._0_4_ = fVar270 * fVar270 * fVar270 * auVar176._0_4_ * 0.5;
        auVar54._8_4_ = fVar274 * fVar274 * fVar274 * auVar176._8_4_ * 0.5;
        auVar54._12_4_ = fVar283 * fVar283 * fVar283 * auVar176._12_4_ * 0.5;
        auVar54._16_4_ = fVar284 * fVar284 * fVar284 * auVar176._16_4_ * 0.5;
        auVar54._20_4_ = fVar285 * fVar285 * fVar285 * auVar176._20_4_ * 0.5;
        auVar54._24_4_ = fVar287 * fVar287 * fVar287 * auVar176._24_4_ * 0.5;
        auVar54._28_4_ = auVar176._28_4_;
        auVar180 = vsubps_avx(auVar53,auVar54);
        fVar270 = auVar180._0_4_;
        fVar283 = auVar180._4_4_;
        fVar287 = auVar180._8_4_;
        fVar299 = auVar180._12_4_;
        fVar306 = auVar180._16_4_;
        fVar348 = auVar180._20_4_;
        fVar202 = auVar180._24_4_;
        fVar272 = auVar39._0_4_;
        fVar284 = auVar39._4_4_;
        fVar288 = auVar39._8_4_;
        fVar301 = auVar39._12_4_;
        fVar347 = auVar39._16_4_;
        fVar349 = auVar39._20_4_;
        fVar229 = auVar39._24_4_;
        auVar177._0_4_ = fVar272 * fVar272 + fVar201 * fVar201;
        auVar177._4_4_ = fVar284 * fVar284 + fVar289 * fVar289;
        auVar177._8_4_ = fVar288 * fVar288 + fVar268 * fVar268;
        auVar177._12_4_ = fVar301 * fVar301 + fVar203 * fVar203;
        auVar177._16_4_ = fVar347 * fVar347 + fVar224 * fVar224;
        auVar177._20_4_ = fVar349 * fVar349 + fVar225 * fVar225;
        auVar177._24_4_ = fVar229 * fVar229 + fVar227 * fVar227;
        auVar177._28_4_ = auVar173._28_4_ + auVar180._28_4_;
        auVar173 = vrsqrtps_avx(auVar177);
        fVar274 = auVar173._0_4_;
        fVar285 = auVar173._4_4_;
        auVar55._4_4_ = fVar285 * 1.5;
        auVar55._0_4_ = fVar274 * 1.5;
        fVar290 = auVar173._8_4_;
        auVar55._8_4_ = fVar290 * 1.5;
        fVar303 = auVar173._12_4_;
        auVar55._12_4_ = fVar303 * 1.5;
        fVar271 = auVar173._16_4_;
        auVar55._16_4_ = fVar271 * 1.5;
        fVar273 = auVar173._20_4_;
        auVar55._20_4_ = fVar273 * 1.5;
        fVar317 = auVar173._24_4_;
        auVar55._24_4_ = fVar317 * 1.5;
        auVar55._28_4_ = fVar228;
        auVar56._4_4_ = fVar285 * fVar285 * fVar285 * auVar177._4_4_ * 0.5;
        auVar56._0_4_ = fVar274 * fVar274 * fVar274 * auVar177._0_4_ * 0.5;
        auVar56._8_4_ = fVar290 * fVar290 * fVar290 * auVar177._8_4_ * 0.5;
        auVar56._12_4_ = fVar303 * fVar303 * fVar303 * auVar177._12_4_ * 0.5;
        auVar56._16_4_ = fVar271 * fVar271 * fVar271 * auVar177._16_4_ * 0.5;
        auVar56._20_4_ = fVar273 * fVar273 * fVar273 * auVar177._20_4_ * 0.5;
        auVar56._24_4_ = fVar317 * fVar317 * fVar317 * auVar177._24_4_ * 0.5;
        auVar56._28_4_ = auVar177._28_4_;
        auVar173 = vsubps_avx(auVar55,auVar56);
        fVar274 = auVar173._0_4_;
        fVar285 = auVar173._4_4_;
        fVar290 = auVar173._8_4_;
        fVar303 = auVar173._12_4_;
        fVar271 = auVar173._16_4_;
        fVar273 = auVar173._20_4_;
        fVar317 = auVar173._24_4_;
        fVar367 = (float)local_980._0_4_ * fVar251 * fVar270;
        fVar375 = (float)local_980._4_4_ * fVar275 * fVar283;
        auVar57._4_4_ = fVar375;
        auVar57._0_4_ = fVar367;
        fVar376 = fStack_978 * fVar286 * fVar287;
        auVar57._8_4_ = fVar376;
        fVar377 = fStack_974 * fVar297 * fVar299;
        auVar57._12_4_ = fVar377;
        fVar378 = fStack_970 * fVar304 * fVar306;
        auVar57._16_4_ = fVar378;
        fVar379 = fStack_96c * fVar305 * fVar348;
        auVar57._20_4_ = fVar379;
        fVar380 = fStack_968 * fVar307 * fVar202;
        auVar57._24_4_ = fVar380;
        auVar57._28_4_ = fVar228;
        fVar251 = (float)local_980._0_4_ * fVar270 * -fVar167;
        fVar275 = (float)local_980._4_4_ * fVar283 * -fVar191;
        auVar58._4_4_ = fVar275;
        auVar58._0_4_ = fVar251;
        fVar286 = fStack_978 * fVar287 * -fVar192;
        auVar58._8_4_ = fVar286;
        fVar297 = fStack_974 * fVar299 * -fVar193;
        auVar58._12_4_ = fVar297;
        fVar304 = fStack_970 * fVar306 * -fVar195;
        auVar58._16_4_ = fVar304;
        fVar305 = fStack_96c * fVar348 * -fVar197;
        auVar58._20_4_ = fVar305;
        fVar307 = fStack_968 * fVar202 * -fVar199;
        auVar58._24_4_ = fVar307;
        auVar58._28_4_ = fVar309;
        local_700._4_4_ = auVar355._4_4_ + fVar275;
        local_700._0_4_ = auVar355._0_4_ + fVar251;
        fStack_6f8 = auVar355._8_4_ + fVar286;
        fStack_6f4 = auVar355._12_4_ + fVar297;
        fStack_6f0 = auVar355._16_4_ + fVar304;
        fStack_6ec = auVar355._20_4_ + fVar305;
        fStack_6e8 = auVar355._24_4_ + fVar307;
        fStack_6e4 = auVar355._28_4_ + fVar309;
        fVar251 = fVar270 * 0.0 * (float)local_980._0_4_;
        fVar270 = fVar283 * 0.0 * (float)local_980._4_4_;
        auVar59._4_4_ = fVar270;
        auVar59._0_4_ = fVar251;
        fVar275 = fVar287 * 0.0 * fStack_978;
        auVar59._8_4_ = fVar275;
        fVar283 = fVar299 * 0.0 * fStack_974;
        auVar59._12_4_ = fVar283;
        fVar286 = fVar306 * 0.0 * fStack_970;
        auVar59._16_4_ = fVar286;
        fVar287 = fVar348 * 0.0 * fStack_96c;
        auVar59._20_4_ = fVar287;
        fVar297 = fVar202 * 0.0 * fStack_968;
        auVar59._24_4_ = fVar297;
        auVar59._28_4_ = fVar407;
        auVar148._4_4_ = fStack_6bc;
        auVar148._0_4_ = local_6c0;
        auVar148._8_4_ = fStack_6b8;
        auVar148._12_4_ = fStack_6b4;
        auVar148._16_4_ = fVar194;
        auVar148._20_4_ = fVar196;
        auVar148._24_4_ = fVar198;
        auVar148._28_4_ = fVar200;
        auVar313._0_4_ = local_6c0 + fVar251;
        auVar313._4_4_ = fStack_6bc + fVar270;
        auVar313._8_4_ = fStack_6b8 + fVar275;
        auVar313._12_4_ = fStack_6b4 + fVar283;
        auVar313._16_4_ = fVar194 + fVar286;
        auVar313._20_4_ = fVar196 + fVar287;
        auVar313._24_4_ = fVar198 + fVar297;
        auVar313._28_4_ = fVar200 + fVar407;
        fVar251 = local_880._0_4_ * fVar272 * fVar274;
        fVar270 = local_880._4_4_ * fVar284 * fVar285;
        auVar60._4_4_ = fVar270;
        auVar60._0_4_ = fVar251;
        fVar272 = local_880._8_4_ * fVar288 * fVar290;
        auVar60._8_4_ = fVar272;
        fVar275 = local_880._12_4_ * fVar301 * fVar303;
        auVar60._12_4_ = fVar275;
        fVar283 = local_880._16_4_ * fVar347 * fVar271;
        auVar60._16_4_ = fVar283;
        fVar284 = local_880._20_4_ * fVar349 * fVar273;
        auVar60._20_4_ = fVar284;
        fVar286 = local_880._24_4_ * fVar229 * fVar317;
        auVar60._24_4_ = fVar286;
        auVar60._28_4_ = auVar39._28_4_;
        auVar43 = vsubps_avx(auVar392,auVar57);
        auVar372._0_4_ = auVar278._0_4_ + fVar251;
        auVar372._4_4_ = auVar278._4_4_ + fVar270;
        auVar372._8_4_ = auVar278._8_4_ + fVar272;
        auVar372._12_4_ = auVar278._12_4_ + fVar275;
        auVar372._16_4_ = auVar278._16_4_ + fVar283;
        auVar372._20_4_ = auVar278._20_4_ + fVar284;
        auVar372._24_4_ = auVar278._24_4_ + fVar286;
        auVar372._28_4_ = auVar278._28_4_ + auVar39._28_4_;
        fVar251 = local_880._0_4_ * fVar274 * -fVar201;
        fVar270 = local_880._4_4_ * fVar285 * -fVar289;
        auVar61._4_4_ = fVar270;
        auVar61._0_4_ = fVar251;
        fVar272 = local_880._8_4_ * fVar290 * -fVar268;
        auVar61._8_4_ = fVar272;
        fVar275 = local_880._12_4_ * fVar303 * -fVar203;
        auVar61._12_4_ = fVar275;
        fVar283 = local_880._16_4_ * fVar271 * -fVar224;
        auVar61._16_4_ = fVar283;
        fVar284 = local_880._20_4_ * fVar273 * -fVar225;
        auVar61._20_4_ = fVar284;
        fVar286 = local_880._24_4_ * fVar317 * -fVar227;
        auVar61._24_4_ = fVar286;
        auVar61._28_4_ = fVar423;
        auVar44 = vsubps_avx(auVar355,auVar58);
        auVar387._0_4_ = fVar251 + auVar260._0_4_;
        auVar387._4_4_ = fVar270 + auVar260._4_4_;
        auVar387._8_4_ = fVar272 + auVar260._8_4_;
        auVar387._12_4_ = fVar275 + auVar260._12_4_;
        auVar387._16_4_ = fVar283 + auVar260._16_4_;
        auVar387._20_4_ = fVar284 + auVar260._20_4_;
        auVar387._24_4_ = fVar286 + auVar260._24_4_;
        auVar387._28_4_ = fVar423 + auVar260._28_4_;
        fVar251 = fVar274 * 0.0 * local_880._0_4_;
        fVar270 = fVar285 * 0.0 * local_880._4_4_;
        auVar62._4_4_ = fVar270;
        auVar62._0_4_ = fVar251;
        fVar272 = fVar290 * 0.0 * local_880._8_4_;
        auVar62._8_4_ = fVar272;
        fVar274 = fVar303 * 0.0 * local_880._12_4_;
        auVar62._12_4_ = fVar274;
        fVar275 = fVar271 * 0.0 * local_880._16_4_;
        auVar62._16_4_ = fVar275;
        fVar283 = fVar273 * 0.0 * local_880._20_4_;
        auVar62._20_4_ = fVar283;
        fVar284 = fVar317 * 0.0 * local_880._24_4_;
        auVar62._24_4_ = fVar284;
        auVar62._28_4_ = fVar309;
        auVar45 = vsubps_avx(auVar148,auVar59);
        auVar150._4_4_ = fStack_5dc;
        auVar150._0_4_ = local_5e0;
        auVar150._8_4_ = fStack_5d8;
        auVar150._12_4_ = fStack_5d4;
        auVar150._16_4_ = fStack_5d0;
        auVar150._20_4_ = fStack_5cc;
        auVar150._24_4_ = fStack_5c8;
        auVar150._28_4_ = fStack_5c4;
        auVar425._0_4_ = local_5e0 + fVar251;
        auVar425._4_4_ = fStack_5dc + fVar270;
        auVar425._8_4_ = fStack_5d8 + fVar272;
        auVar425._12_4_ = fStack_5d4 + fVar274;
        auVar425._16_4_ = fStack_5d0 + fVar275;
        auVar425._20_4_ = fStack_5cc + fVar283;
        auVar425._24_4_ = fStack_5c8 + fVar284;
        auVar425._28_4_ = fStack_5c4 + fVar309;
        auVar173 = vsubps_avx(auVar278,auVar60);
        auVar180 = vsubps_avx(auVar260,auVar61);
        auVar39 = vsubps_avx(auVar150,auVar62);
        auVar40 = vsubps_avx(auVar387,auVar44);
        auVar41 = vsubps_avx(auVar425,auVar45);
        auVar63._4_4_ = auVar45._4_4_ * auVar40._4_4_;
        auVar63._0_4_ = auVar45._0_4_ * auVar40._0_4_;
        auVar63._8_4_ = auVar45._8_4_ * auVar40._8_4_;
        auVar63._12_4_ = auVar45._12_4_ * auVar40._12_4_;
        auVar63._16_4_ = auVar45._16_4_ * auVar40._16_4_;
        auVar63._20_4_ = auVar45._20_4_ * auVar40._20_4_;
        auVar63._24_4_ = auVar45._24_4_ * auVar40._24_4_;
        auVar63._28_4_ = fVar423;
        auVar64._4_4_ = auVar44._4_4_ * auVar41._4_4_;
        auVar64._0_4_ = auVar44._0_4_ * auVar41._0_4_;
        auVar64._8_4_ = auVar44._8_4_ * auVar41._8_4_;
        auVar64._12_4_ = auVar44._12_4_ * auVar41._12_4_;
        auVar64._16_4_ = auVar44._16_4_ * auVar41._16_4_;
        auVar64._20_4_ = auVar44._20_4_ * auVar41._20_4_;
        auVar64._24_4_ = auVar44._24_4_ * auVar41._24_4_;
        auVar64._28_4_ = auVar260._28_4_;
        auVar42 = vsubps_avx(auVar64,auVar63);
        auVar65._4_4_ = auVar43._4_4_ * auVar41._4_4_;
        auVar65._0_4_ = auVar43._0_4_ * auVar41._0_4_;
        auVar65._8_4_ = auVar43._8_4_ * auVar41._8_4_;
        auVar65._12_4_ = auVar43._12_4_ * auVar41._12_4_;
        auVar65._16_4_ = auVar43._16_4_ * auVar41._16_4_;
        auVar65._20_4_ = auVar43._20_4_ * auVar41._20_4_;
        auVar65._24_4_ = auVar43._24_4_ * auVar41._24_4_;
        auVar65._28_4_ = auVar41._28_4_;
        auVar47 = vsubps_avx(auVar372,auVar43);
        auVar66._4_4_ = auVar45._4_4_ * auVar47._4_4_;
        auVar66._0_4_ = auVar45._0_4_ * auVar47._0_4_;
        auVar66._8_4_ = auVar45._8_4_ * auVar47._8_4_;
        auVar66._12_4_ = auVar45._12_4_ * auVar47._12_4_;
        auVar66._16_4_ = auVar45._16_4_ * auVar47._16_4_;
        auVar66._20_4_ = auVar45._20_4_ * auVar47._20_4_;
        auVar66._24_4_ = auVar45._24_4_ * auVar47._24_4_;
        auVar66._28_4_ = auVar278._28_4_;
        auVar48 = vsubps_avx(auVar66,auVar65);
        auVar67._4_4_ = auVar47._4_4_ * auVar44._4_4_;
        auVar67._0_4_ = auVar47._0_4_ * auVar44._0_4_;
        auVar67._8_4_ = auVar47._8_4_ * auVar44._8_4_;
        auVar67._12_4_ = auVar47._12_4_ * auVar44._12_4_;
        auVar67._16_4_ = auVar47._16_4_ * auVar44._16_4_;
        auVar67._20_4_ = auVar47._20_4_ * auVar44._20_4_;
        auVar67._24_4_ = auVar47._24_4_ * auVar44._24_4_;
        auVar67._28_4_ = auVar41._28_4_;
        auVar68._4_4_ = auVar43._4_4_ * auVar40._4_4_;
        auVar68._0_4_ = auVar43._0_4_ * auVar40._0_4_;
        auVar68._8_4_ = auVar43._8_4_ * auVar40._8_4_;
        auVar68._12_4_ = auVar43._12_4_ * auVar40._12_4_;
        auVar68._16_4_ = auVar43._16_4_ * auVar40._16_4_;
        auVar68._20_4_ = auVar43._20_4_ * auVar40._20_4_;
        auVar68._24_4_ = auVar43._24_4_ * auVar40._24_4_;
        auVar68._28_4_ = auVar40._28_4_;
        auVar40 = vsubps_avx(auVar68,auVar67);
        auVar178._0_4_ = auVar42._0_4_ * 0.0 + auVar40._0_4_ + auVar48._0_4_ * 0.0;
        auVar178._4_4_ = auVar42._4_4_ * 0.0 + auVar40._4_4_ + auVar48._4_4_ * 0.0;
        auVar178._8_4_ = auVar42._8_4_ * 0.0 + auVar40._8_4_ + auVar48._8_4_ * 0.0;
        auVar178._12_4_ = auVar42._12_4_ * 0.0 + auVar40._12_4_ + auVar48._12_4_ * 0.0;
        auVar178._16_4_ = auVar42._16_4_ * 0.0 + auVar40._16_4_ + auVar48._16_4_ * 0.0;
        auVar178._20_4_ = auVar42._20_4_ * 0.0 + auVar40._20_4_ + auVar48._20_4_ * 0.0;
        auVar178._24_4_ = auVar42._24_4_ * 0.0 + auVar40._24_4_ + auVar48._24_4_ * 0.0;
        auVar178._28_4_ = auVar40._28_4_ + auVar40._28_4_ + auVar48._28_4_;
        auVar47 = vcmpps_avx(auVar178,ZEXT432(0) << 0x20,2);
        auVar147._4_4_ = fVar375 + auVar392._4_4_;
        auVar147._0_4_ = fVar367 + auVar392._0_4_;
        auVar147._8_4_ = fVar376 + auVar392._8_4_;
        auVar147._12_4_ = fVar377 + auVar392._12_4_;
        auVar147._16_4_ = fVar378 + auVar392._16_4_;
        auVar147._20_4_ = fVar379 + auVar392._20_4_;
        auVar147._24_4_ = fVar380 + auVar392._24_4_;
        auVar147._28_4_ = fVar228 + auVar392._28_4_;
        auVar173 = vblendvps_avx(auVar173,auVar147,auVar47);
        auVar180 = vblendvps_avx(auVar180,_local_700,auVar47);
        auVar39 = vblendvps_avx(auVar39,auVar313,auVar47);
        auVar40 = vblendvps_avx(auVar43,auVar372,auVar47);
        auVar41 = vblendvps_avx(auVar44,auVar387,auVar47);
        auVar42 = vblendvps_avx(auVar45,auVar425,auVar47);
        auVar43 = vblendvps_avx(auVar372,auVar43,auVar47);
        auVar44 = vblendvps_avx(auVar387,auVar44,auVar47);
        auVar169 = vpackssdw_avx(local_4c0._0_16_,local_4c0._16_16_);
        auVar45 = vblendvps_avx(auVar425,auVar45,auVar47);
        auVar43 = vsubps_avx(auVar43,auVar173);
        auVar48 = vsubps_avx(auVar44,auVar180);
        auVar45 = vsubps_avx(auVar45,auVar39);
        auVar174 = vsubps_avx(auVar180,auVar41);
        fVar251 = auVar48._0_4_;
        fVar199 = auVar39._0_4_;
        fVar283 = auVar48._4_4_;
        fVar201 = auVar39._4_4_;
        auVar69._4_4_ = fVar201 * fVar283;
        auVar69._0_4_ = fVar199 * fVar251;
        fVar288 = auVar48._8_4_;
        fVar289 = auVar39._8_4_;
        auVar69._8_4_ = fVar289 * fVar288;
        fVar303 = auVar48._12_4_;
        fVar268 = auVar39._12_4_;
        auVar69._12_4_ = fVar268 * fVar303;
        fVar305 = auVar48._16_4_;
        fVar203 = auVar39._16_4_;
        auVar69._16_4_ = fVar203 * fVar305;
        fVar202 = auVar48._20_4_;
        fVar224 = auVar39._20_4_;
        auVar69._20_4_ = fVar224 * fVar202;
        fVar191 = auVar48._24_4_;
        fVar225 = auVar39._24_4_;
        auVar69._24_4_ = fVar225 * fVar191;
        auVar69._28_4_ = auVar44._28_4_;
        fVar270 = auVar180._0_4_;
        fVar379 = auVar45._0_4_;
        fVar284 = auVar180._4_4_;
        fVar380 = auVar45._4_4_;
        auVar70._4_4_ = fVar380 * fVar284;
        auVar70._0_4_ = fVar379 * fVar270;
        fVar290 = auVar180._8_4_;
        fVar291 = auVar45._8_4_;
        auVar70._8_4_ = fVar291 * fVar290;
        fVar304 = auVar180._12_4_;
        fVar298 = auVar45._12_4_;
        auVar70._12_4_ = fVar298 * fVar304;
        fVar348 = auVar180._16_4_;
        fVar300 = auVar45._16_4_;
        auVar70._16_4_ = fVar300 * fVar348;
        fVar229 = auVar180._20_4_;
        fVar302 = auVar45._20_4_;
        auVar70._20_4_ = fVar302 * fVar229;
        fVar192 = auVar180._24_4_;
        fVar328 = auVar45._24_4_;
        auVar70._24_4_ = fVar328 * fVar192;
        auVar70._28_4_ = auVar387._28_4_;
        auVar180 = vsubps_avx(auVar70,auVar69);
        fVar272 = auVar173._0_4_;
        fVar285 = auVar173._4_4_;
        auVar71._4_4_ = fVar380 * fVar285;
        auVar71._0_4_ = fVar379 * fVar272;
        fVar297 = auVar173._8_4_;
        auVar71._8_4_ = fVar291 * fVar297;
        fVar306 = auVar173._12_4_;
        auVar71._12_4_ = fVar298 * fVar306;
        fVar349 = auVar173._16_4_;
        auVar71._16_4_ = fVar300 * fVar349;
        fVar317 = auVar173._20_4_;
        auVar71._20_4_ = fVar302 * fVar317;
        fVar193 = auVar173._24_4_;
        auVar71._24_4_ = fVar328 * fVar193;
        auVar71._28_4_ = auVar387._28_4_;
        fVar274 = auVar43._0_4_;
        auVar414._0_4_ = fVar199 * fVar274;
        fVar286 = auVar43._4_4_;
        auVar414._4_4_ = fVar201 * fVar286;
        fVar299 = auVar43._8_4_;
        auVar414._8_4_ = fVar289 * fVar299;
        fVar347 = auVar43._12_4_;
        auVar414._12_4_ = fVar268 * fVar347;
        fVar273 = auVar43._16_4_;
        auVar414._16_4_ = fVar203 * fVar273;
        fVar228 = auVar43._20_4_;
        auVar414._20_4_ = fVar224 * fVar228;
        fVar195 = auVar43._24_4_;
        auVar414._24_4_ = fVar225 * fVar195;
        auVar414._28_4_ = 0;
        auVar44 = vsubps_avx(auVar414,auVar71);
        auVar72._4_4_ = fVar284 * fVar286;
        auVar72._0_4_ = fVar270 * fVar274;
        auVar72._8_4_ = fVar290 * fVar299;
        auVar72._12_4_ = fVar304 * fVar347;
        auVar72._16_4_ = fVar348 * fVar273;
        auVar72._20_4_ = fVar229 * fVar228;
        auVar72._24_4_ = fVar192 * fVar195;
        auVar72._28_4_ = auVar387._28_4_;
        auVar73._4_4_ = fVar285 * fVar283;
        auVar73._0_4_ = fVar272 * fVar251;
        auVar73._8_4_ = fVar297 * fVar288;
        auVar73._12_4_ = fVar306 * fVar303;
        auVar73._16_4_ = fVar349 * fVar305;
        auVar73._20_4_ = fVar317 * fVar202;
        auVar73._24_4_ = fVar193 * fVar191;
        auVar73._28_4_ = auVar425._28_4_;
        auVar175 = vsubps_avx(auVar73,auVar72);
        auVar210 = vsubps_avx(auVar39,auVar42);
        fVar275 = auVar175._28_4_ + auVar44._28_4_;
        auVar214._0_4_ = auVar175._0_4_ + auVar44._0_4_ * 0.0 + auVar180._0_4_ * 0.0;
        auVar214._4_4_ = auVar175._4_4_ + auVar44._4_4_ * 0.0 + auVar180._4_4_ * 0.0;
        auVar214._8_4_ = auVar175._8_4_ + auVar44._8_4_ * 0.0 + auVar180._8_4_ * 0.0;
        auVar214._12_4_ = auVar175._12_4_ + auVar44._12_4_ * 0.0 + auVar180._12_4_ * 0.0;
        auVar214._16_4_ = auVar175._16_4_ + auVar44._16_4_ * 0.0 + auVar180._16_4_ * 0.0;
        auVar214._20_4_ = auVar175._20_4_ + auVar44._20_4_ * 0.0 + auVar180._20_4_ * 0.0;
        auVar214._24_4_ = auVar175._24_4_ + auVar44._24_4_ * 0.0 + auVar180._24_4_ * 0.0;
        auVar214._28_4_ = fVar275 + auVar180._28_4_;
        fVar227 = auVar174._0_4_;
        fVar309 = auVar174._4_4_;
        auVar74._4_4_ = fVar309 * auVar42._4_4_;
        auVar74._0_4_ = fVar227 * auVar42._0_4_;
        fVar367 = auVar174._8_4_;
        auVar74._8_4_ = fVar367 * auVar42._8_4_;
        fVar375 = auVar174._12_4_;
        auVar74._12_4_ = fVar375 * auVar42._12_4_;
        fVar376 = auVar174._16_4_;
        auVar74._16_4_ = fVar376 * auVar42._16_4_;
        fVar377 = auVar174._20_4_;
        auVar74._20_4_ = fVar377 * auVar42._20_4_;
        fVar378 = auVar174._24_4_;
        auVar74._24_4_ = fVar378 * auVar42._24_4_;
        auVar74._28_4_ = fVar275;
        fVar275 = auVar210._0_4_;
        fVar287 = auVar210._4_4_;
        auVar75._4_4_ = auVar41._4_4_ * fVar287;
        auVar75._0_4_ = auVar41._0_4_ * fVar275;
        fVar301 = auVar210._8_4_;
        auVar75._8_4_ = auVar41._8_4_ * fVar301;
        fVar271 = auVar210._12_4_;
        auVar75._12_4_ = auVar41._12_4_ * fVar271;
        fVar307 = auVar210._16_4_;
        auVar75._16_4_ = auVar41._16_4_ * fVar307;
        fVar167 = auVar210._20_4_;
        auVar75._20_4_ = auVar41._20_4_ * fVar167;
        fVar197 = auVar210._24_4_;
        auVar75._24_4_ = auVar41._24_4_ * fVar197;
        auVar75._28_4_ = auVar175._28_4_;
        auVar44 = vsubps_avx(auVar75,auVar74);
        auVar173 = vsubps_avx(auVar173,auVar40);
        fVar329 = auVar173._0_4_;
        fVar350 = auVar173._4_4_;
        auVar76._4_4_ = fVar350 * auVar42._4_4_;
        auVar76._0_4_ = fVar329 * auVar42._0_4_;
        fVar360 = auVar173._8_4_;
        auVar76._8_4_ = fVar360 * auVar42._8_4_;
        fVar361 = auVar173._12_4_;
        auVar76._12_4_ = fVar361 * auVar42._12_4_;
        fVar362 = auVar173._16_4_;
        auVar76._16_4_ = fVar362 * auVar42._16_4_;
        fVar363 = auVar173._20_4_;
        auVar76._20_4_ = fVar363 * auVar42._20_4_;
        fVar364 = auVar173._24_4_;
        auVar76._24_4_ = fVar364 * auVar42._24_4_;
        auVar76._28_4_ = auVar42._28_4_;
        auVar77._4_4_ = auVar40._4_4_ * fVar287;
        auVar77._0_4_ = auVar40._0_4_ * fVar275;
        auVar77._8_4_ = auVar40._8_4_ * fVar301;
        auVar77._12_4_ = auVar40._12_4_ * fVar271;
        auVar77._16_4_ = auVar40._16_4_ * fVar307;
        auVar77._20_4_ = auVar40._20_4_ * fVar167;
        auVar77._24_4_ = auVar40._24_4_ * fVar197;
        auVar77._28_4_ = auVar180._28_4_;
        auVar173 = vsubps_avx(auVar76,auVar77);
        auVar78._4_4_ = auVar41._4_4_ * fVar350;
        auVar78._0_4_ = auVar41._0_4_ * fVar329;
        auVar78._8_4_ = auVar41._8_4_ * fVar360;
        auVar78._12_4_ = auVar41._12_4_ * fVar361;
        auVar78._16_4_ = auVar41._16_4_ * fVar362;
        auVar78._20_4_ = auVar41._20_4_ * fVar363;
        auVar78._24_4_ = auVar41._24_4_ * fVar364;
        auVar78._28_4_ = auVar42._28_4_;
        auVar79._4_4_ = auVar40._4_4_ * fVar309;
        auVar79._0_4_ = auVar40._0_4_ * fVar227;
        auVar79._8_4_ = auVar40._8_4_ * fVar367;
        auVar79._12_4_ = auVar40._12_4_ * fVar375;
        auVar79._16_4_ = auVar40._16_4_ * fVar376;
        auVar79._20_4_ = auVar40._20_4_ * fVar377;
        auVar79._24_4_ = auVar40._24_4_ * fVar378;
        auVar79._28_4_ = auVar40._28_4_;
        auVar180 = vsubps_avx(auVar79,auVar78);
        auVar190 = ZEXT864(0) << 0x20;
        auVar280._0_4_ = auVar44._0_4_ * 0.0 + auVar180._0_4_ + auVar173._0_4_ * 0.0;
        auVar280._4_4_ = auVar44._4_4_ * 0.0 + auVar180._4_4_ + auVar173._4_4_ * 0.0;
        auVar280._8_4_ = auVar44._8_4_ * 0.0 + auVar180._8_4_ + auVar173._8_4_ * 0.0;
        auVar280._12_4_ = auVar44._12_4_ * 0.0 + auVar180._12_4_ + auVar173._12_4_ * 0.0;
        auVar280._16_4_ = auVar44._16_4_ * 0.0 + auVar180._16_4_ + auVar173._16_4_ * 0.0;
        auVar280._20_4_ = auVar44._20_4_ * 0.0 + auVar180._20_4_ + auVar173._20_4_ * 0.0;
        auVar280._24_4_ = auVar44._24_4_ * 0.0 + auVar180._24_4_ + auVar173._24_4_ * 0.0;
        auVar280._28_4_ = auVar180._28_4_ + auVar180._28_4_ + auVar173._28_4_;
        auVar173 = vmaxps_avx(auVar214,auVar280);
        auVar173 = vcmpps_avx(auVar173,ZEXT832(0) << 0x20,2);
        auVar235 = vpackssdw_avx(auVar173._0_16_,auVar173._16_16_);
        auVar169 = vpand_avx(auVar235,auVar169);
        auVar235 = vpmovsxwd_avx(auVar169);
        auVar255 = vpunpckhwd_avx(auVar169,auVar169);
        auVar262._16_16_ = auVar255;
        auVar262._0_16_ = auVar235;
        if ((((((((auVar262 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar262 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar262 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar262 >> 0x7f,0) == '\0') &&
              (auVar262 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar255 >> 0x3f,0) == '\0') &&
            (auVar262 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar255[0xf]) {
LAB_0118baaf:
          auVar427 = ZEXT3264(local_620);
          auVar265 = ZEXT3264(auVar262);
          auVar342 = ZEXT3264(CONCAT824(uStack_648,
                                        CONCAT816(uStack_650,CONCAT88(uStack_658,local_660))));
        }
        else {
          auVar80._4_4_ = fVar287 * fVar283;
          auVar80._0_4_ = fVar275 * fVar251;
          auVar80._8_4_ = fVar301 * fVar288;
          auVar80._12_4_ = fVar271 * fVar303;
          auVar80._16_4_ = fVar307 * fVar305;
          auVar80._20_4_ = fVar167 * fVar202;
          auVar80._24_4_ = fVar197 * fVar191;
          auVar80._28_4_ = auVar255._12_4_;
          auVar394._0_4_ = fVar227 * fVar379;
          auVar394._4_4_ = fVar309 * fVar380;
          auVar394._8_4_ = fVar367 * fVar291;
          auVar394._12_4_ = fVar375 * fVar298;
          auVar394._16_4_ = fVar376 * fVar300;
          auVar394._20_4_ = fVar377 * fVar302;
          auVar394._24_4_ = fVar378 * fVar328;
          auVar394._28_4_ = 0;
          auVar173 = vsubps_avx(auVar394,auVar80);
          auVar81._4_4_ = fVar350 * fVar380;
          auVar81._0_4_ = fVar329 * fVar379;
          auVar81._8_4_ = fVar360 * fVar291;
          auVar81._12_4_ = fVar361 * fVar298;
          auVar81._16_4_ = fVar362 * fVar300;
          auVar81._20_4_ = fVar363 * fVar302;
          auVar81._24_4_ = fVar364 * fVar328;
          auVar81._28_4_ = auVar45._28_4_;
          auVar82._4_4_ = fVar287 * fVar286;
          auVar82._0_4_ = fVar275 * fVar274;
          auVar82._8_4_ = fVar301 * fVar299;
          auVar82._12_4_ = fVar271 * fVar347;
          auVar82._16_4_ = fVar307 * fVar273;
          auVar82._20_4_ = fVar167 * fVar228;
          auVar82._24_4_ = fVar197 * fVar195;
          auVar82._28_4_ = auVar210._28_4_;
          auVar180 = vsubps_avx(auVar82,auVar81);
          auVar83._4_4_ = fVar309 * fVar286;
          auVar83._0_4_ = fVar227 * fVar274;
          auVar83._8_4_ = fVar367 * fVar299;
          auVar83._12_4_ = fVar375 * fVar347;
          auVar83._16_4_ = fVar376 * fVar273;
          auVar83._20_4_ = fVar377 * fVar228;
          auVar83._24_4_ = fVar378 * fVar195;
          auVar83._28_4_ = auVar214._28_4_;
          auVar84._4_4_ = fVar350 * fVar283;
          auVar84._0_4_ = fVar329 * fVar251;
          auVar84._8_4_ = fVar360 * fVar288;
          auVar84._12_4_ = fVar361 * fVar303;
          auVar84._16_4_ = fVar362 * fVar305;
          auVar84._20_4_ = fVar363 * fVar202;
          auVar84._24_4_ = fVar364 * fVar191;
          auVar84._28_4_ = auVar48._28_4_;
          auVar41 = vsubps_avx(auVar84,auVar83);
          auVar325._0_4_ = auVar173._0_4_ * 0.0 + auVar41._0_4_ + auVar180._0_4_ * 0.0;
          auVar325._4_4_ = auVar173._4_4_ * 0.0 + auVar41._4_4_ + auVar180._4_4_ * 0.0;
          auVar325._8_4_ = auVar173._8_4_ * 0.0 + auVar41._8_4_ + auVar180._8_4_ * 0.0;
          auVar325._12_4_ = auVar173._12_4_ * 0.0 + auVar41._12_4_ + auVar180._12_4_ * 0.0;
          auVar325._16_4_ = auVar173._16_4_ * 0.0 + auVar41._16_4_ + auVar180._16_4_ * 0.0;
          auVar325._20_4_ = auVar173._20_4_ * 0.0 + auVar41._20_4_ + auVar180._20_4_ * 0.0;
          auVar325._24_4_ = auVar173._24_4_ * 0.0 + auVar41._24_4_ + auVar180._24_4_ * 0.0;
          auVar325._28_4_ = auVar48._28_4_ + auVar41._28_4_ + auVar214._28_4_;
          auVar40 = vrcpps_avx(auVar325);
          fVar251 = auVar40._0_4_;
          fVar274 = auVar40._4_4_;
          auVar85._4_4_ = auVar325._4_4_ * fVar274;
          auVar85._0_4_ = auVar325._0_4_ * fVar251;
          fVar275 = auVar40._8_4_;
          auVar85._8_4_ = auVar325._8_4_ * fVar275;
          fVar283 = auVar40._12_4_;
          auVar85._12_4_ = auVar325._12_4_ * fVar283;
          fVar286 = auVar40._16_4_;
          auVar85._16_4_ = auVar325._16_4_ * fVar286;
          fVar287 = auVar40._20_4_;
          auVar85._20_4_ = auVar325._20_4_ * fVar287;
          fVar288 = auVar40._24_4_;
          auVar85._24_4_ = auVar325._24_4_ * fVar288;
          auVar85._28_4_ = auVar210._28_4_;
          auVar395._8_4_ = 0x3f800000;
          auVar395._0_8_ = 0x3f8000003f800000;
          auVar395._12_4_ = 0x3f800000;
          auVar395._16_4_ = 0x3f800000;
          auVar395._20_4_ = 0x3f800000;
          auVar395._24_4_ = 0x3f800000;
          auVar395._28_4_ = 0x3f800000;
          auVar42 = vsubps_avx(auVar395,auVar85);
          fVar251 = auVar42._0_4_ * fVar251 + fVar251;
          fVar274 = auVar42._4_4_ * fVar274 + fVar274;
          fVar275 = auVar42._8_4_ * fVar275 + fVar275;
          fVar283 = auVar42._12_4_ * fVar283 + fVar283;
          fVar286 = auVar42._16_4_ * fVar286 + fVar286;
          fVar287 = auVar42._20_4_ * fVar287 + fVar287;
          fVar288 = auVar42._24_4_ * fVar288 + fVar288;
          auVar86._4_4_ =
               (auVar173._4_4_ * fVar285 + auVar180._4_4_ * fVar284 + auVar41._4_4_ * fVar201) *
               fVar274;
          auVar86._0_4_ =
               (auVar173._0_4_ * fVar272 + auVar180._0_4_ * fVar270 + auVar41._0_4_ * fVar199) *
               fVar251;
          auVar86._8_4_ =
               (auVar173._8_4_ * fVar297 + auVar180._8_4_ * fVar290 + auVar41._8_4_ * fVar289) *
               fVar275;
          auVar86._12_4_ =
               (auVar173._12_4_ * fVar306 + auVar180._12_4_ * fVar304 + auVar41._12_4_ * fVar268) *
               fVar283;
          auVar86._16_4_ =
               (auVar173._16_4_ * fVar349 + auVar180._16_4_ * fVar348 + auVar41._16_4_ * fVar203) *
               fVar286;
          auVar86._20_4_ =
               (auVar173._20_4_ * fVar317 + auVar180._20_4_ * fVar229 + auVar41._20_4_ * fVar224) *
               fVar287;
          auVar86._24_4_ =
               (auVar173._24_4_ * fVar193 + auVar180._24_4_ * fVar192 + auVar41._24_4_ * fVar225) *
               fVar288;
          auVar86._28_4_ = auVar43._28_4_ + auVar39._28_4_;
          auVar235 = vpermilps_avx(ZEXT416(uVar162),0);
          auVar179._16_16_ = auVar235;
          auVar179._0_16_ = auVar235;
          auVar173 = vcmpps_avx(auVar179,auVar86,2);
          uVar11 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar263._4_4_ = uVar11;
          auVar263._0_4_ = uVar11;
          auVar263._8_4_ = uVar11;
          auVar263._12_4_ = uVar11;
          auVar263._16_4_ = uVar11;
          auVar263._20_4_ = uVar11;
          auVar263._24_4_ = uVar11;
          auVar263._28_4_ = uVar11;
          auVar180 = vcmpps_avx(auVar86,auVar263,2);
          auVar173 = vandps_avx(auVar180,auVar173);
          auVar235 = vpackssdw_avx(auVar173._0_16_,auVar173._16_16_);
          auVar169 = vpand_avx(auVar169,auVar235);
          auVar235 = vpmovsxwd_avx(auVar169);
          auVar255 = vpshufd_avx(auVar169,0xee);
          auVar255 = vpmovsxwd_avx(auVar255);
          auVar262._16_16_ = auVar255;
          auVar262._0_16_ = auVar235;
          auVar427 = ZEXT3264(local_620);
          if ((((((((auVar262 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar262 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar262 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar262 >> 0x7f,0) == '\0') &&
                (auVar262 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB161(auVar255 >> 0x3f,0) == '\0') &&
              (auVar262 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar255[0xf]) goto LAB_0118baaf;
          auVar173 = vcmpps_avx(ZEXT832(0) << 0x20,auVar325,4);
          auVar235 = vpackssdw_avx(auVar173._0_16_,auVar173._16_16_);
          auVar169 = vpand_avx(auVar169,auVar235);
          auVar235 = vpmovsxwd_avx(auVar169);
          auVar265 = ZEXT1664(auVar235);
          auVar169 = vpunpckhwd_avx(auVar169,auVar169);
          auVar314._16_16_ = auVar169;
          auVar314._0_16_ = auVar235;
          auVar342 = ZEXT3264(CONCAT824(uStack_648,
                                        CONCAT816(uStack_650,CONCAT88(uStack_658,local_660))));
          if ((((((((auVar314 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar314 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar314 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar314 >> 0x7f,0) != '\0') ||
                (auVar314 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB161(auVar169 >> 0x3f,0) != '\0') ||
              (auVar314 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar169[0xf] < '\0') {
            auVar87._4_4_ = auVar214._4_4_ * fVar274;
            auVar87._0_4_ = auVar214._0_4_ * fVar251;
            auVar87._8_4_ = auVar214._8_4_ * fVar275;
            auVar87._12_4_ = auVar214._12_4_ * fVar283;
            auVar87._16_4_ = auVar214._16_4_ * fVar286;
            auVar87._20_4_ = auVar214._20_4_ * fVar287;
            auVar87._24_4_ = auVar214._24_4_ * fVar288;
            auVar87._28_4_ = SUB84(uStack_648,4);
            auVar88._4_4_ = auVar280._4_4_ * fVar274;
            auVar88._0_4_ = auVar280._0_4_ * fVar251;
            auVar88._8_4_ = auVar280._8_4_ * fVar275;
            auVar88._12_4_ = auVar280._12_4_ * fVar283;
            auVar88._16_4_ = auVar280._16_4_ * fVar286;
            auVar88._20_4_ = auVar280._20_4_ * fVar287;
            auVar88._24_4_ = auVar280._24_4_ * fVar288;
            auVar88._28_4_ = auVar42._28_4_ + auVar40._28_4_;
            auVar281._8_4_ = 0x3f800000;
            auVar281._0_8_ = 0x3f8000003f800000;
            auVar281._12_4_ = 0x3f800000;
            auVar281._16_4_ = 0x3f800000;
            auVar281._20_4_ = 0x3f800000;
            auVar281._24_4_ = 0x3f800000;
            auVar281._28_4_ = 0x3f800000;
            auVar173 = vsubps_avx(auVar281,auVar87);
            auVar265 = ZEXT3264(auVar173);
            auVar173 = vblendvps_avx(auVar173,auVar87,auVar47);
            auVar427 = ZEXT3264(auVar173);
            auVar173 = vsubps_avx(auVar281,auVar88);
            _local_520 = vblendvps_avx(auVar173,auVar88,auVar47);
            auVar342 = ZEXT3264(auVar314);
            local_500 = auVar86;
          }
        }
        auVar374 = ZEXT3264(_local_760);
        auVar173 = auVar427._0_32_;
        auVar180 = auVar342._0_32_;
        if ((((((((auVar180 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar180 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar180 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar180 >> 0x7f,0) != '\0') ||
              (auVar342 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
             SUB321(auVar180 >> 0xbf,0) != '\0') ||
            (auVar342 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
            auVar342[0x1f] < '\0') {
          auVar39 = vsubps_avx(local_880,_local_980);
          local_980._0_4_ = (float)local_980._0_4_ + auVar427._0_4_ * auVar39._0_4_;
          local_980._4_4_ = (float)local_980._4_4_ + auVar427._4_4_ * auVar39._4_4_;
          fStack_978 = fStack_978 + auVar427._8_4_ * auVar39._8_4_;
          fStack_974 = fStack_974 + auVar427._12_4_ * auVar39._12_4_;
          fStack_970 = fStack_970 + auVar427._16_4_ * auVar39._16_4_;
          fStack_96c = fStack_96c + auVar427._20_4_ * auVar39._20_4_;
          fStack_968 = fStack_968 + auVar427._24_4_ * auVar39._24_4_;
          fStack_964 = fStack_964 + auVar39._28_4_;
          fVar251 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
          auVar89._4_4_ = ((float)local_980._4_4_ + (float)local_980._4_4_) * fVar251;
          auVar89._0_4_ = ((float)local_980._0_4_ + (float)local_980._0_4_) * fVar251;
          auVar89._8_4_ = (fStack_978 + fStack_978) * fVar251;
          auVar89._12_4_ = (fStack_974 + fStack_974) * fVar251;
          auVar89._16_4_ = (fStack_970 + fStack_970) * fVar251;
          auVar89._20_4_ = (fStack_96c + fStack_96c) * fVar251;
          auVar89._24_4_ = (fStack_968 + fStack_968) * fVar251;
          auVar89._28_4_ = fStack_964 + fStack_964;
          auVar39 = vcmpps_avx(local_500,auVar89,6);
          auVar40 = auVar180 & auVar39;
          if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar40 >> 0x7f,0) != '\0') ||
                (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar40 >> 0xbf,0) != '\0') ||
              (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar40[0x1f] < '\0') {
            auVar265 = ZEXT3264(CONCAT428(0xbf800000,
                                          CONCAT424(0xbf800000,
                                                    CONCAT420(0xbf800000,
                                                              CONCAT416(0xbf800000,
                                                                        CONCAT412(0xbf800000,
                                                                                  CONCAT48(
                                                  0xbf800000,0xbf800000bf800000)))))));
            local_3c0 = (float)local_520._0_4_ + (float)local_520._0_4_ + -1.0;
            fStack_3bc = (float)local_520._4_4_ + (float)local_520._4_4_ + -1.0;
            fStack_3b8 = (float)uStack_518 + (float)uStack_518 + -1.0;
            fStack_3b4 = uStack_518._4_4_ + uStack_518._4_4_ + -1.0;
            fStack_3b0 = (float)uStack_510 + (float)uStack_510 + -1.0;
            fStack_3ac = uStack_510._4_4_ + uStack_510._4_4_ + -1.0;
            fStack_3a8 = (float)uStack_508 + (float)uStack_508 + -1.0;
            fStack_3a4 = uStack_508._4_4_ + uStack_508._4_4_ + -1.0;
            local_520._4_4_ = fStack_3bc;
            local_520._0_4_ = local_3c0;
            uStack_518._0_4_ = fStack_3b8;
            uStack_518._4_4_ = fStack_3b4;
            uStack_510._0_4_ = fStack_3b0;
            uStack_510._4_4_ = fStack_3ac;
            auVar155 = _local_520;
            uStack_508._0_4_ = fStack_3a8;
            uStack_508._4_4_ = fStack_3a4;
            auVar40 = _local_520;
            local_3a0 = local_500;
            local_380 = 0;
            uStack_368 = uStack_918;
            uStack_358 = uStack_928;
            local_350 = local_8d0;
            uStack_348 = uStack_8c8;
            uStack_338 = uStack_8b8;
            _local_520 = auVar40;
            if ((pGVar165->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              local_6a0 = vandps_avx(auVar39,auVar180);
              auVar232._0_4_ = 1.0 / (float)(int)uVar34;
              auVar232._4_12_ = SUB6012((undefined1  [60])0x0,0);
              auVar169 = vshufps_avx(auVar232,auVar232,0);
              local_300[0] = auVar169._0_4_ * (auVar427._0_4_ + 0.0);
              local_300[1] = auVar169._4_4_ * (auVar427._4_4_ + 1.0);
              local_300[2] = auVar169._8_4_ * (auVar427._8_4_ + 2.0);
              local_300[3] = auVar169._12_4_ * (auVar427._12_4_ + 3.0);
              fStack_2f0 = auVar169._0_4_ * (auVar427._16_4_ + 4.0);
              fStack_2ec = auVar169._4_4_ * (auVar427._20_4_ + 5.0);
              fStack_2e8 = auVar169._8_4_ * (auVar427._24_4_ + 6.0);
              fStack_2e4 = auVar427._28_4_ + 7.0;
              uStack_510 = auVar155._16_8_;
              uStack_508 = auVar40._24_8_;
              local_2e0 = local_520;
              uStack_2d8 = uStack_518;
              uStack_2d0 = uStack_510;
              uStack_2c8 = uStack_508;
              local_2c0 = local_500;
              auVar215._8_4_ = 0x7f800000;
              auVar215._0_8_ = 0x7f8000007f800000;
              auVar215._12_4_ = 0x7f800000;
              auVar215._16_4_ = 0x7f800000;
              auVar215._20_4_ = 0x7f800000;
              auVar215._24_4_ = 0x7f800000;
              auVar215._28_4_ = 0x7f800000;
              auVar180 = vblendvps_avx(auVar215,local_500,local_6a0);
              auVar39 = vshufps_avx(auVar180,auVar180,0xb1);
              auVar39 = vminps_avx(auVar180,auVar39);
              auVar40 = vshufpd_avx(auVar39,auVar39,5);
              auVar39 = vminps_avx(auVar39,auVar40);
              auVar40 = vperm2f128_avx(auVar39,auVar39,1);
              auVar39 = vminps_avx(auVar39,auVar40);
              auVar39 = vcmpps_avx(auVar180,auVar39,0);
              auVar40 = local_6a0 & auVar39;
              auVar180 = local_6a0;
              if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar40 >> 0x7f,0) != '\0') ||
                    (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar40 >> 0xbf,0) != '\0') ||
                  (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar40[0x1f] < '\0') {
                auVar180 = vandps_avx(auVar39,local_6a0);
              }
              uVar157 = vmovmskps_avx(auVar180);
              uVar158 = 0;
              if (uVar157 != 0) {
                for (; (uVar157 >> uVar158 & 1) == 0; uVar158 = uVar158 + 1) {
                }
              }
              uVar159 = (ulong)uVar158;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar165->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar251 = local_300[uVar159];
                uVar11 = *(undefined4 *)((long)&local_2e0 + uVar159 * 4);
                fVar272 = 1.0 - fVar251;
                fVar270 = fVar251 * fVar272 + fVar251 * fVar272;
                auVar169 = ZEXT416((uint)(fVar251 * fVar251 * 3.0));
                auVar169 = vshufps_avx(auVar169,auVar169,0);
                auVar235 = ZEXT416((uint)((fVar270 - fVar251 * fVar251) * 3.0));
                auVar235 = vshufps_avx(auVar235,auVar235,0);
                auVar255 = ZEXT416((uint)((fVar272 * fVar272 - fVar270) * 3.0));
                auVar255 = vshufps_avx(auVar255,auVar255,0);
                auVar237 = ZEXT416((uint)(fVar272 * fVar272 * -3.0));
                auVar237 = vshufps_avx(auVar237,auVar237,0);
                auVar233._0_4_ =
                     auVar237._0_4_ * fVar330 +
                     auVar255._0_4_ * fVar318 + auVar169._0_4_ * fVar408 + auVar235._0_4_ * fVar252;
                auVar233._4_4_ =
                     auVar237._4_4_ * fVar343 +
                     auVar255._4_4_ * fVar327 + auVar169._4_4_ * fVar415 + auVar235._4_4_ * fVar223;
                auVar233._8_4_ =
                     auVar237._8_4_ * auVar332._8_4_ +
                     auVar255._8_4_ * auVar319._8_4_ +
                     auVar169._8_4_ * auVar412._8_4_ + auVar235._8_4_ * fVar266;
                auVar233._12_4_ =
                     auVar237._12_4_ * auVar332._12_4_ +
                     auVar255._12_4_ * auVar319._12_4_ +
                     auVar169._12_4_ * auVar412._12_4_ + auVar235._12_4_ * fVar226;
                auVar265 = ZEXT464(*(uint *)(local_2c0 + uVar159 * 4));
                *(uint *)(ray + k * 4 + 0x100) = *(uint *)(local_2c0 + uVar159 * 4);
                *(float *)(ray + k * 4 + 0x180) = auVar233._0_4_;
                uVar35 = vextractps_avx(auVar233,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar35;
                uVar35 = vextractps_avx(auVar233,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar35;
                *(float *)(ray + k * 4 + 0x1e0) = fVar251;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar11;
                *(uint *)(ray + k * 4 + 0x220) = uVar33;
                *(uint *)(ray + k * 4 + 0x240) = uVar32;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                auVar169 = vshufps_avx(ZEXT416(uVar32),ZEXT416(uVar32),0);
                register0x00001210 = auVar169;
                _local_820 = auVar169;
                auVar169 = vshufps_avx(ZEXT416(uVar33),ZEXT416(uVar33),0);
                register0x00001210 = auVar169;
                local_7a0 = auVar169;
                _local_720 = ZEXT1632(*local_7b0);
                fStack_6b0 = (float)*(undefined8 *)(local_7b8 + 0x10);
                fStack_6ac = (float)((ulong)*(undefined8 *)(local_7b8 + 0x10) >> 0x20);
                fStack_6a8 = (float)*(undefined8 *)(local_7b8 + 0x18);
                fStack_6a4 = (float)((ulong)*(undefined8 *)(local_7b8 + 0x18) >> 0x20);
                local_740 = (float)*(undefined8 *)*local_7b0;
                fStack_73c = (float)((ulong)*(undefined8 *)*local_7b0 >> 0x20);
                fStack_738 = (float)*(undefined8 *)(*local_7b0 + 8);
                fStack_734 = (float)((ulong)*(undefined8 *)(*local_7b0 + 8) >> 0x20);
                auVar342 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                fStack_730 = fStack_6b0;
                fStack_72c = fStack_6ac;
                fStack_728 = fStack_6a8;
                fStack_724 = fStack_6a4;
                local_620 = auVar173;
                _local_4a0 = *pauVar10;
                local_3e0 = auVar173;
                local_37c = uVar34;
                local_370 = auVar332._0_8_;
                local_360 = auVar319._0_8_;
                local_340 = auVar412._0_8_;
                while( true ) {
                  local_1c0 = local_300[uVar159];
                  local_1a0 = *(undefined4 *)((long)&local_2e0 + uVar159 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_2c0 + uVar159 * 4);
                  fVar270 = 1.0 - local_1c0;
                  fVar251 = local_1c0 * fVar270 + local_1c0 * fVar270;
                  auVar169 = ZEXT416((uint)(local_1c0 * local_1c0 * 3.0));
                  auVar169 = vshufps_avx(auVar169,auVar169,0);
                  auVar235 = ZEXT416((uint)((fVar251 - local_1c0 * local_1c0) * 3.0));
                  auVar235 = vshufps_avx(auVar235,auVar235,0);
                  auVar255 = ZEXT416((uint)((fVar270 * fVar270 - fVar251) * 3.0));
                  auVar255 = vshufps_avx(auVar255,auVar255,0);
                  local_8b0.context = context->user;
                  auVar237 = ZEXT416((uint)(fVar270 * fVar270 * -3.0));
                  auVar237 = vshufps_avx(auVar237,auVar237,0);
                  auVar239._0_4_ =
                       auVar237._0_4_ * fVar330 +
                       auVar255._0_4_ * fVar318 +
                       auVar169._0_4_ * fVar408 + auVar235._0_4_ * fVar252;
                  auVar239._4_4_ =
                       auVar237._4_4_ * fVar343 +
                       auVar255._4_4_ * fVar327 +
                       auVar169._4_4_ * fVar415 + auVar235._4_4_ * fVar223;
                  auVar239._8_4_ =
                       auVar237._8_4_ * auVar332._8_4_ +
                       auVar255._8_4_ * auVar319._8_4_ +
                       auVar169._8_4_ * auVar412._8_4_ + auVar235._8_4_ * fVar266;
                  auVar239._12_4_ =
                       auVar237._12_4_ * auVar332._12_4_ +
                       auVar255._12_4_ * auVar319._12_4_ +
                       auVar169._12_4_ * auVar412._12_4_ + auVar235._12_4_ * fVar226;
                  auStack_210 = vshufps_avx(auVar239,auVar239,0);
                  local_220[0] = (RTCHitN)auStack_210[0];
                  local_220[1] = (RTCHitN)auStack_210[1];
                  local_220[2] = (RTCHitN)auStack_210[2];
                  local_220[3] = (RTCHitN)auStack_210[3];
                  local_220[4] = (RTCHitN)auStack_210[4];
                  local_220[5] = (RTCHitN)auStack_210[5];
                  local_220[6] = (RTCHitN)auStack_210[6];
                  local_220[7] = (RTCHitN)auStack_210[7];
                  local_220[8] = (RTCHitN)auStack_210[8];
                  local_220[9] = (RTCHitN)auStack_210[9];
                  local_220[10] = (RTCHitN)auStack_210[10];
                  local_220[0xb] = (RTCHitN)auStack_210[0xb];
                  local_220[0xc] = (RTCHitN)auStack_210[0xc];
                  local_220[0xd] = (RTCHitN)auStack_210[0xd];
                  local_220[0xe] = (RTCHitN)auStack_210[0xe];
                  local_220[0xf] = (RTCHitN)auStack_210[0xf];
                  auStack_1f0 = vshufps_avx(auVar239,auVar239,0x55);
                  local_200 = auStack_1f0;
                  auStack_1d0 = vshufps_avx(auVar239,auVar239,0xaa);
                  local_1e0 = auStack_1d0;
                  fStack_1bc = local_1c0;
                  fStack_1b8 = local_1c0;
                  fStack_1b4 = local_1c0;
                  fStack_1b0 = local_1c0;
                  fStack_1ac = local_1c0;
                  fStack_1a8 = local_1c0;
                  fStack_1a4 = local_1c0;
                  uStack_19c = local_1a0;
                  uStack_198 = local_1a0;
                  uStack_194 = local_1a0;
                  uStack_190 = local_1a0;
                  uStack_18c = local_1a0;
                  uStack_188 = local_1a0;
                  uStack_184 = local_1a0;
                  local_180 = local_7a0._0_8_;
                  uStack_178 = local_7a0._8_8_;
                  uStack_170 = uStack_790;
                  uStack_168 = uStack_788;
                  local_160 = local_820;
                  uStack_158 = uStack_818;
                  uStack_150 = uStack_810;
                  uStack_148 = uStack_808;
                  local_800 = vcmpps_avx(auVar190._0_32_,auVar190._0_32_,0xf);
                  local_7a8[1] = local_800;
                  *local_7a8 = local_800;
                  local_140 = (local_8b0.context)->instID[0];
                  uStack_13c = local_140;
                  uStack_138 = local_140;
                  uStack_134 = local_140;
                  uStack_130 = local_140;
                  uStack_12c = local_140;
                  uStack_128 = local_140;
                  uStack_124 = local_140;
                  local_120 = (local_8b0.context)->instPrimID[0];
                  uStack_11c = local_120;
                  uStack_118 = local_120;
                  uStack_114 = local_120;
                  uStack_110 = local_120;
                  uStack_10c = local_120;
                  uStack_108 = local_120;
                  uStack_104 = local_120;
                  local_7e0 = CONCAT44(fStack_73c,local_740);
                  uStack_7d8 = CONCAT44(fStack_734,fStack_738);
                  uStack_7d0 = CONCAT44(fStack_72c,fStack_730);
                  uStack_7c8 = CONCAT44(fStack_724,fStack_728);
                  local_8b0.valid = (int *)&local_7e0;
                  local_8b0.geometryUserPtr = pGVar165->userPtr;
                  local_8b0.hit = local_220;
                  local_8b0.N = 8;
                  auVar172._4_4_ = fStack_6bc;
                  auVar172._0_4_ = local_6c0;
                  auVar172._8_4_ = fStack_6b8;
                  auVar172._12_4_ = fStack_6b4;
                  auVar209 = local_720._0_16_;
                  local_8b0.ray = (RTCRayN *)ray;
                  if (pGVar165->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    local_880._0_16_ = auVar342._0_16_;
                    (*pGVar165->intersectionFilterN)(&local_8b0);
                    auVar342 = ZEXT1664(local_880._0_16_);
                    auVar374 = ZEXT3264(_local_760);
                    auVar427 = ZEXT3264(local_620);
                    auVar190 = ZEXT1664(ZEXT816(0) << 0x40);
                    auVar209._8_8_ = uStack_7d8;
                    auVar209._0_8_ = local_7e0;
                    auVar172._8_8_ = uStack_7c8;
                    auVar172._0_8_ = uStack_7d0;
                    fVar381 = (float)local_780._0_4_;
                    fVar411 = (float)local_780._4_4_;
                    fVar418 = fStack_778;
                    fVar421 = fStack_774;
                    fVar250 = fStack_770;
                    fVar267 = fStack_76c;
                    fVar269 = fStack_768;
                  }
                  auVar169 = vpcmpeqd_avx(auVar209,ZEXT816(0) << 0x40);
                  auVar235 = vpcmpeqd_avx(auVar172,ZEXT816(0) << 0x40);
                  auVar246._16_16_ = auVar235;
                  auVar246._0_16_ = auVar169;
                  auVar173 = local_800 & ~auVar246;
                  if ((((((((auVar173 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar173 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar173 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar173 >> 0x7f,0) == '\0') &&
                        (auVar173 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar173 >> 0xbf,0) == '\0') &&
                      (auVar173 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar173[0x1f]) {
                    auVar188._0_4_ = auVar169._0_4_ ^ local_800._0_4_;
                    auVar188._4_4_ = auVar169._4_4_ ^ local_800._4_4_;
                    auVar188._8_4_ = auVar169._8_4_ ^ local_800._8_4_;
                    auVar188._12_4_ = auVar169._12_4_ ^ local_800._12_4_;
                    auVar188._16_4_ = auVar235._0_4_ ^ local_800._16_4_;
                    auVar188._20_4_ = auVar235._4_4_ ^ local_800._20_4_;
                    auVar188._24_4_ = auVar235._8_4_ ^ local_800._24_4_;
                    auVar188._28_4_ = auVar235._12_4_ ^ local_800._28_4_;
                  }
                  else {
                    p_Var38 = context->args->filter;
                    if ((p_Var38 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar165->field_8).field_0x2 & 0x40) != 0)))) {
                      local_880._0_16_ = auVar342._0_16_;
                      (*p_Var38)(&local_8b0);
                      auVar342 = ZEXT1664(local_880._0_16_);
                      auVar374 = ZEXT3264(_local_760);
                      auVar427 = ZEXT3264(local_620);
                      auVar190 = ZEXT1664(ZEXT816(0) << 0x40);
                      auVar209._8_8_ = uStack_7d8;
                      auVar209._0_8_ = local_7e0;
                      auVar172._8_8_ = uStack_7c8;
                      auVar172._0_8_ = uStack_7d0;
                      fVar381 = (float)local_780._0_4_;
                      fVar411 = (float)local_780._4_4_;
                      fVar418 = fStack_778;
                      fVar421 = fStack_774;
                      fVar250 = fStack_770;
                      fVar267 = fStack_76c;
                      fVar269 = fStack_768;
                    }
                    auVar169 = vpcmpeqd_avx(auVar209,ZEXT816(0) << 0x40);
                    auVar235 = vpcmpeqd_avx(auVar172,ZEXT816(0) << 0x40);
                    auVar221._16_16_ = auVar235;
                    auVar221._0_16_ = auVar169;
                    auVar188._0_4_ = auVar169._0_4_ ^ local_800._0_4_;
                    auVar188._4_4_ = auVar169._4_4_ ^ local_800._4_4_;
                    auVar188._8_4_ = auVar169._8_4_ ^ local_800._8_4_;
                    auVar188._12_4_ = auVar169._12_4_ ^ local_800._12_4_;
                    auVar188._16_4_ = auVar235._0_4_ ^ local_800._16_4_;
                    auVar188._20_4_ = auVar235._4_4_ ^ local_800._20_4_;
                    auVar188._24_4_ = auVar235._8_4_ ^ local_800._24_4_;
                    auVar188._28_4_ = auVar235._12_4_ ^ local_800._28_4_;
                    local_800 = local_800 & ~auVar221;
                    if ((((((((local_800 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                             || (local_800 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                             ) || (local_800 >> 0x5f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) || SUB321(local_800 >> 0x7f,0) != '\0') ||
                          (local_800 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(local_800 >> 0xbf,0) != '\0') ||
                        (local_800 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        local_800[0x1f] < '\0') {
                      auVar173 = vmaskmovps_avx(auVar188,*(undefined1 (*) [32])local_8b0.hit);
                      *(undefined1 (*) [32])(local_8b0.ray + 0x180) = auVar173;
                      auVar173 = vmaskmovps_avx(auVar188,*(undefined1 (*) [32])
                                                          (local_8b0.hit + 0x20));
                      *(undefined1 (*) [32])(local_8b0.ray + 0x1a0) = auVar173;
                      auVar173 = vmaskmovps_avx(auVar188,*(undefined1 (*) [32])
                                                          (local_8b0.hit + 0x40));
                      *(undefined1 (*) [32])(local_8b0.ray + 0x1c0) = auVar173;
                      auVar173 = vmaskmovps_avx(auVar188,*(undefined1 (*) [32])
                                                          (local_8b0.hit + 0x60));
                      *(undefined1 (*) [32])(local_8b0.ray + 0x1e0) = auVar173;
                      auVar173 = vmaskmovps_avx(auVar188,*(undefined1 (*) [32])
                                                          (local_8b0.hit + 0x80));
                      *(undefined1 (*) [32])(local_8b0.ray + 0x200) = auVar173;
                      auVar173 = vmaskmovps_avx(auVar188,*(undefined1 (*) [32])
                                                          (local_8b0.hit + 0xa0));
                      *(undefined1 (*) [32])(local_8b0.ray + 0x220) = auVar173;
                      auVar173 = vmaskmovps_avx(auVar188,*(undefined1 (*) [32])
                                                          (local_8b0.hit + 0xc0));
                      *(undefined1 (*) [32])(local_8b0.ray + 0x240) = auVar173;
                      auVar173 = vmaskmovps_avx(auVar188,*(undefined1 (*) [32])
                                                          (local_8b0.hit + 0xe0));
                      *(undefined1 (*) [32])(local_8b0.ray + 0x260) = auVar173;
                      auVar173 = vmaskmovps_avx(auVar188,*(undefined1 (*) [32])
                                                          (local_8b0.hit + 0x100));
                      *(undefined1 (*) [32])(local_8b0.ray + 0x280) = auVar173;
                    }
                  }
                  auVar180 = local_500;
                  auVar173 = auVar427._0_32_;
                  if ((((((((auVar188 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (auVar188 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (auVar188 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(auVar188 >> 0x7f,0) == '\0') &&
                        (auVar188 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(auVar188 >> 0xbf,0) == '\0') &&
                      (auVar188 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < auVar188[0x1f]) {
                    *(int *)(ray + k * 4 + 0x100) = auVar342._0_4_;
                  }
                  else {
                    auVar342 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                  }
                  *(undefined4 *)(local_6a0 + uVar159 * 4) = 0;
                  auVar169 = vshufps_avx(auVar342._0_16_,auVar342._0_16_,0);
                  auVar189._16_16_ = auVar169;
                  auVar189._0_16_ = auVar169;
                  auVar265 = ZEXT3264(auVar180);
                  auVar40 = vcmpps_avx(auVar180,auVar189,2);
                  auVar39 = vandps_avx(auVar40,local_6a0);
                  local_6a0 = local_6a0 & auVar40;
                  if ((((((((local_6a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                           (local_6a0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                          (local_6a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                         SUB321(local_6a0 >> 0x7f,0) == '\0') &&
                        (local_6a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                       SUB321(local_6a0 >> 0xbf,0) == '\0') &&
                      (local_6a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                      -1 < local_6a0[0x1f]) break;
                  auVar222._8_4_ = 0x7f800000;
                  auVar222._0_8_ = 0x7f8000007f800000;
                  auVar222._12_4_ = 0x7f800000;
                  auVar222._16_4_ = 0x7f800000;
                  auVar222._20_4_ = 0x7f800000;
                  auVar222._24_4_ = 0x7f800000;
                  auVar222._28_4_ = 0x7f800000;
                  auVar173 = vblendvps_avx(auVar222,auVar180,auVar39);
                  auVar180 = vshufps_avx(auVar173,auVar173,0xb1);
                  auVar180 = vminps_avx(auVar173,auVar180);
                  auVar40 = vshufpd_avx(auVar180,auVar180,5);
                  auVar180 = vminps_avx(auVar180,auVar40);
                  auVar40 = vperm2f128_avx(auVar180,auVar180,1);
                  auVar180 = vminps_avx(auVar180,auVar40);
                  auVar180 = vcmpps_avx(auVar173,auVar180,0);
                  auVar40 = auVar39 & auVar180;
                  auVar173 = auVar39;
                  if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar40 >> 0x7f,0) != '\0') ||
                        (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar40 >> 0xbf,0) != '\0') ||
                      (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar40[0x1f] < '\0') {
                    auVar173 = vandps_avx(auVar180,auVar39);
                  }
                  uVar157 = vmovmskps_avx(auVar173);
                  uVar158 = 0;
                  if (uVar157 != 0) {
                    for (; (uVar157 >> uVar158 & 1) == 0; uVar158 = uVar158 + 1) {
                    }
                  }
                  uVar159 = (ulong)uVar158;
                  local_6a0 = auVar39;
                }
              }
            }
          }
        }
      }
      local_620 = auVar173;
      if (8 < (int)uVar34) {
        _local_760 = auVar374._0_32_;
        auVar169 = vpshufd_avx(ZEXT416(uVar34),0);
        local_5e0 = auVar169._0_4_;
        fStack_5dc = auVar169._4_4_;
        fStack_5d8 = auVar169._8_4_;
        fStack_5d4 = auVar169._12_4_;
        auVar169 = vshufps_avx(local_840._0_16_,local_840._0_16_,0);
        local_4c0._16_16_ = auVar169;
        local_4c0._0_16_ = auVar169;
        auVar169 = vpermilps_avx(ZEXT416(uVar162),0);
        local_4e0._16_16_ = auVar169;
        local_4e0._0_16_ = auVar169;
        auVar170._0_4_ = 1.0 / (float)local_5a0._0_4_;
        auVar170._4_12_ = SUB6012((undefined1  [60])0x0,0);
        auVar169 = vshufps_avx(auVar170,auVar170,0);
        register0x00001210 = auVar169;
        _local_100 = auVar169;
        auVar169 = vshufps_avx(ZEXT416(uVar32),ZEXT416(uVar32),0);
        local_c0._16_16_ = auVar169;
        local_c0._0_16_ = auVar169;
        auVar169 = vshufps_avx(ZEXT416(uVar33),ZEXT416(uVar33),0);
        local_e0._16_16_ = auVar169;
        local_e0._0_16_ = auVar169;
        auVar190 = ZEXT3264(local_e0);
        lVar166 = 8;
        auVar427 = ZEXT3264(local_640);
        fVar251 = (float)local_6e0._0_4_;
        fVar270 = (float)local_6e0._4_4_;
        fVar272 = fStack_6d8;
        fVar274 = fStack_6d4;
        fVar275 = fStack_6d0;
        fVar283 = fStack_6cc;
        fVar284 = fStack_6c8;
        fVar285 = fStack_6c4;
        do {
          pauVar9 = (undefined1 (*) [28])(bezier_basis0 + lVar166 * 4 + lVar163);
          fVar286 = *(float *)*pauVar9;
          fVar287 = *(float *)(*pauVar9 + 4);
          fVar288 = *(float *)(*pauVar9 + 8);
          fVar290 = *(float *)(*pauVar9 + 0xc);
          fVar297 = *(float *)(*pauVar9 + 0x10);
          fVar299 = *(float *)(*pauVar9 + 0x14);
          fVar301 = *(float *)(*pauVar9 + 0x18);
          auVar153 = *pauVar9;
          pauVar9 = (undefined1 (*) [28])(lVar163 + 0x21aa768 + lVar166 * 4);
          fVar303 = *(float *)*pauVar9;
          fVar304 = *(float *)(*pauVar9 + 4);
          fVar306 = *(float *)(*pauVar9 + 8);
          fVar347 = *(float *)(*pauVar9 + 0xc);
          fVar271 = *(float *)(*pauVar9 + 0x10);
          fVar305 = *(float *)(*pauVar9 + 0x14);
          fVar348 = *(float *)(*pauVar9 + 0x18);
          auVar152 = *pauVar9;
          pfVar1 = (float *)(lVar163 + 0x21aabec + lVar166 * 4);
          local_6c0 = *pfVar1;
          fStack_6bc = pfVar1[1];
          fStack_6b8 = pfVar1[2];
          fStack_6b4 = pfVar1[3];
          fStack_6b0 = pfVar1[4];
          fStack_6ac = pfVar1[5];
          fStack_6a8 = pfVar1[6];
          fStack_6a4 = pfVar1[7];
          pfVar1 = (float *)(lVar163 + 0x21ab070 + lVar166 * 4);
          local_740 = *pfVar1;
          fStack_73c = pfVar1[1];
          fStack_738 = pfVar1[2];
          fStack_734 = pfVar1[3];
          fStack_730 = pfVar1[4];
          fStack_72c = pfVar1[5];
          fStack_728 = pfVar1[6];
          fStack_724 = pfVar1[7];
          fVar289 = auVar265._28_4_;
          fVar349 = auVar374._28_4_;
          fVar201 = fVar289 + fVar289 + auVar190._28_4_;
          fVar268 = auVar427._0_4_;
          fVar203 = auVar427._4_4_;
          fVar224 = auVar427._8_4_;
          fVar225 = auVar427._12_4_;
          fVar227 = auVar427._16_4_;
          fVar309 = auVar427._20_4_;
          fVar367 = auVar427._24_4_;
          local_840._0_4_ =
               (float)local_240._0_4_ * fVar286 +
               fVar381 * fVar303 +
               local_6c0 * (float)local_460._0_4_ + (float)local_580._0_4_ * local_740;
          local_840._4_4_ =
               (float)local_240._4_4_ * fVar287 +
               fVar411 * fVar304 +
               fStack_6bc * (float)local_460._4_4_ + (float)local_580._4_4_ * fStack_73c;
          local_840._8_4_ =
               fStack_238 * fVar288 +
               fVar418 * fVar306 + fStack_6b8 * fStack_458 + fStack_578 * fStack_738;
          local_840._12_4_ =
               fStack_234 * fVar290 +
               fVar421 * fVar347 + fStack_6b4 * fStack_454 + fStack_574 * fStack_734;
          local_840._16_4_ =
               fStack_230 * fVar297 +
               fVar250 * fVar271 + fStack_6b0 * fStack_450 + fStack_570 * fStack_730;
          local_840._20_4_ =
               fStack_22c * fVar299 +
               fVar267 * fVar305 + fStack_6ac * fStack_44c + fStack_56c * fStack_72c;
          local_840._24_4_ =
               fStack_228 * fVar301 +
               fVar269 * fVar348 + fStack_6a8 * fStack_448 + fStack_568 * fStack_728;
          local_840._28_4_ = fVar289 + fStack_724 + fVar201;
          auVar374 = ZEXT3264(local_840);
          auVar244._0_4_ =
               fVar251 * local_740 + fVar230 * local_6c0 + fVar268 * fVar303 +
               (float)local_260._0_4_ * fVar286;
          auVar244._4_4_ =
               fVar270 * fStack_73c + fVar247 * fStack_6bc + fVar203 * fVar304 +
               (float)local_260._4_4_ * fVar287;
          auVar244._8_4_ =
               fVar272 * fStack_738 + fVar248 * fStack_6b8 + fVar224 * fVar306 +
               fStack_258 * fVar288;
          auVar244._12_4_ =
               fVar274 * fStack_734 + fVar249 * fStack_6b4 + fVar225 * fVar347 +
               fStack_254 * fVar290;
          auVar244._16_4_ =
               fVar275 * fStack_730 + fVar230 * fStack_6b0 + fVar227 * fVar271 +
               fStack_250 * fVar297;
          auVar244._20_4_ =
               fVar283 * fStack_72c + fVar247 * fStack_6ac + fVar309 * fVar305 +
               fStack_24c * fVar299;
          auVar244._24_4_ =
               fVar284 * fStack_728 + fVar248 * fStack_6a8 + fVar367 * fVar348 +
               fStack_248 * fVar301;
          auVar244._28_4_ = fVar349 + fVar289 + fVar289 + fVar201;
          fVar167 = fVar286 * (float)local_2a0._0_4_ +
                    (float)local_a0._0_4_ * fVar303 +
                    local_6c0 * (float)local_400._0_4_ + local_740 * (float)local_280._0_4_;
          fVar191 = fVar287 * (float)local_2a0._4_4_ +
                    (float)local_a0._4_4_ * fVar304 +
                    fStack_6bc * (float)local_400._4_4_ + fStack_73c * (float)local_280._4_4_;
          fVar192 = fVar288 * fStack_298 +
                    fStack_98 * fVar306 + fStack_6b8 * fStack_3f8 + fStack_738 * fStack_278;
          fVar193 = fVar290 * fStack_294 +
                    fStack_94 * fVar347 + fStack_6b4 * fStack_3f4 + fStack_734 * fStack_274;
          fVar195 = fVar297 * fStack_290 +
                    fStack_90 * fVar271 + fStack_6b0 * fStack_3f0 + fStack_730 * fStack_270;
          fVar197 = fVar299 * fStack_28c +
                    fStack_8c * fVar305 + fStack_6ac * fStack_3ec + fStack_72c * fStack_26c;
          fVar199 = fVar301 * fStack_288 +
                    fStack_88 * fVar348 + fStack_6a8 * fStack_3e8 + fStack_728 * fStack_268;
          fVar201 = fVar201 + fVar289 + fVar289 + fStack_724;
          pfVar1 = (float *)(bezier_basis1 + lVar166 * 4 + lVar163);
          fVar286 = *pfVar1;
          fVar287 = pfVar1[1];
          fVar288 = pfVar1[2];
          fVar290 = pfVar1[3];
          fVar297 = pfVar1[4];
          fVar299 = pfVar1[5];
          fVar301 = pfVar1[6];
          pauVar9 = (undefined1 (*) [28])(lVar163 + 0x21acb88 + lVar166 * 4);
          fVar303 = *(float *)*pauVar9;
          fVar304 = *(float *)(*pauVar9 + 4);
          fVar306 = *(float *)(*pauVar9 + 8);
          fVar347 = *(float *)(*pauVar9 + 0xc);
          fVar271 = *(float *)(*pauVar9 + 0x10);
          fVar305 = *(float *)(*pauVar9 + 0x14);
          fVar348 = *(float *)(*pauVar9 + 0x18);
          auVar154 = *pauVar9;
          pfVar1 = (float *)(lVar163 + 0x21ad00c + lVar166 * 4);
          fVar349 = *pfVar1;
          fVar273 = pfVar1[1];
          fVar307 = pfVar1[2];
          fVar202 = pfVar1[3];
          fVar229 = pfVar1[4];
          fVar317 = pfVar1[5];
          fVar228 = pfVar1[6];
          pfVar1 = (float *)(lVar163 + 0x21ad490 + lVar166 * 4);
          local_480 = *pfVar1;
          fStack_47c = pfVar1[1];
          fStack_478 = pfVar1[2];
          fStack_474 = pfVar1[3];
          fStack_470 = pfVar1[4];
          fStack_46c = pfVar1[5];
          fStack_468 = pfVar1[6];
          fStack_464 = pfVar1[7];
          fVar289 = fStack_464 + fStack_464 + fVar289;
          auVar315._0_4_ =
               (float)local_240._0_4_ * fVar286 +
               fVar381 * fVar303 +
               (float)local_460._0_4_ * fVar349 + (float)local_580._0_4_ * local_480;
          auVar315._4_4_ =
               (float)local_240._4_4_ * fVar287 +
               fVar411 * fVar304 +
               (float)local_460._4_4_ * fVar273 + (float)local_580._4_4_ * fStack_47c;
          auVar315._8_4_ =
               fStack_238 * fVar288 +
               fVar418 * fVar306 + fStack_458 * fVar307 + fStack_578 * fStack_478;
          auVar315._12_4_ =
               fStack_234 * fVar290 +
               fVar421 * fVar347 + fStack_454 * fVar202 + fStack_574 * fStack_474;
          auVar315._16_4_ =
               fStack_230 * fVar297 +
               fVar250 * fVar271 + fStack_450 * fVar229 + fStack_570 * fStack_470;
          auVar315._20_4_ =
               fStack_22c * fVar299 +
               fVar267 * fVar305 + fStack_44c * fVar317 + fStack_56c * fStack_46c;
          auVar315._24_4_ =
               fStack_228 * fVar301 +
               fVar269 * fVar348 + fStack_448 * fVar228 + fStack_568 * fStack_468;
          auVar315._28_4_ = *(float *)pauVar9[1] + fVar289;
          local_800._0_4_ =
               (float)local_260._0_4_ * fVar286 +
               fVar268 * fVar303 + fVar230 * fVar349 + fVar251 * local_480;
          local_800._4_4_ =
               (float)local_260._4_4_ * fVar287 +
               fVar203 * fVar304 + fVar247 * fVar273 + fVar270 * fStack_47c;
          local_800._8_4_ =
               fStack_258 * fVar288 + fVar224 * fVar306 + fVar248 * fVar307 + fVar272 * fStack_478;
          local_800._12_4_ =
               fStack_254 * fVar290 + fVar225 * fVar347 + fVar249 * fVar202 + fVar274 * fStack_474;
          auVar295._16_4_ =
               fStack_250 * fVar297 + fVar227 * fVar271 + fVar230 * fVar229 + fVar275 * fStack_470;
          auVar295._0_16_ = local_800._0_16_;
          auVar295._20_4_ =
               fStack_24c * fVar299 + fVar309 * fVar305 + fVar247 * fVar317 + fVar283 * fStack_46c;
          auVar295._24_4_ =
               fStack_248 * fVar301 + fVar367 * fVar348 + fVar248 * fVar228 + fVar284 * fStack_468;
          auVar295._28_4_ = fVar289 + fStack_464 + fStack_464 + auVar427._28_4_;
          auVar326._0_4_ =
               fVar286 * (float)local_2a0._0_4_ +
               (float)local_a0._0_4_ * fVar303 +
               local_480 * (float)local_280._0_4_ + fVar349 * (float)local_400._0_4_;
          auVar326._4_4_ =
               fVar287 * (float)local_2a0._4_4_ +
               (float)local_a0._4_4_ * fVar304 +
               fStack_47c * (float)local_280._4_4_ + fVar273 * (float)local_400._4_4_;
          auVar326._8_4_ =
               fVar288 * fStack_298 +
               fStack_98 * fVar306 + fStack_478 * fStack_278 + fVar307 * fStack_3f8;
          auVar326._12_4_ =
               fVar290 * fStack_294 +
               fStack_94 * fVar347 + fStack_474 * fStack_274 + fVar202 * fStack_3f4;
          auVar326._16_4_ =
               fVar297 * fStack_290 +
               fStack_90 * fVar271 + fStack_470 * fStack_270 + fVar229 * fStack_3f0;
          auVar326._20_4_ =
               fVar299 * fStack_28c +
               fStack_8c * fVar305 + fStack_46c * fStack_26c + fVar317 * fStack_3ec;
          auVar326._24_4_ =
               fVar301 * fStack_288 +
               fStack_88 * fVar348 + fStack_468 * fStack_268 + fVar228 * fStack_3e8;
          auVar326._28_4_ = fVar289 + fStack_464 + fVar285 + fStack_464;
          auVar180 = vsubps_avx(auVar315,local_840);
          auVar39 = vsubps_avx(auVar295,auVar244);
          auVar190 = ZEXT3264(auVar39);
          fVar275 = auVar180._0_4_;
          fVar283 = auVar180._4_4_;
          auVar90._4_4_ = fVar283 * auVar244._4_4_;
          auVar90._0_4_ = fVar275 * auVar244._0_4_;
          fVar284 = auVar180._8_4_;
          auVar90._8_4_ = fVar284 * auVar244._8_4_;
          fVar285 = auVar180._12_4_;
          auVar90._12_4_ = fVar285 * auVar244._12_4_;
          fVar303 = auVar180._16_4_;
          auVar90._16_4_ = fVar303 * auVar244._16_4_;
          fVar304 = auVar180._20_4_;
          auVar90._20_4_ = fVar304 * auVar244._20_4_;
          fVar306 = auVar180._24_4_;
          auVar90._24_4_ = fVar306 * auVar244._24_4_;
          auVar90._28_4_ = fVar289;
          fVar250 = auVar39._0_4_;
          fVar267 = auVar39._4_4_;
          auVar91._4_4_ = local_840._4_4_ * fVar267;
          auVar91._0_4_ = local_840._0_4_ * fVar250;
          fVar269 = auVar39._8_4_;
          auVar91._8_4_ = local_840._8_4_ * fVar269;
          fVar251 = auVar39._12_4_;
          auVar91._12_4_ = local_840._12_4_ * fVar251;
          fVar270 = auVar39._16_4_;
          auVar91._16_4_ = local_840._16_4_ * fVar270;
          fVar272 = auVar39._20_4_;
          auVar91._20_4_ = local_840._20_4_ * fVar272;
          fVar274 = auVar39._24_4_;
          auVar91._24_4_ = local_840._24_4_ * fVar274;
          auVar91._28_4_ = auVar295._28_4_;
          auVar40 = vsubps_avx(auVar90,auVar91);
          auVar145._4_4_ = fVar191;
          auVar145._0_4_ = fVar167;
          auVar145._8_4_ = fVar192;
          auVar145._12_4_ = fVar193;
          auVar145._16_4_ = fVar195;
          auVar145._20_4_ = fVar197;
          auVar145._24_4_ = fVar199;
          auVar145._28_4_ = fVar201;
          auVar173 = vmaxps_avx(auVar145,auVar326);
          auVar92._4_4_ = auVar173._4_4_ * auVar173._4_4_ * (fVar283 * fVar283 + fVar267 * fVar267);
          auVar92._0_4_ = auVar173._0_4_ * auVar173._0_4_ * (fVar275 * fVar275 + fVar250 * fVar250);
          auVar92._8_4_ = auVar173._8_4_ * auVar173._8_4_ * (fVar284 * fVar284 + fVar269 * fVar269);
          auVar92._12_4_ =
               auVar173._12_4_ * auVar173._12_4_ * (fVar285 * fVar285 + fVar251 * fVar251);
          auVar92._16_4_ =
               auVar173._16_4_ * auVar173._16_4_ * (fVar303 * fVar303 + fVar270 * fVar270);
          auVar92._20_4_ =
               auVar173._20_4_ * auVar173._20_4_ * (fVar304 * fVar304 + fVar272 * fVar272);
          auVar92._24_4_ =
               auVar173._24_4_ * auVar173._24_4_ * (fVar306 * fVar306 + fVar274 * fVar274);
          auVar92._28_4_ = auVar315._28_4_ + auVar295._28_4_;
          auVar93._4_4_ = auVar40._4_4_ * auVar40._4_4_;
          auVar93._0_4_ = auVar40._0_4_ * auVar40._0_4_;
          auVar93._8_4_ = auVar40._8_4_ * auVar40._8_4_;
          auVar93._12_4_ = auVar40._12_4_ * auVar40._12_4_;
          auVar93._16_4_ = auVar40._16_4_ * auVar40._16_4_;
          auVar93._20_4_ = auVar40._20_4_ * auVar40._20_4_;
          auVar93._24_4_ = auVar40._24_4_ * auVar40._24_4_;
          auVar93._28_4_ = auVar40._28_4_;
          auVar173 = vcmpps_avx(auVar93,auVar92,2);
          local_380 = (uint)lVar166;
          auVar235 = vpshufd_avx(ZEXT416(local_380),0);
          auVar169 = vpor_avx(auVar235,_DAT_01f7fcf0);
          auVar235 = vpor_avx(auVar235,_DAT_01fafea0);
          auVar149._4_4_ = fStack_5dc;
          auVar149._0_4_ = local_5e0;
          auVar149._8_4_ = fStack_5d8;
          auVar149._12_4_ = fStack_5d4;
          auVar169 = vpcmpgtd_avx(auVar149,auVar169);
          auVar235 = vpcmpgtd_avx(auVar149,auVar235);
          register0x000012d0 = auVar235;
          _local_4a0 = auVar169;
          auVar265 = ZEXT3264(_local_4a0);
          auVar40 = _local_4a0 & auVar173;
          if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar40 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar40 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar40 >> 0x7f,0) == '\0') &&
                (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar40 >> 0xbf,0) == '\0') &&
              (auVar40 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar40[0x1f]) {
            auVar427 = ZEXT3264(auVar427._0_32_);
            fVar251 = (float)local_6e0._0_4_;
            fVar270 = (float)local_6e0._4_4_;
            fVar272 = fStack_6d8;
            fVar274 = fStack_6d4;
            fVar275 = fStack_6d0;
            fVar283 = fStack_6cc;
            fVar284 = fStack_6c8;
            fVar285 = fStack_6c4;
          }
          else {
            local_700._0_4_ = auVar154._0_4_;
            local_700._4_4_ = auVar154._4_4_;
            fStack_6f8 = auVar154._8_4_;
            fStack_6f4 = auVar154._12_4_;
            fStack_6f0 = auVar154._16_4_;
            fStack_6ec = auVar154._20_4_;
            fStack_6e8 = auVar154._24_4_;
            local_5c0 = fVar286 * (float)local_760._0_4_ +
                        (float)local_440._0_4_ * (float)local_700._0_4_ +
                        (float)local_420._0_4_ * fVar349 + (float)local_860._0_4_ * local_480;
            fStack_5bc = fVar287 * (float)local_760._4_4_ +
                         (float)local_440._4_4_ * (float)local_700._4_4_ +
                         (float)local_420._4_4_ * fVar273 + (float)local_860._4_4_ * fStack_47c;
            fStack_5b8 = fVar288 * fStack_758 +
                         fStack_438 * fStack_6f8 + fStack_418 * fVar307 + fStack_858 * fStack_478;
            fStack_5b4 = fVar290 * fStack_754 +
                         fStack_434 * fStack_6f4 + fStack_414 * fVar202 + fStack_854 * fStack_474;
            fStack_5b0 = fVar297 * fStack_750 +
                         fStack_430 * fStack_6f0 + fStack_410 * fVar229 + fStack_850 * fStack_470;
            fStack_5ac = fVar299 * fStack_74c +
                         fStack_42c * fStack_6ec + fStack_40c * fVar317 + fStack_84c * fStack_46c;
            fStack_5a8 = fVar301 * fStack_748 +
                         fStack_428 * fStack_6e8 + fStack_408 * fVar228 + fStack_848 * fStack_468;
            fStack_5a4 = fVar249 + auVar39._28_4_ + auVar173._28_4_ + 0.0;
            local_720._0_4_ = auVar152._0_4_;
            local_720._4_4_ = auVar152._4_4_;
            fStack_718 = auVar152._8_4_;
            fStack_714 = auVar152._12_4_;
            fStack_710 = auVar152._16_4_;
            fStack_70c = auVar152._20_4_;
            fStack_708 = auVar152._24_4_;
            pfVar1 = (float *)(lVar163 + 0x21abdfc + lVar166 * 4);
            fVar250 = *pfVar1;
            fVar267 = pfVar1[1];
            fVar269 = pfVar1[2];
            fVar251 = pfVar1[3];
            fVar270 = pfVar1[4];
            fVar272 = pfVar1[5];
            fVar274 = pfVar1[6];
            pfVar2 = (float *)(lVar163 + 0x21ac280 + lVar166 * 4);
            fVar275 = *pfVar2;
            fVar283 = pfVar2[1];
            fVar284 = pfVar2[2];
            fVar285 = pfVar2[3];
            fVar286 = pfVar2[4];
            fVar287 = pfVar2[5];
            fVar288 = pfVar2[6];
            pfVar3 = (float *)(lVar163 + 0x21ab978 + lVar166 * 4);
            fVar290 = *pfVar3;
            fVar297 = pfVar3[1];
            fVar299 = pfVar3[2];
            fVar301 = pfVar3[3];
            fVar303 = pfVar3[4];
            fVar304 = pfVar3[5];
            fVar306 = pfVar3[6];
            fVar202 = pfVar1[7] + pfVar2[7];
            fVar229 = pfVar2[7] + fStack_224 + 0.0;
            fVar317 = fStack_224 + fStack_244 + fStack_224 + 0.0;
            pfVar1 = (float *)(lVar163 + 0x21ab4f4 + lVar166 * 4);
            fVar347 = *pfVar1;
            fVar271 = pfVar1[1];
            fVar305 = pfVar1[2];
            fVar348 = pfVar1[3];
            fVar349 = pfVar1[4];
            fVar273 = pfVar1[5];
            fVar307 = pfVar1[6];
            auVar182._0_4_ =
                 (float)local_240._0_4_ * fVar347 +
                 fVar290 * (float)local_780._0_4_ +
                 (float)local_460._0_4_ * fVar250 + (float)local_580._0_4_ * fVar275;
            auVar182._4_4_ =
                 (float)local_240._4_4_ * fVar271 +
                 fVar297 * (float)local_780._4_4_ +
                 (float)local_460._4_4_ * fVar267 + (float)local_580._4_4_ * fVar283;
            auVar182._8_4_ =
                 fStack_238 * fVar305 +
                 fVar299 * fStack_778 + fStack_458 * fVar269 + fStack_578 * fVar284;
            auVar182._12_4_ =
                 fStack_234 * fVar348 +
                 fVar301 * fStack_774 + fStack_454 * fVar251 + fStack_574 * fVar285;
            auVar182._16_4_ =
                 fStack_230 * fVar349 +
                 fVar303 * fStack_770 + fStack_450 * fVar270 + fStack_570 * fVar286;
            auVar182._20_4_ =
                 fStack_22c * fVar273 +
                 fVar304 * fStack_76c + fStack_44c * fVar272 + fStack_56c * fVar287;
            auVar182._24_4_ =
                 fStack_228 * fVar307 +
                 fVar306 * fStack_768 + fStack_448 * fVar274 + fStack_568 * fVar288;
            auVar182._28_4_ = fVar202 + fVar229;
            auVar216._0_4_ =
                 fVar347 * (float)local_260._0_4_ +
                 fVar230 * fVar250 + (float)local_6e0._0_4_ * fVar275 + fVar268 * fVar290;
            auVar216._4_4_ =
                 fVar271 * (float)local_260._4_4_ +
                 fVar247 * fVar267 + (float)local_6e0._4_4_ * fVar283 + fVar203 * fVar297;
            auVar216._8_4_ =
                 fVar305 * fStack_258 + fVar248 * fVar269 + fStack_6d8 * fVar284 + fVar224 * fVar299
            ;
            auVar216._12_4_ =
                 fVar348 * fStack_254 + fVar249 * fVar251 + fStack_6d4 * fVar285 + fVar225 * fVar301
            ;
            auVar216._16_4_ =
                 fVar349 * fStack_250 + fVar230 * fVar270 + fStack_6d0 * fVar286 + fVar227 * fVar303
            ;
            auVar216._20_4_ =
                 fVar273 * fStack_24c + fVar247 * fVar272 + fStack_6cc * fVar287 + fVar309 * fVar304
            ;
            auVar216._24_4_ =
                 fVar307 * fStack_248 + fVar248 * fVar274 + fStack_6c8 * fVar288 + fVar367 * fVar306
            ;
            auVar216._28_4_ = fVar229 + fVar317;
            auVar401._0_4_ =
                 fVar290 * (float)local_440._0_4_ +
                 (float)local_420._0_4_ * fVar250 + (float)local_860._0_4_ * fVar275 +
                 fVar347 * (float)local_760._0_4_;
            auVar401._4_4_ =
                 fVar297 * (float)local_440._4_4_ +
                 (float)local_420._4_4_ * fVar267 + (float)local_860._4_4_ * fVar283 +
                 fVar271 * (float)local_760._4_4_;
            auVar401._8_4_ =
                 fVar299 * fStack_438 + fStack_418 * fVar269 + fStack_858 * fVar284 +
                 fVar305 * fStack_758;
            auVar401._12_4_ =
                 fVar301 * fStack_434 + fStack_414 * fVar251 + fStack_854 * fVar285 +
                 fVar348 * fStack_754;
            auVar401._16_4_ =
                 fVar303 * fStack_430 + fStack_410 * fVar270 + fStack_850 * fVar286 +
                 fVar349 * fStack_750;
            auVar401._20_4_ =
                 fVar304 * fStack_42c + fStack_40c * fVar272 + fStack_84c * fVar287 +
                 fVar273 * fStack_74c;
            auVar401._24_4_ =
                 fVar306 * fStack_428 + fStack_408 * fVar274 + fStack_848 * fVar288 +
                 fVar307 * fStack_748;
            auVar401._28_4_ = pfVar3[7] + fVar202 + fVar317;
            pfVar1 = (float *)(lVar163 + 0x21ae21c + lVar166 * 4);
            fVar250 = *pfVar1;
            fVar267 = pfVar1[1];
            fVar269 = pfVar1[2];
            fVar251 = pfVar1[3];
            fVar270 = pfVar1[4];
            fVar272 = pfVar1[5];
            fVar274 = pfVar1[6];
            pfVar2 = (float *)(lVar163 + 0x21ae6a0 + lVar166 * 4);
            fVar275 = *pfVar2;
            fVar283 = pfVar2[1];
            fVar284 = pfVar2[2];
            fVar285 = pfVar2[3];
            fVar286 = pfVar2[4];
            fVar287 = pfVar2[5];
            fVar288 = pfVar2[6];
            pfVar3 = (float *)(lVar163 + 0x21add98 + lVar166 * 4);
            fVar290 = *pfVar3;
            fVar297 = pfVar3[1];
            fVar299 = pfVar3[2];
            fVar301 = pfVar3[3];
            fVar303 = pfVar3[4];
            fVar304 = pfVar3[5];
            fVar306 = pfVar3[6];
            pfVar4 = (float *)(lVar163 + 0x21ad914 + lVar166 * 4);
            fVar347 = *pfVar4;
            fVar271 = pfVar4[1];
            fVar305 = pfVar4[2];
            fVar348 = pfVar4[3];
            fVar349 = pfVar4[4];
            fVar273 = pfVar4[5];
            fVar307 = pfVar4[6];
            auVar357._0_4_ =
                 fVar347 * (float)local_240._0_4_ +
                 fVar290 * (float)local_780._0_4_ +
                 (float)local_460._0_4_ * fVar250 + (float)local_580._0_4_ * fVar275;
            auVar357._4_4_ =
                 fVar271 * (float)local_240._4_4_ +
                 fVar297 * (float)local_780._4_4_ +
                 (float)local_460._4_4_ * fVar267 + (float)local_580._4_4_ * fVar283;
            auVar357._8_4_ =
                 fVar305 * fStack_238 +
                 fVar299 * fStack_778 + fStack_458 * fVar269 + fStack_578 * fVar284;
            auVar357._12_4_ =
                 fVar348 * fStack_234 +
                 fVar301 * fStack_774 + fStack_454 * fVar251 + fStack_574 * fVar285;
            auVar357._16_4_ =
                 fVar349 * fStack_230 +
                 fVar303 * fStack_770 + fStack_450 * fVar270 + fStack_570 * fVar286;
            auVar357._20_4_ =
                 fVar273 * fStack_22c +
                 fVar304 * fStack_76c + fStack_44c * fVar272 + fStack_56c * fVar287;
            auVar357._24_4_ =
                 fVar307 * fStack_228 +
                 fVar306 * fStack_768 + fStack_448 * fVar274 + fStack_568 * fVar288;
            auVar357._28_4_ = fStack_224 + fStack_224 + fStack_564 + fStack_224;
            auVar396._0_4_ =
                 fVar347 * (float)local_260._0_4_ +
                 fVar268 * fVar290 + fVar250 * fVar230 + (float)local_6e0._0_4_ * fVar275;
            auVar396._4_4_ =
                 fVar271 * (float)local_260._4_4_ +
                 fVar203 * fVar297 + fVar267 * fVar247 + (float)local_6e0._4_4_ * fVar283;
            auVar396._8_4_ =
                 fVar305 * fStack_258 + fVar224 * fVar299 + fVar269 * fVar248 + fStack_6d8 * fVar284
            ;
            auVar396._12_4_ =
                 fVar348 * fStack_254 + fVar225 * fVar301 + fVar251 * fVar249 + fStack_6d4 * fVar285
            ;
            auVar396._16_4_ =
                 fVar349 * fStack_250 + fVar227 * fVar303 + fVar270 * fVar230 + fStack_6d0 * fVar286
            ;
            auVar396._20_4_ =
                 fVar273 * fStack_24c + fVar309 * fVar304 + fVar272 * fVar247 + fStack_6cc * fVar287
            ;
            auVar396._24_4_ =
                 fVar307 * fStack_248 + fVar367 * fVar306 + fVar274 * fVar248 + fStack_6c8 * fVar288
            ;
            auVar396._28_4_ = fStack_224 + fStack_224 + fStack_6c4 + fStack_224;
            auVar296._8_4_ = 0x7fffffff;
            auVar296._0_8_ = 0x7fffffff7fffffff;
            auVar296._12_4_ = 0x7fffffff;
            auVar296._16_4_ = 0x7fffffff;
            auVar296._20_4_ = 0x7fffffff;
            auVar296._24_4_ = 0x7fffffff;
            auVar296._28_4_ = 0x7fffffff;
            auVar40 = vandps_avx(auVar182,auVar296);
            auVar41 = vandps_avx(auVar216,auVar296);
            auVar41 = vmaxps_avx(auVar40,auVar41);
            auVar40 = vandps_avx(auVar401,auVar296);
            auVar41 = vmaxps_avx(auVar41,auVar40);
            auVar41 = vcmpps_avx(auVar41,local_4c0,1);
            auVar42 = vblendvps_avx(auVar182,auVar180,auVar41);
            auVar183._0_4_ =
                 fVar347 * (float)local_760._0_4_ +
                 fVar290 * (float)local_440._0_4_ +
                 fVar275 * (float)local_860._0_4_ + (float)local_420._0_4_ * fVar250;
            auVar183._4_4_ =
                 fVar271 * (float)local_760._4_4_ +
                 fVar297 * (float)local_440._4_4_ +
                 fVar283 * (float)local_860._4_4_ + (float)local_420._4_4_ * fVar267;
            auVar183._8_4_ =
                 fVar305 * fStack_758 +
                 fVar299 * fStack_438 + fVar284 * fStack_858 + fStack_418 * fVar269;
            auVar183._12_4_ =
                 fVar348 * fStack_754 +
                 fVar301 * fStack_434 + fVar285 * fStack_854 + fStack_414 * fVar251;
            auVar183._16_4_ =
                 fVar349 * fStack_750 +
                 fVar303 * fStack_430 + fVar286 * fStack_850 + fStack_410 * fVar270;
            auVar183._20_4_ =
                 fVar273 * fStack_74c +
                 fVar304 * fStack_42c + fVar287 * fStack_84c + fStack_40c * fVar272;
            auVar183._24_4_ =
                 fVar307 * fStack_748 +
                 fVar306 * fStack_428 + fVar288 * fStack_848 + fStack_408 * fVar274;
            auVar183._28_4_ = auVar40._28_4_ + pfVar3[7] + pfVar2[7] + pfVar1[7];
            auVar43 = vblendvps_avx(auVar216,auVar39,auVar41);
            auVar40 = vandps_avx(auVar357,auVar296);
            auVar41 = vandps_avx(auVar396,auVar296);
            auVar44 = vmaxps_avx(auVar40,auVar41);
            auVar40 = vandps_avx(auVar183,auVar296);
            auVar40 = vmaxps_avx(auVar44,auVar40);
            local_820._0_4_ = auVar153._0_4_;
            local_820._4_4_ = auVar153._4_4_;
            uStack_818._0_4_ = auVar153._8_4_;
            uStack_818._4_4_ = auVar153._12_4_;
            uStack_810._0_4_ = auVar153._16_4_;
            uStack_810._4_4_ = auVar153._20_4_;
            uStack_808._0_4_ = auVar153._24_4_;
            auVar41 = vcmpps_avx(auVar40,local_4c0,1);
            auVar40 = vblendvps_avx(auVar357,auVar180,auVar41);
            auVar184._0_4_ =
                 (float)local_760._0_4_ * (float)local_820._0_4_ +
                 (float)local_440._0_4_ * (float)local_720._0_4_ +
                 (float)local_420._0_4_ * local_6c0 + (float)local_860._0_4_ * local_740;
            auVar184._4_4_ =
                 (float)local_760._4_4_ * (float)local_820._4_4_ +
                 (float)local_440._4_4_ * (float)local_720._4_4_ +
                 (float)local_420._4_4_ * fStack_6bc + (float)local_860._4_4_ * fStack_73c;
            auVar184._8_4_ =
                 fStack_758 * (float)uStack_818 +
                 fStack_438 * fStack_718 + fStack_418 * fStack_6b8 + fStack_858 * fStack_738;
            auVar184._12_4_ =
                 fStack_754 * uStack_818._4_4_ +
                 fStack_434 * fStack_714 + fStack_414 * fStack_6b4 + fStack_854 * fStack_734;
            auVar184._16_4_ =
                 fStack_750 * (float)uStack_810 +
                 fStack_430 * fStack_710 + fStack_410 * fStack_6b0 + fStack_850 * fStack_730;
            auVar184._20_4_ =
                 fStack_74c * uStack_810._4_4_ +
                 fStack_42c * fStack_70c + fStack_40c * fStack_6ac + fStack_84c * fStack_72c;
            auVar184._24_4_ =
                 fStack_748 * (float)uStack_808 +
                 fStack_428 * fStack_708 + fStack_408 * fStack_6a8 + fStack_848 * fStack_728;
            auVar184._28_4_ = auVar44._28_4_ + fStack_5a4 + auVar173._28_4_ + 0.0;
            auVar41 = vblendvps_avx(auVar396,auVar39,auVar41);
            fVar411 = auVar42._0_4_;
            fVar418 = auVar42._4_4_;
            fVar421 = auVar42._8_4_;
            fVar203 = auVar42._12_4_;
            fVar224 = auVar42._16_4_;
            fVar225 = auVar42._20_4_;
            fVar227 = auVar42._24_4_;
            fVar309 = auVar42._28_4_;
            fVar290 = auVar40._0_4_;
            fVar299 = auVar40._4_4_;
            fVar303 = auVar40._8_4_;
            fVar306 = auVar40._12_4_;
            fVar271 = auVar40._16_4_;
            fVar348 = auVar40._20_4_;
            fVar273 = auVar40._24_4_;
            fVar250 = auVar43._0_4_;
            fVar269 = auVar43._4_4_;
            fVar270 = auVar43._8_4_;
            fVar274 = auVar43._12_4_;
            fVar283 = auVar43._16_4_;
            fVar285 = auVar43._20_4_;
            fVar287 = auVar43._24_4_;
            auVar373._0_4_ = fVar250 * fVar250 + fVar411 * fVar411;
            auVar373._4_4_ = fVar269 * fVar269 + fVar418 * fVar418;
            auVar373._8_4_ = fVar270 * fVar270 + fVar421 * fVar421;
            auVar373._12_4_ = fVar274 * fVar274 + fVar203 * fVar203;
            auVar373._16_4_ = fVar283 * fVar283 + fVar224 * fVar224;
            auVar373._20_4_ = fVar285 * fVar285 + fVar225 * fVar225;
            auVar373._24_4_ = fVar287 * fVar287 + fVar227 * fVar227;
            auVar373._28_4_ = auVar180._28_4_ + fStack_444;
            auVar180 = vrsqrtps_avx(auVar373);
            fVar267 = auVar180._0_4_;
            fVar251 = auVar180._4_4_;
            auVar94._4_4_ = fVar251 * 1.5;
            auVar94._0_4_ = fVar267 * 1.5;
            fVar272 = auVar180._8_4_;
            auVar94._8_4_ = fVar272 * 1.5;
            fVar275 = auVar180._12_4_;
            auVar94._12_4_ = fVar275 * 1.5;
            fVar284 = auVar180._16_4_;
            auVar94._16_4_ = fVar284 * 1.5;
            fVar286 = auVar180._20_4_;
            auVar94._20_4_ = fVar286 * 1.5;
            fVar288 = auVar180._24_4_;
            auVar94._24_4_ = fVar288 * 1.5;
            auVar94._28_4_ = auVar396._28_4_;
            auVar95._4_4_ = fVar251 * fVar251 * fVar251 * auVar373._4_4_ * 0.5;
            auVar95._0_4_ = fVar267 * fVar267 * fVar267 * auVar373._0_4_ * 0.5;
            auVar95._8_4_ = fVar272 * fVar272 * fVar272 * auVar373._8_4_ * 0.5;
            auVar95._12_4_ = fVar275 * fVar275 * fVar275 * auVar373._12_4_ * 0.5;
            auVar95._16_4_ = fVar284 * fVar284 * fVar284 * auVar373._16_4_ * 0.5;
            auVar95._20_4_ = fVar286 * fVar286 * fVar286 * auVar373._20_4_ * 0.5;
            auVar95._24_4_ = fVar288 * fVar288 * fVar288 * auVar373._24_4_ * 0.5;
            auVar95._28_4_ = auVar373._28_4_;
            auVar42 = vsubps_avx(auVar94,auVar95);
            fVar202 = auVar42._0_4_;
            fVar229 = auVar42._4_4_;
            fVar317 = auVar42._8_4_;
            fVar228 = auVar42._12_4_;
            fVar289 = auVar42._16_4_;
            fVar268 = auVar42._20_4_;
            fVar381 = auVar42._24_4_;
            fVar267 = auVar41._0_4_;
            fVar251 = auVar41._4_4_;
            fVar272 = auVar41._8_4_;
            fVar275 = auVar41._12_4_;
            fVar284 = auVar41._16_4_;
            fVar286 = auVar41._20_4_;
            fVar288 = auVar41._24_4_;
            auVar340._0_4_ = fVar267 * fVar267 + fVar290 * fVar290;
            auVar340._4_4_ = fVar251 * fVar251 + fVar299 * fVar299;
            auVar340._8_4_ = fVar272 * fVar272 + fVar303 * fVar303;
            auVar340._12_4_ = fVar275 * fVar275 + fVar306 * fVar306;
            auVar340._16_4_ = fVar284 * fVar284 + fVar271 * fVar271;
            auVar340._20_4_ = fVar286 * fVar286 + fVar348 * fVar348;
            auVar340._24_4_ = fVar288 * fVar288 + fVar273 * fVar273;
            auVar340._28_4_ = auVar180._28_4_ + auVar40._28_4_;
            auVar180 = vrsqrtps_avx(auVar340);
            fVar297 = auVar180._0_4_;
            fVar301 = auVar180._4_4_;
            auVar96._4_4_ = fVar301 * 1.5;
            auVar96._0_4_ = fVar297 * 1.5;
            fVar304 = auVar180._8_4_;
            auVar96._8_4_ = fVar304 * 1.5;
            fVar347 = auVar180._12_4_;
            auVar96._12_4_ = fVar347 * 1.5;
            fVar305 = auVar180._16_4_;
            auVar96._16_4_ = fVar305 * 1.5;
            fVar349 = auVar180._20_4_;
            auVar96._20_4_ = fVar349 * 1.5;
            fVar307 = auVar180._24_4_;
            auVar96._24_4_ = fVar307 * 1.5;
            auVar96._28_4_ = auVar396._28_4_;
            auVar97._4_4_ = fVar301 * fVar301 * fVar301 * auVar340._4_4_ * 0.5;
            auVar97._0_4_ = fVar297 * fVar297 * fVar297 * auVar340._0_4_ * 0.5;
            auVar97._8_4_ = fVar304 * fVar304 * fVar304 * auVar340._8_4_ * 0.5;
            auVar97._12_4_ = fVar347 * fVar347 * fVar347 * auVar340._12_4_ * 0.5;
            auVar97._16_4_ = fVar305 * fVar305 * fVar305 * auVar340._16_4_ * 0.5;
            auVar97._20_4_ = fVar349 * fVar349 * fVar349 * auVar340._20_4_ * 0.5;
            auVar97._24_4_ = fVar307 * fVar307 * fVar307 * auVar340._24_4_ * 0.5;
            auVar97._28_4_ = auVar340._28_4_;
            auVar40 = vsubps_avx(auVar96,auVar97);
            fVar297 = auVar40._0_4_;
            fVar301 = auVar40._4_4_;
            fVar304 = auVar40._8_4_;
            fVar347 = auVar40._12_4_;
            fVar305 = auVar40._16_4_;
            fVar349 = auVar40._20_4_;
            fVar307 = auVar40._24_4_;
            fVar250 = fVar167 * fVar202 * fVar250;
            fVar269 = fVar191 * fVar229 * fVar269;
            auVar98._4_4_ = fVar269;
            auVar98._0_4_ = fVar250;
            fVar270 = fVar192 * fVar317 * fVar270;
            auVar98._8_4_ = fVar270;
            fVar274 = fVar193 * fVar228 * fVar274;
            auVar98._12_4_ = fVar274;
            fVar283 = fVar195 * fVar289 * fVar283;
            auVar98._16_4_ = fVar283;
            fVar285 = fVar197 * fVar268 * fVar285;
            auVar98._20_4_ = fVar285;
            fVar287 = fVar199 * fVar381 * fVar287;
            auVar98._24_4_ = fVar287;
            auVar98._28_4_ = auVar180._28_4_;
            local_820._4_4_ = fVar269 + local_840._4_4_;
            local_820._0_4_ = fVar250 + local_840._0_4_;
            uStack_818._0_4_ = fVar270 + local_840._8_4_;
            uStack_818._4_4_ = fVar274 + local_840._12_4_;
            uStack_810._0_4_ = fVar283 + local_840._16_4_;
            uStack_810._4_4_ = fVar285 + local_840._20_4_;
            uStack_808._0_4_ = fVar287 + local_840._24_4_;
            uStack_808._4_4_ = auVar180._28_4_ + local_840._28_4_;
            fVar250 = fVar167 * fVar202 * -fVar411;
            fVar269 = fVar191 * fVar229 * -fVar418;
            auVar99._4_4_ = fVar269;
            auVar99._0_4_ = fVar250;
            fVar270 = fVar192 * fVar317 * -fVar421;
            auVar99._8_4_ = fVar270;
            fVar274 = fVar193 * fVar228 * -fVar203;
            auVar99._12_4_ = fVar274;
            fVar283 = fVar195 * fVar289 * -fVar224;
            auVar99._16_4_ = fVar283;
            fVar285 = fVar197 * fVar268 * -fVar225;
            auVar99._20_4_ = fVar285;
            fVar287 = fVar199 * fVar381 * -fVar227;
            auVar99._24_4_ = fVar287;
            auVar99._28_4_ = -fVar309;
            local_720._4_4_ = auVar244._4_4_ + fVar269;
            local_720._0_4_ = auVar244._0_4_ + fVar250;
            fStack_718 = auVar244._8_4_ + fVar270;
            fStack_714 = auVar244._12_4_ + fVar274;
            fStack_710 = auVar244._16_4_ + fVar283;
            fStack_70c = auVar244._20_4_ + fVar285;
            fStack_708 = auVar244._24_4_ + fVar287;
            fStack_704 = auVar244._28_4_ + -fVar309;
            fVar250 = fVar202 * 0.0 * fVar167;
            fVar269 = fVar229 * 0.0 * fVar191;
            auVar100._4_4_ = fVar269;
            auVar100._0_4_ = fVar250;
            fVar270 = fVar317 * 0.0 * fVar192;
            auVar100._8_4_ = fVar270;
            fVar274 = fVar228 * 0.0 * fVar193;
            auVar100._12_4_ = fVar274;
            fVar283 = fVar289 * 0.0 * fVar195;
            auVar100._16_4_ = fVar283;
            fVar285 = fVar268 * 0.0 * fVar197;
            auVar100._20_4_ = fVar285;
            fVar287 = fVar381 * 0.0 * fVar199;
            auVar100._24_4_ = fVar287;
            auVar100._28_4_ = fVar309;
            auVar180 = vsubps_avx(local_840,auVar98);
            auVar426._0_4_ = fVar250 + auVar184._0_4_;
            auVar426._4_4_ = fVar269 + auVar184._4_4_;
            auVar426._8_4_ = fVar270 + auVar184._8_4_;
            auVar426._12_4_ = fVar274 + auVar184._12_4_;
            auVar426._16_4_ = fVar283 + auVar184._16_4_;
            auVar426._20_4_ = fVar285 + auVar184._20_4_;
            auVar426._24_4_ = fVar287 + auVar184._24_4_;
            auVar426._28_4_ = fVar309 + auVar184._28_4_;
            fVar250 = auVar326._0_4_ * fVar297 * fVar267;
            fVar267 = auVar326._4_4_ * fVar301 * fVar251;
            auVar101._4_4_ = fVar267;
            auVar101._0_4_ = fVar250;
            fVar269 = auVar326._8_4_ * fVar304 * fVar272;
            auVar101._8_4_ = fVar269;
            fVar251 = auVar326._12_4_ * fVar347 * fVar275;
            auVar101._12_4_ = fVar251;
            fVar270 = auVar326._16_4_ * fVar305 * fVar284;
            auVar101._16_4_ = fVar270;
            fVar272 = auVar326._20_4_ * fVar349 * fVar286;
            auVar101._20_4_ = fVar272;
            fVar274 = auVar326._24_4_ * fVar307 * fVar288;
            auVar101._24_4_ = fVar274;
            auVar101._28_4_ = fVar201;
            auVar210 = vsubps_avx(auVar244,auVar99);
            auVar402._0_4_ = auVar315._0_4_ + fVar250;
            auVar402._4_4_ = auVar315._4_4_ + fVar267;
            auVar402._8_4_ = auVar315._8_4_ + fVar269;
            auVar402._12_4_ = auVar315._12_4_ + fVar251;
            auVar402._16_4_ = auVar315._16_4_ + fVar270;
            auVar402._20_4_ = auVar315._20_4_ + fVar272;
            auVar402._24_4_ = auVar315._24_4_ + fVar274;
            auVar402._28_4_ = auVar315._28_4_ + fVar201;
            fVar250 = fVar297 * -fVar290 * auVar326._0_4_;
            fVar267 = fVar301 * -fVar299 * auVar326._4_4_;
            auVar102._4_4_ = fVar267;
            auVar102._0_4_ = fVar250;
            fVar269 = fVar304 * -fVar303 * auVar326._8_4_;
            auVar102._8_4_ = fVar269;
            fVar251 = fVar347 * -fVar306 * auVar326._12_4_;
            auVar102._12_4_ = fVar251;
            fVar270 = fVar305 * -fVar271 * auVar326._16_4_;
            auVar102._16_4_ = fVar270;
            fVar272 = fVar349 * -fVar348 * auVar326._20_4_;
            auVar102._20_4_ = fVar272;
            fVar274 = fVar307 * -fVar273 * auVar326._24_4_;
            auVar102._24_4_ = fVar274;
            auVar102._28_4_ = local_840._28_4_;
            auVar211 = vsubps_avx(auVar184,auVar100);
            auVar282._0_4_ = local_800._0_4_ + fVar250;
            auVar282._4_4_ = local_800._4_4_ + fVar267;
            auVar282._8_4_ = local_800._8_4_ + fVar269;
            auVar282._12_4_ = local_800._12_4_ + fVar251;
            auVar282._16_4_ = auVar295._16_4_ + fVar270;
            auVar282._20_4_ = auVar295._20_4_ + fVar272;
            auVar282._24_4_ = auVar295._24_4_ + fVar274;
            auVar282._28_4_ = auVar295._28_4_ + local_840._28_4_;
            fVar250 = fVar297 * 0.0 * auVar326._0_4_;
            fVar267 = fVar301 * 0.0 * auVar326._4_4_;
            auVar103._4_4_ = fVar267;
            auVar103._0_4_ = fVar250;
            fVar269 = fVar304 * 0.0 * auVar326._8_4_;
            auVar103._8_4_ = fVar269;
            fVar251 = fVar347 * 0.0 * auVar326._12_4_;
            auVar103._12_4_ = fVar251;
            fVar270 = fVar305 * 0.0 * auVar326._16_4_;
            auVar103._16_4_ = fVar270;
            fVar272 = fVar349 * 0.0 * auVar326._20_4_;
            auVar103._20_4_ = fVar272;
            fVar274 = fVar307 * 0.0 * auVar326._24_4_;
            auVar103._24_4_ = fVar274;
            auVar103._28_4_ = auVar184._28_4_;
            auVar41 = vsubps_avx(auVar315,auVar101);
            auVar151._4_4_ = fStack_5bc;
            auVar151._0_4_ = local_5c0;
            auVar151._8_4_ = fStack_5b8;
            auVar151._12_4_ = fStack_5b4;
            auVar151._16_4_ = fStack_5b0;
            auVar151._20_4_ = fStack_5ac;
            auVar151._24_4_ = fStack_5a8;
            auVar151._28_4_ = fStack_5a4;
            auVar358._0_4_ = local_5c0 + fVar250;
            auVar358._4_4_ = fStack_5bc + fVar267;
            auVar358._8_4_ = fStack_5b8 + fVar269;
            auVar358._12_4_ = fStack_5b4 + fVar251;
            auVar358._16_4_ = fStack_5b0 + fVar270;
            auVar358._20_4_ = fStack_5ac + fVar272;
            auVar358._24_4_ = fStack_5a8 + fVar274;
            auVar358._28_4_ = fStack_5a4 + auVar184._28_4_;
            auVar42 = vsubps_avx(auVar295,auVar102);
            auVar43 = vsubps_avx(auVar151,auVar103);
            auVar44 = vsubps_avx(auVar282,auVar210);
            auVar45 = vsubps_avx(auVar358,auVar211);
            auVar104._4_4_ = auVar211._4_4_ * auVar44._4_4_;
            auVar104._0_4_ = auVar211._0_4_ * auVar44._0_4_;
            auVar104._8_4_ = auVar211._8_4_ * auVar44._8_4_;
            auVar104._12_4_ = auVar211._12_4_ * auVar44._12_4_;
            auVar104._16_4_ = auVar211._16_4_ * auVar44._16_4_;
            auVar104._20_4_ = auVar211._20_4_ * auVar44._20_4_;
            auVar104._24_4_ = auVar211._24_4_ * auVar44._24_4_;
            auVar104._28_4_ = auVar396._28_4_;
            auVar105._4_4_ = auVar210._4_4_ * auVar45._4_4_;
            auVar105._0_4_ = auVar210._0_4_ * auVar45._0_4_;
            auVar105._8_4_ = auVar210._8_4_ * auVar45._8_4_;
            auVar105._12_4_ = auVar210._12_4_ * auVar45._12_4_;
            auVar105._16_4_ = auVar210._16_4_ * auVar45._16_4_;
            auVar105._20_4_ = auVar210._20_4_ * auVar45._20_4_;
            auVar105._24_4_ = auVar210._24_4_ * auVar45._24_4_;
            auVar105._28_4_ = fStack_5a4;
            auVar47 = vsubps_avx(auVar105,auVar104);
            auVar106._4_4_ = auVar180._4_4_ * auVar45._4_4_;
            auVar106._0_4_ = auVar180._0_4_ * auVar45._0_4_;
            auVar106._8_4_ = auVar180._8_4_ * auVar45._8_4_;
            auVar106._12_4_ = auVar180._12_4_ * auVar45._12_4_;
            auVar106._16_4_ = auVar180._16_4_ * auVar45._16_4_;
            auVar106._20_4_ = auVar180._20_4_ * auVar45._20_4_;
            auVar106._24_4_ = auVar180._24_4_ * auVar45._24_4_;
            auVar106._28_4_ = auVar45._28_4_;
            auVar45 = vsubps_avx(auVar402,auVar180);
            auVar107._4_4_ = auVar211._4_4_ * auVar45._4_4_;
            auVar107._0_4_ = auVar211._0_4_ * auVar45._0_4_;
            auVar107._8_4_ = auVar211._8_4_ * auVar45._8_4_;
            auVar107._12_4_ = auVar211._12_4_ * auVar45._12_4_;
            auVar107._16_4_ = auVar211._16_4_ * auVar45._16_4_;
            auVar107._20_4_ = auVar211._20_4_ * auVar45._20_4_;
            auVar107._24_4_ = auVar211._24_4_ * auVar45._24_4_;
            auVar107._28_4_ = auVar40._28_4_;
            auVar48 = vsubps_avx(auVar107,auVar106);
            auVar108._4_4_ = auVar210._4_4_ * auVar45._4_4_;
            auVar108._0_4_ = auVar210._0_4_ * auVar45._0_4_;
            auVar108._8_4_ = auVar210._8_4_ * auVar45._8_4_;
            auVar108._12_4_ = auVar210._12_4_ * auVar45._12_4_;
            auVar108._16_4_ = auVar210._16_4_ * auVar45._16_4_;
            auVar108._20_4_ = auVar210._20_4_ * auVar45._20_4_;
            auVar108._24_4_ = auVar210._24_4_ * auVar45._24_4_;
            auVar108._28_4_ = auVar40._28_4_;
            auVar109._4_4_ = auVar180._4_4_ * auVar44._4_4_;
            auVar109._0_4_ = auVar180._0_4_ * auVar44._0_4_;
            auVar109._8_4_ = auVar180._8_4_ * auVar44._8_4_;
            auVar109._12_4_ = auVar180._12_4_ * auVar44._12_4_;
            auVar109._16_4_ = auVar180._16_4_ * auVar44._16_4_;
            auVar109._20_4_ = auVar180._20_4_ * auVar44._20_4_;
            auVar109._24_4_ = auVar180._24_4_ * auVar44._24_4_;
            auVar109._28_4_ = auVar44._28_4_;
            auVar40 = vsubps_avx(auVar109,auVar108);
            auVar217._0_4_ = auVar47._0_4_ * 0.0 + auVar40._0_4_ + auVar48._0_4_ * 0.0;
            auVar217._4_4_ = auVar47._4_4_ * 0.0 + auVar40._4_4_ + auVar48._4_4_ * 0.0;
            auVar217._8_4_ = auVar47._8_4_ * 0.0 + auVar40._8_4_ + auVar48._8_4_ * 0.0;
            auVar217._12_4_ = auVar47._12_4_ * 0.0 + auVar40._12_4_ + auVar48._12_4_ * 0.0;
            auVar217._16_4_ = auVar47._16_4_ * 0.0 + auVar40._16_4_ + auVar48._16_4_ * 0.0;
            auVar217._20_4_ = auVar47._20_4_ * 0.0 + auVar40._20_4_ + auVar48._20_4_ * 0.0;
            auVar217._24_4_ = auVar47._24_4_ * 0.0 + auVar40._24_4_ + auVar48._24_4_ * 0.0;
            auVar217._28_4_ = auVar47._28_4_ + auVar40._28_4_ + auVar48._28_4_;
            auVar175 = vcmpps_avx(auVar217,ZEXT832(0) << 0x20,2);
            auVar40 = vblendvps_avx(auVar41,_local_820,auVar175);
            auVar41 = vblendvps_avx(auVar42,_local_720,auVar175);
            auVar42 = vblendvps_avx(auVar43,auVar426,auVar175);
            auVar43 = vblendvps_avx(auVar180,auVar402,auVar175);
            auVar44 = vblendvps_avx(auVar210,auVar282,auVar175);
            auVar45 = vblendvps_avx(auVar211,auVar358,auVar175);
            auVar47 = vblendvps_avx(auVar402,auVar180,auVar175);
            auVar48 = vblendvps_avx(auVar282,auVar210,auVar175);
            auVar174 = vblendvps_avx(auVar358,auVar211,auVar175);
            auVar180 = vandps_avx(auVar173,_local_4a0);
            auVar47 = vsubps_avx(auVar47,auVar40);
            auVar212 = vsubps_avx(auVar48,auVar41);
            auVar174 = vsubps_avx(auVar174,auVar42);
            auVar240 = vsubps_avx(auVar41,auVar44);
            fVar250 = auVar212._0_4_;
            fVar380 = auVar42._0_4_;
            fVar275 = auVar212._4_4_;
            fVar291 = auVar42._4_4_;
            auVar110._4_4_ = fVar291 * fVar275;
            auVar110._0_4_ = fVar380 * fVar250;
            fVar290 = auVar212._8_4_;
            fVar298 = auVar42._8_4_;
            auVar110._8_4_ = fVar298 * fVar290;
            fVar347 = auVar212._12_4_;
            fVar300 = auVar42._12_4_;
            auVar110._12_4_ = fVar300 * fVar347;
            fVar202 = auVar212._16_4_;
            fVar302 = auVar42._16_4_;
            auVar110._16_4_ = fVar302 * fVar202;
            fVar411 = auVar212._20_4_;
            fVar328 = auVar42._20_4_;
            auVar110._20_4_ = fVar328 * fVar411;
            fVar309 = auVar212._24_4_;
            fVar329 = auVar42._24_4_;
            auVar110._24_4_ = fVar329 * fVar309;
            auVar110._28_4_ = auVar48._28_4_;
            fVar267 = auVar41._0_4_;
            fVar350 = auVar174._0_4_;
            fVar283 = auVar41._4_4_;
            fVar360 = auVar174._4_4_;
            auVar111._4_4_ = fVar360 * fVar283;
            auVar111._0_4_ = fVar350 * fVar267;
            fVar297 = auVar41._8_4_;
            fVar361 = auVar174._8_4_;
            auVar111._8_4_ = fVar361 * fVar297;
            fVar271 = auVar41._12_4_;
            fVar362 = auVar174._12_4_;
            auVar111._12_4_ = fVar362 * fVar271;
            fVar229 = auVar41._16_4_;
            fVar363 = auVar174._16_4_;
            auVar111._16_4_ = fVar363 * fVar229;
            fVar418 = auVar41._20_4_;
            fVar364 = auVar174._20_4_;
            auVar111._20_4_ = fVar364 * fVar418;
            fVar367 = auVar41._24_4_;
            fVar365 = auVar174._24_4_;
            uVar11 = auVar210._28_4_;
            auVar111._24_4_ = fVar365 * fVar367;
            auVar111._28_4_ = uVar11;
            auVar48 = vsubps_avx(auVar111,auVar110);
            fVar269 = auVar40._0_4_;
            fVar284 = auVar40._4_4_;
            auVar112._4_4_ = fVar360 * fVar284;
            auVar112._0_4_ = fVar350 * fVar269;
            fVar299 = auVar40._8_4_;
            auVar112._8_4_ = fVar361 * fVar299;
            fVar305 = auVar40._12_4_;
            auVar112._12_4_ = fVar362 * fVar305;
            fVar317 = auVar40._16_4_;
            auVar112._16_4_ = fVar363 * fVar317;
            fVar421 = auVar40._20_4_;
            auVar112._20_4_ = fVar364 * fVar421;
            fVar375 = auVar40._24_4_;
            auVar112._24_4_ = fVar365 * fVar375;
            auVar112._28_4_ = uVar11;
            fVar251 = auVar47._0_4_;
            fVar285 = auVar47._4_4_;
            auVar113._4_4_ = fVar291 * fVar285;
            auVar113._0_4_ = fVar380 * fVar251;
            fVar301 = auVar47._8_4_;
            auVar113._8_4_ = fVar298 * fVar301;
            fVar348 = auVar47._12_4_;
            auVar113._12_4_ = fVar300 * fVar348;
            fVar228 = auVar47._16_4_;
            auVar113._16_4_ = fVar302 * fVar228;
            fVar203 = auVar47._20_4_;
            auVar113._20_4_ = fVar328 * fVar203;
            fVar376 = auVar47._24_4_;
            auVar113._24_4_ = fVar329 * fVar376;
            auVar113._28_4_ = auVar402._28_4_;
            auVar210 = vsubps_avx(auVar113,auVar112);
            auVar114._4_4_ = fVar283 * fVar285;
            auVar114._0_4_ = fVar267 * fVar251;
            auVar114._8_4_ = fVar297 * fVar301;
            auVar114._12_4_ = fVar271 * fVar348;
            auVar114._16_4_ = fVar229 * fVar228;
            auVar114._20_4_ = fVar418 * fVar203;
            auVar114._24_4_ = fVar367 * fVar376;
            auVar114._28_4_ = uVar11;
            auVar115._4_4_ = fVar284 * fVar275;
            auVar115._0_4_ = fVar269 * fVar250;
            auVar115._8_4_ = fVar299 * fVar290;
            auVar115._12_4_ = fVar305 * fVar347;
            auVar115._16_4_ = fVar317 * fVar202;
            auVar115._20_4_ = fVar421 * fVar411;
            auVar115._24_4_ = fVar375 * fVar309;
            auVar115._28_4_ = auVar211._28_4_;
            auVar211 = vsubps_avx(auVar115,auVar114);
            auVar42 = vsubps_avx(auVar42,auVar45);
            fVar272 = auVar211._28_4_ + auVar210._28_4_;
            local_840._0_4_ = auVar211._0_4_ + auVar210._0_4_ * 0.0 + auVar48._0_4_ * 0.0;
            local_840._4_4_ = auVar211._4_4_ + auVar210._4_4_ * 0.0 + auVar48._4_4_ * 0.0;
            local_840._8_4_ = auVar211._8_4_ + auVar210._8_4_ * 0.0 + auVar48._8_4_ * 0.0;
            local_840._12_4_ = auVar211._12_4_ + auVar210._12_4_ * 0.0 + auVar48._12_4_ * 0.0;
            local_840._16_4_ = auVar211._16_4_ + auVar210._16_4_ * 0.0 + auVar48._16_4_ * 0.0;
            local_840._20_4_ = auVar211._20_4_ + auVar210._20_4_ * 0.0 + auVar48._20_4_ * 0.0;
            local_840._24_4_ = auVar211._24_4_ + auVar210._24_4_ * 0.0 + auVar48._24_4_ * 0.0;
            local_840._28_4_ = fVar272 + auVar48._28_4_;
            fVar270 = auVar240._0_4_;
            fVar286 = auVar240._4_4_;
            auVar116._4_4_ = auVar45._4_4_ * fVar286;
            auVar116._0_4_ = auVar45._0_4_ * fVar270;
            fVar303 = auVar240._8_4_;
            auVar116._8_4_ = auVar45._8_4_ * fVar303;
            fVar349 = auVar240._12_4_;
            auVar116._12_4_ = auVar45._12_4_ * fVar349;
            fVar289 = auVar240._16_4_;
            auVar116._16_4_ = auVar45._16_4_ * fVar289;
            fVar224 = auVar240._20_4_;
            auVar116._20_4_ = auVar45._20_4_ * fVar224;
            fVar377 = auVar240._24_4_;
            auVar116._24_4_ = auVar45._24_4_ * fVar377;
            auVar116._28_4_ = fVar272;
            fVar272 = auVar42._0_4_;
            fVar287 = auVar42._4_4_;
            auVar117._4_4_ = auVar44._4_4_ * fVar287;
            auVar117._0_4_ = auVar44._0_4_ * fVar272;
            fVar304 = auVar42._8_4_;
            auVar117._8_4_ = auVar44._8_4_ * fVar304;
            fVar273 = auVar42._12_4_;
            auVar117._12_4_ = auVar44._12_4_ * fVar273;
            fVar268 = auVar42._16_4_;
            auVar117._16_4_ = auVar44._16_4_ * fVar268;
            fVar225 = auVar42._20_4_;
            auVar117._20_4_ = auVar44._20_4_ * fVar225;
            fVar378 = auVar42._24_4_;
            auVar117._24_4_ = auVar44._24_4_ * fVar378;
            auVar117._28_4_ = auVar211._28_4_;
            auVar210 = vsubps_avx(auVar117,auVar116);
            auVar40 = vsubps_avx(auVar40,auVar43);
            fVar274 = auVar40._0_4_;
            fVar288 = auVar40._4_4_;
            auVar118._4_4_ = auVar45._4_4_ * fVar288;
            auVar118._0_4_ = auVar45._0_4_ * fVar274;
            fVar306 = auVar40._8_4_;
            auVar118._8_4_ = auVar45._8_4_ * fVar306;
            fVar307 = auVar40._12_4_;
            auVar118._12_4_ = auVar45._12_4_ * fVar307;
            fVar381 = auVar40._16_4_;
            auVar118._16_4_ = auVar45._16_4_ * fVar381;
            fVar227 = auVar40._20_4_;
            auVar118._20_4_ = auVar45._20_4_ * fVar227;
            fVar379 = auVar40._24_4_;
            auVar118._24_4_ = auVar45._24_4_ * fVar379;
            auVar118._28_4_ = auVar45._28_4_;
            auVar119._4_4_ = fVar287 * auVar43._4_4_;
            auVar119._0_4_ = fVar272 * auVar43._0_4_;
            auVar119._8_4_ = fVar304 * auVar43._8_4_;
            auVar119._12_4_ = fVar273 * auVar43._12_4_;
            auVar119._16_4_ = fVar268 * auVar43._16_4_;
            auVar119._20_4_ = fVar225 * auVar43._20_4_;
            auVar119._24_4_ = fVar378 * auVar43._24_4_;
            auVar119._28_4_ = auVar48._28_4_;
            auVar40 = vsubps_avx(auVar118,auVar119);
            auVar120._4_4_ = auVar44._4_4_ * fVar288;
            auVar120._0_4_ = auVar44._0_4_ * fVar274;
            auVar120._8_4_ = auVar44._8_4_ * fVar306;
            auVar120._12_4_ = auVar44._12_4_ * fVar307;
            auVar120._16_4_ = auVar44._16_4_ * fVar381;
            auVar120._20_4_ = auVar44._20_4_ * fVar227;
            auVar120._24_4_ = auVar44._24_4_ * fVar379;
            auVar120._28_4_ = auVar44._28_4_;
            auVar121._4_4_ = fVar286 * auVar43._4_4_;
            auVar121._0_4_ = fVar270 * auVar43._0_4_;
            auVar121._8_4_ = fVar303 * auVar43._8_4_;
            auVar121._12_4_ = fVar349 * auVar43._12_4_;
            auVar121._16_4_ = fVar289 * auVar43._16_4_;
            auVar121._20_4_ = fVar224 * auVar43._20_4_;
            auVar121._24_4_ = fVar377 * auVar43._24_4_;
            auVar121._28_4_ = auVar43._28_4_;
            auVar43 = vsubps_avx(auVar121,auVar120);
            auVar185._0_4_ = auVar210._0_4_ * 0.0 + auVar43._0_4_ + auVar40._0_4_ * 0.0;
            auVar185._4_4_ = auVar210._4_4_ * 0.0 + auVar43._4_4_ + auVar40._4_4_ * 0.0;
            auVar185._8_4_ = auVar210._8_4_ * 0.0 + auVar43._8_4_ + auVar40._8_4_ * 0.0;
            auVar185._12_4_ = auVar210._12_4_ * 0.0 + auVar43._12_4_ + auVar40._12_4_ * 0.0;
            auVar185._16_4_ = auVar210._16_4_ * 0.0 + auVar43._16_4_ + auVar40._16_4_ * 0.0;
            auVar185._20_4_ = auVar210._20_4_ * 0.0 + auVar43._20_4_ + auVar40._20_4_ * 0.0;
            auVar185._24_4_ = auVar210._24_4_ * 0.0 + auVar43._24_4_ + auVar40._24_4_ * 0.0;
            auVar185._28_4_ = auVar40._28_4_ + auVar43._28_4_ + auVar40._28_4_;
            auVar190 = ZEXT3264(auVar185);
            auVar40 = vmaxps_avx(local_840,auVar185);
            auVar40 = vcmpps_avx(auVar40,ZEXT432(0) << 0x20,2);
            auVar43 = auVar180 & auVar40;
            if ((((((((auVar43 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar43 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar43 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar43 >> 0x7f,0) == '\0') &&
                  (auVar43 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar43 >> 0xbf,0) == '\0') &&
                (auVar43 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar43[0x1f]) {
LAB_0118b5aa:
              auVar265 = ZEXT3264(CONCAT824(uStack_648,
                                            CONCAT816(uStack_650,CONCAT88(uStack_658,local_660))));
              auVar374 = ZEXT3264(CONCAT428(fVar201,CONCAT424(fVar199,CONCAT420(fVar197,CONCAT416(
                                                  fVar195,CONCAT412(fVar193,CONCAT48(fVar192,
                                                  CONCAT44(fVar191,fVar167))))))));
            }
            else {
              auVar43 = vandps_avx(auVar40,auVar180);
              auVar122._4_4_ = fVar287 * fVar275;
              auVar122._0_4_ = fVar272 * fVar250;
              auVar122._8_4_ = fVar304 * fVar290;
              auVar122._12_4_ = fVar273 * fVar347;
              auVar122._16_4_ = fVar268 * fVar202;
              auVar122._20_4_ = fVar225 * fVar411;
              auVar122._24_4_ = fVar378 * fVar309;
              auVar122._28_4_ = auVar180._28_4_;
              auVar123._4_4_ = fVar286 * fVar360;
              auVar123._0_4_ = fVar270 * fVar350;
              auVar123._8_4_ = fVar303 * fVar361;
              auVar123._12_4_ = fVar349 * fVar362;
              auVar123._16_4_ = fVar289 * fVar363;
              auVar123._20_4_ = fVar224 * fVar364;
              auVar123._24_4_ = fVar377 * fVar365;
              auVar123._28_4_ = auVar40._28_4_;
              auVar40 = vsubps_avx(auVar123,auVar122);
              auVar124._4_4_ = fVar288 * fVar360;
              auVar124._0_4_ = fVar274 * fVar350;
              auVar124._8_4_ = fVar306 * fVar361;
              auVar124._12_4_ = fVar307 * fVar362;
              auVar124._16_4_ = fVar381 * fVar363;
              auVar124._20_4_ = fVar227 * fVar364;
              auVar124._24_4_ = fVar379 * fVar365;
              auVar124._28_4_ = auVar174._28_4_;
              auVar125._4_4_ = fVar287 * fVar285;
              auVar125._0_4_ = fVar272 * fVar251;
              auVar125._8_4_ = fVar304 * fVar301;
              auVar125._12_4_ = fVar273 * fVar348;
              auVar125._16_4_ = fVar268 * fVar228;
              auVar125._20_4_ = fVar225 * fVar203;
              auVar125._24_4_ = fVar378 * fVar376;
              auVar125._28_4_ = auVar42._28_4_;
              auVar44 = vsubps_avx(auVar125,auVar124);
              auVar126._4_4_ = fVar286 * fVar285;
              auVar126._0_4_ = fVar270 * fVar251;
              auVar126._8_4_ = fVar303 * fVar301;
              auVar126._12_4_ = fVar349 * fVar348;
              auVar126._16_4_ = fVar289 * fVar228;
              auVar126._20_4_ = fVar224 * fVar203;
              auVar126._24_4_ = fVar377 * fVar376;
              auVar126._28_4_ = auVar47._28_4_;
              auVar127._4_4_ = fVar288 * fVar275;
              auVar127._0_4_ = fVar274 * fVar250;
              auVar127._8_4_ = fVar306 * fVar290;
              auVar127._12_4_ = fVar307 * fVar347;
              auVar127._16_4_ = fVar381 * fVar202;
              auVar127._20_4_ = fVar227 * fVar411;
              auVar127._24_4_ = fVar379 * fVar309;
              auVar127._28_4_ = auVar212._28_4_;
              auVar45 = vsubps_avx(auVar127,auVar126);
              auVar341._0_4_ = auVar40._0_4_ * 0.0 + auVar45._0_4_ + auVar44._0_4_ * 0.0;
              auVar341._4_4_ = auVar40._4_4_ * 0.0 + auVar45._4_4_ + auVar44._4_4_ * 0.0;
              auVar341._8_4_ = auVar40._8_4_ * 0.0 + auVar45._8_4_ + auVar44._8_4_ * 0.0;
              auVar341._12_4_ = auVar40._12_4_ * 0.0 + auVar45._12_4_ + auVar44._12_4_ * 0.0;
              auVar341._16_4_ = auVar40._16_4_ * 0.0 + auVar45._16_4_ + auVar44._16_4_ * 0.0;
              auVar341._20_4_ = auVar40._20_4_ * 0.0 + auVar45._20_4_ + auVar44._20_4_ * 0.0;
              auVar341._24_4_ = auVar40._24_4_ * 0.0 + auVar45._24_4_ + auVar44._24_4_ * 0.0;
              auVar341._28_4_ = auVar240._28_4_ + auVar45._28_4_ + auVar47._28_4_;
              auVar180 = vrcpps_avx(auVar341);
              fVar250 = auVar180._0_4_;
              fVar251 = auVar180._4_4_;
              auVar128._4_4_ = auVar341._4_4_ * fVar251;
              auVar128._0_4_ = auVar341._0_4_ * fVar250;
              fVar270 = auVar180._8_4_;
              auVar128._8_4_ = auVar341._8_4_ * fVar270;
              fVar272 = auVar180._12_4_;
              auVar128._12_4_ = auVar341._12_4_ * fVar272;
              fVar274 = auVar180._16_4_;
              auVar128._16_4_ = auVar341._16_4_ * fVar274;
              fVar275 = auVar180._20_4_;
              auVar128._20_4_ = auVar341._20_4_ * fVar275;
              fVar285 = auVar180._24_4_;
              auVar128._24_4_ = auVar341._24_4_ * fVar285;
              auVar128._28_4_ = auVar42._28_4_;
              auVar397._8_4_ = 0x3f800000;
              auVar397._0_8_ = 0x3f8000003f800000;
              auVar397._12_4_ = 0x3f800000;
              auVar397._16_4_ = 0x3f800000;
              auVar397._20_4_ = 0x3f800000;
              auVar397._24_4_ = 0x3f800000;
              auVar397._28_4_ = 0x3f800000;
              auVar180 = vsubps_avx(auVar397,auVar128);
              fVar250 = auVar180._0_4_ * fVar250 + fVar250;
              fVar251 = auVar180._4_4_ * fVar251 + fVar251;
              fVar270 = auVar180._8_4_ * fVar270 + fVar270;
              fVar272 = auVar180._12_4_ * fVar272 + fVar272;
              fVar274 = auVar180._16_4_ * fVar274 + fVar274;
              fVar275 = auVar180._20_4_ * fVar275 + fVar275;
              fVar285 = auVar180._24_4_ * fVar285 + fVar285;
              auVar129._4_4_ =
                   (fVar284 * auVar40._4_4_ + auVar44._4_4_ * fVar283 + fVar291 * auVar45._4_4_) *
                   fVar251;
              auVar129._0_4_ =
                   (fVar269 * auVar40._0_4_ + auVar44._0_4_ * fVar267 + fVar380 * auVar45._0_4_) *
                   fVar250;
              auVar129._8_4_ =
                   (fVar299 * auVar40._8_4_ + auVar44._8_4_ * fVar297 + fVar298 * auVar45._8_4_) *
                   fVar270;
              auVar129._12_4_ =
                   (fVar305 * auVar40._12_4_ + auVar44._12_4_ * fVar271 + fVar300 * auVar45._12_4_)
                   * fVar272;
              auVar129._16_4_ =
                   (fVar317 * auVar40._16_4_ + auVar44._16_4_ * fVar229 + fVar302 * auVar45._16_4_)
                   * fVar274;
              auVar129._20_4_ =
                   (fVar421 * auVar40._20_4_ + auVar44._20_4_ * fVar418 + fVar328 * auVar45._20_4_)
                   * fVar275;
              auVar129._24_4_ =
                   (fVar375 * auVar40._24_4_ + auVar44._24_4_ * fVar367 + fVar329 * auVar45._24_4_)
                   * fVar285;
              auVar129._28_4_ = auVar41._28_4_ + auVar45._28_4_;
              uVar11 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar264._4_4_ = uVar11;
              auVar264._0_4_ = uVar11;
              auVar264._8_4_ = uVar11;
              auVar264._12_4_ = uVar11;
              auVar264._16_4_ = uVar11;
              auVar264._20_4_ = uVar11;
              auVar264._24_4_ = uVar11;
              auVar264._28_4_ = uVar11;
              auVar40 = vcmpps_avx(local_4e0,auVar129,2);
              auVar180 = vcmpps_avx(auVar129,auVar264,2);
              auVar180 = vandps_avx(auVar40,auVar180);
              auVar41 = auVar43 & auVar180;
              if ((((((((auVar41 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                       (auVar41 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      (auVar41 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                     SUB321(auVar41 >> 0x7f,0) == '\0') &&
                    (auVar41 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   SUB321(auVar41 >> 0xbf,0) == '\0') &&
                  (auVar41 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                  -1 < auVar41[0x1f]) goto LAB_0118b5aa;
              auVar180 = vandps_avx(auVar43,auVar180);
              auVar41 = vcmpps_avx(auVar341,ZEXT432(0) << 0x20,4);
              auVar42 = auVar180 & auVar41;
              auVar265 = ZEXT3264(CONCAT824(uStack_648,
                                            CONCAT816(uStack_650,CONCAT88(uStack_658,local_660))));
              auVar374 = ZEXT3264(CONCAT428(fVar201,CONCAT424(fVar199,CONCAT420(fVar197,CONCAT416(
                                                  fVar195,CONCAT412(fVar193,CONCAT48(fVar192,
                                                  CONCAT44(fVar191,fVar167))))))));
              if ((((((((auVar42 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar42 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar42 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar42 >> 0x7f,0) != '\0') ||
                    (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar42 >> 0xbf,0) != '\0') ||
                  (auVar42 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar42[0x1f] < '\0') {
                auVar180 = vandps_avx(auVar41,auVar180);
                auVar265 = ZEXT3264(auVar180);
                auVar130._4_4_ = fVar251 * local_840._4_4_;
                auVar130._0_4_ = fVar250 * local_840._0_4_;
                auVar130._8_4_ = fVar270 * local_840._8_4_;
                auVar130._12_4_ = fVar272 * local_840._12_4_;
                auVar130._16_4_ = fVar274 * local_840._16_4_;
                auVar130._20_4_ = fVar275 * local_840._20_4_;
                auVar130._24_4_ = fVar285 * local_840._24_4_;
                auVar130._28_4_ = auVar40._28_4_;
                auVar131._4_4_ = auVar185._4_4_ * fVar251;
                auVar131._0_4_ = auVar185._0_4_ * fVar250;
                auVar131._8_4_ = auVar185._8_4_ * fVar270;
                auVar131._12_4_ = auVar185._12_4_ * fVar272;
                auVar131._16_4_ = auVar185._16_4_ * fVar274;
                auVar131._20_4_ = auVar185._20_4_ * fVar275;
                auVar131._24_4_ = auVar185._24_4_ * fVar285;
                auVar131._28_4_ = auVar185._28_4_;
                auVar316._8_4_ = 0x3f800000;
                auVar316._0_8_ = 0x3f8000003f800000;
                auVar316._12_4_ = 0x3f800000;
                auVar316._16_4_ = 0x3f800000;
                auVar316._20_4_ = 0x3f800000;
                auVar316._24_4_ = 0x3f800000;
                auVar316._28_4_ = 0x3f800000;
                auVar180 = vsubps_avx(auVar316,auVar130);
                local_540 = vblendvps_avx(auVar180,auVar130,auVar175);
                auVar180 = vsubps_avx(auVar316,auVar131);
                _local_560 = vblendvps_avx(auVar180,auVar131,auVar175);
                auVar190 = ZEXT3264(_local_560);
                local_600 = auVar129;
              }
            }
            auVar427 = ZEXT3264(local_640);
            auVar180 = auVar265._0_32_;
            local_5a0 = auVar39;
            if ((((((((auVar180 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar180 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar180 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar180 >> 0x7f,0) != '\0') ||
                  (auVar265 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                 SUB321(auVar180 >> 0xbf,0) != '\0') ||
                (auVar265 & (undefined1  [64])0x100000000) != (undefined1  [64])0x0) ||
                auVar265[0x1f] < '\0') {
              auVar39 = vsubps_avx(auVar326,auVar374._0_32_);
              fVar267 = auVar374._0_4_ + local_540._0_4_ * auVar39._0_4_;
              fVar269 = auVar374._4_4_ + local_540._4_4_ * auVar39._4_4_;
              fVar251 = auVar374._8_4_ + local_540._8_4_ * auVar39._8_4_;
              fVar270 = auVar374._12_4_ + local_540._12_4_ * auVar39._12_4_;
              fVar272 = auVar374._16_4_ + local_540._16_4_ * auVar39._16_4_;
              fVar274 = auVar374._20_4_ + local_540._20_4_ * auVar39._20_4_;
              fVar275 = auVar374._24_4_ + local_540._24_4_ * auVar39._24_4_;
              fVar283 = auVar374._28_4_ + auVar39._28_4_;
              fVar250 = *(float *)((long)pre->ray_space + k * 4 + -0x20);
              auVar132._4_4_ = (fVar269 + fVar269) * fVar250;
              auVar132._0_4_ = (fVar267 + fVar267) * fVar250;
              auVar132._8_4_ = (fVar251 + fVar251) * fVar250;
              auVar132._12_4_ = (fVar270 + fVar270) * fVar250;
              auVar132._16_4_ = (fVar272 + fVar272) * fVar250;
              auVar132._20_4_ = (fVar274 + fVar274) * fVar250;
              auVar132._24_4_ = (fVar275 + fVar275) * fVar250;
              auVar132._28_4_ = fVar283 + fVar283;
              auVar39 = vcmpps_avx(local_600,auVar132,6);
              auVar190 = ZEXT3264(auVar39);
              auVar40 = auVar180 & auVar39;
              if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar40 >> 0x7f,0) != '\0') ||
                    (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar40 >> 0xbf,0) != '\0') ||
                  (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar40[0x1f] < '\0') {
                local_3c0 = (float)local_560._0_4_ + (float)local_560._0_4_ + -1.0;
                fStack_3bc = (float)local_560._4_4_ + (float)local_560._4_4_ + -1.0;
                fStack_3b8 = (float)uStack_558 + (float)uStack_558 + -1.0;
                fStack_3b4 = uStack_558._4_4_ + uStack_558._4_4_ + -1.0;
                fStack_3b0 = (float)uStack_550 + (float)uStack_550 + -1.0;
                fStack_3ac = uStack_550._4_4_ + uStack_550._4_4_ + -1.0;
                fStack_3a8 = (float)uStack_548 + (float)uStack_548 + -1.0;
                fStack_3a4 = uStack_548._4_4_ + uStack_548._4_4_ + -1.0;
                local_560._4_4_ = fStack_3bc;
                local_560._0_4_ = local_3c0;
                uStack_558._0_4_ = fStack_3b8;
                uStack_558._4_4_ = fStack_3b4;
                uStack_550._0_4_ = fStack_3b0;
                uStack_550._4_4_ = fStack_3ac;
                auVar155 = _local_560;
                uStack_548._0_4_ = fStack_3a8;
                uStack_548._4_4_ = fStack_3a4;
                auVar40 = _local_560;
                local_3a0 = local_600;
                uStack_368 = uStack_918;
                uStack_358 = uStack_928;
                local_350 = local_8d0;
                uStack_348 = uStack_8c8;
                uStack_338 = uStack_8b8;
                pGVar165 = (context->scene->geometries).items[uVar32].ptr;
                _local_560 = auVar40;
                if ((pGVar165->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  local_6a0 = vandps_avx(auVar39,auVar180);
                  auVar234._0_4_ = (float)(int)local_380;
                  auVar234._4_12_ = ZEXT812(0) << 0x20;
                  auVar169 = vshufps_avx(auVar234,auVar234,0);
                  local_300[0] = (auVar169._0_4_ + local_540._0_4_ + 0.0) * (float)local_100._0_4_;
                  local_300[1] = (auVar169._4_4_ + local_540._4_4_ + 1.0) * (float)local_100._4_4_;
                  local_300[2] = (auVar169._8_4_ + local_540._8_4_ + 2.0) * fStack_f8;
                  local_300[3] = (auVar169._12_4_ + local_540._12_4_ + 3.0) * fStack_f4;
                  fStack_2f0 = (auVar169._0_4_ + local_540._16_4_ + 4.0) * fStack_f0;
                  fStack_2ec = (auVar169._4_4_ + local_540._20_4_ + 5.0) * fStack_ec;
                  fStack_2e8 = (auVar169._8_4_ + local_540._24_4_ + 6.0) * fStack_e8;
                  fStack_2e4 = auVar169._12_4_ + local_540._28_4_ + 7.0;
                  uStack_550 = auVar155._16_8_;
                  uStack_548 = auVar40._24_8_;
                  local_2e0 = local_560;
                  uStack_2d8 = uStack_558;
                  uStack_2d0 = uStack_550;
                  uStack_2c8 = uStack_548;
                  local_2c0 = local_600;
                  auVar218._8_4_ = 0x7f800000;
                  auVar218._0_8_ = 0x7f8000007f800000;
                  auVar218._12_4_ = 0x7f800000;
                  auVar218._16_4_ = 0x7f800000;
                  auVar218._20_4_ = 0x7f800000;
                  auVar218._24_4_ = 0x7f800000;
                  auVar218._28_4_ = 0x7f800000;
                  auVar180 = vblendvps_avx(auVar218,local_600,local_6a0);
                  auVar39 = vshufps_avx(auVar180,auVar180,0xb1);
                  auVar39 = vminps_avx(auVar180,auVar39);
                  auVar40 = vshufpd_avx(auVar39,auVar39,5);
                  auVar39 = vminps_avx(auVar39,auVar40);
                  auVar40 = vperm2f128_avx(auVar39,auVar39,1);
                  auVar39 = vminps_avx(auVar39,auVar40);
                  auVar39 = vcmpps_avx(auVar180,auVar39,0);
                  auVar40 = local_6a0 & auVar39;
                  auVar180 = local_6a0;
                  if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                           (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                          (auVar40 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         SUB321(auVar40 >> 0x7f,0) != '\0') ||
                        (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                       SUB321(auVar40 >> 0xbf,0) != '\0') ||
                      (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      auVar40[0x1f] < '\0') {
                    auVar180 = vandps_avx(auVar39,local_6a0);
                  }
                  uVar158 = vmovmskps_avx(auVar180);
                  uVar162 = 0;
                  if (uVar158 != 0) {
                    for (; (uVar158 >> uVar162 & 1) == 0; uVar162 = uVar162 + 1) {
                    }
                  }
                  uVar159 = (ulong)uVar162;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar165->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar250 = local_300[uVar159];
                    auVar190 = ZEXT464((uint)fVar250);
                    uVar11 = *(undefined4 *)((long)&local_2e0 + uVar159 * 4);
                    fVar269 = 1.0 - fVar250;
                    fVar267 = fVar250 * fVar269 + fVar250 * fVar269;
                    auVar169 = ZEXT416((uint)(fVar250 * fVar250 * 3.0));
                    auVar169 = vshufps_avx(auVar169,auVar169,0);
                    auVar235 = ZEXT416((uint)((fVar267 - fVar250 * fVar250) * 3.0));
                    auVar235 = vshufps_avx(auVar235,auVar235,0);
                    auVar255 = ZEXT416((uint)((fVar269 * fVar269 - fVar267) * 3.0));
                    auVar255 = vshufps_avx(auVar255,auVar255,0);
                    auVar237 = ZEXT416((uint)(fVar269 * fVar269 * -3.0));
                    auVar237 = vshufps_avx(auVar237,auVar237,0);
                    auVar236._0_4_ =
                         auVar237._0_4_ * fVar330 +
                         auVar255._0_4_ * fVar318 +
                         auVar169._0_4_ * fVar408 + auVar235._0_4_ * fVar252;
                    auVar236._4_4_ =
                         auVar237._4_4_ * fVar343 +
                         auVar255._4_4_ * fVar327 +
                         auVar169._4_4_ * fVar415 + auVar235._4_4_ * fVar223;
                    auVar236._8_4_ =
                         auVar237._8_4_ * auVar332._8_4_ +
                         auVar255._8_4_ * auVar319._8_4_ +
                         auVar169._8_4_ * auVar412._8_4_ + auVar235._8_4_ * fVar266;
                    auVar236._12_4_ =
                         auVar237._12_4_ * auVar332._12_4_ +
                         auVar255._12_4_ * auVar319._12_4_ +
                         auVar169._12_4_ * auVar412._12_4_ + auVar235._12_4_ * fVar226;
                    auVar265 = ZEXT464(*(uint *)(local_2c0 + uVar159 * 4));
                    *(uint *)(ray + k * 4 + 0x100) = *(uint *)(local_2c0 + uVar159 * 4);
                    *(float *)(ray + k * 4 + 0x180) = auVar236._0_4_;
                    uVar35 = vextractps_avx(auVar236,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar35;
                    uVar35 = vextractps_avx(auVar236,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar35;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar250;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar11;
                    *(uint *)(ray + k * 4 + 0x220) = uVar33;
                    *(uint *)(ray + k * 4 + 0x240) = uVar32;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    local_880 = ZEXT1632(*local_7b0);
                    local_800._16_8_ = *(undefined8 *)(local_7b8 + 0x10);
                    local_800._24_8_ = *(undefined8 *)(local_7b8 + 0x18);
                    uStack_810 = *(undefined8 *)(local_7b8 + 0x10);
                    _local_820 = *local_7b0;
                    uStack_808 = *(undefined8 *)(local_7b8 + 0x18);
                    auVar342 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                    auVar427 = ZEXT3264(local_600);
                    stack0xfffffffffffff868 = auVar173._8_24_;
                    local_7a0._0_8_ = pGVar165;
                    auVar359 = ZEXT864(0) << 0x20;
                    _local_700 = auVar326;
                    local_3e0 = local_540;
                    local_37c = uVar34;
                    local_370 = auVar332._0_8_;
                    local_360 = auVar319._0_8_;
                    local_340 = auVar412._0_8_;
                    while( true ) {
                      local_1c0 = local_300[uVar159];
                      local_1a0 = *(undefined4 *)((long)&local_2e0 + uVar159 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) =
                           *(undefined4 *)(local_2c0 + uVar159 * 4);
                      fVar267 = 1.0 - local_1c0;
                      fVar250 = local_1c0 * fVar267 + local_1c0 * fVar267;
                      auVar169 = ZEXT416((uint)(local_1c0 * local_1c0 * 3.0));
                      auVar169 = vshufps_avx(auVar169,auVar169,0);
                      auVar235 = ZEXT416((uint)((fVar250 - local_1c0 * local_1c0) * 3.0));
                      auVar235 = vshufps_avx(auVar235,auVar235,0);
                      auVar255 = ZEXT416((uint)((fVar267 * fVar267 - fVar250) * 3.0));
                      auVar255 = vshufps_avx(auVar255,auVar255,0);
                      local_8b0.context = context->user;
                      auVar237 = ZEXT416((uint)(fVar267 * fVar267 * -3.0));
                      auVar237 = vshufps_avx(auVar237,auVar237,0);
                      auVar238._0_4_ =
                           auVar237._0_4_ * fVar330 +
                           auVar255._0_4_ * fVar318 +
                           auVar169._0_4_ * fVar408 + auVar235._0_4_ * fVar252;
                      auVar238._4_4_ =
                           auVar237._4_4_ * fVar343 +
                           auVar255._4_4_ * fVar327 +
                           auVar169._4_4_ * fVar415 + auVar235._4_4_ * fVar223;
                      auVar238._8_4_ =
                           auVar237._8_4_ * auVar332._8_4_ +
                           auVar255._8_4_ * auVar319._8_4_ +
                           auVar169._8_4_ * auVar412._8_4_ + auVar235._8_4_ * fVar266;
                      auVar238._12_4_ =
                           auVar237._12_4_ * auVar332._12_4_ +
                           auVar255._12_4_ * auVar319._12_4_ +
                           auVar169._12_4_ * auVar412._12_4_ + auVar235._12_4_ * fVar226;
                      auStack_210 = vshufps_avx(auVar238,auVar238,0);
                      local_220[0] = (RTCHitN)auStack_210[0];
                      local_220[1] = (RTCHitN)auStack_210[1];
                      local_220[2] = (RTCHitN)auStack_210[2];
                      local_220[3] = (RTCHitN)auStack_210[3];
                      local_220[4] = (RTCHitN)auStack_210[4];
                      local_220[5] = (RTCHitN)auStack_210[5];
                      local_220[6] = (RTCHitN)auStack_210[6];
                      local_220[7] = (RTCHitN)auStack_210[7];
                      local_220[8] = (RTCHitN)auStack_210[8];
                      local_220[9] = (RTCHitN)auStack_210[9];
                      local_220[10] = (RTCHitN)auStack_210[10];
                      local_220[0xb] = (RTCHitN)auStack_210[0xb];
                      local_220[0xc] = (RTCHitN)auStack_210[0xc];
                      local_220[0xd] = (RTCHitN)auStack_210[0xd];
                      local_220[0xe] = (RTCHitN)auStack_210[0xe];
                      local_220[0xf] = (RTCHitN)auStack_210[0xf];
                      auStack_1f0 = vshufps_avx(auVar238,auVar238,0x55);
                      local_200 = auStack_1f0;
                      auStack_1d0 = vshufps_avx(auVar238,auVar238,0xaa);
                      local_1e0 = auStack_1d0;
                      fStack_1bc = local_1c0;
                      fStack_1b8 = local_1c0;
                      fStack_1b4 = local_1c0;
                      fStack_1b0 = local_1c0;
                      fStack_1ac = local_1c0;
                      fStack_1a8 = local_1c0;
                      fStack_1a4 = local_1c0;
                      uStack_19c = local_1a0;
                      uStack_198 = local_1a0;
                      uStack_194 = local_1a0;
                      uStack_190 = local_1a0;
                      uStack_18c = local_1a0;
                      uStack_188 = local_1a0;
                      uStack_184 = local_1a0;
                      local_180 = local_e0._0_8_;
                      uStack_178 = local_e0._8_8_;
                      uStack_170 = local_e0._16_8_;
                      uStack_168 = local_e0._24_8_;
                      local_160 = local_c0._0_8_;
                      uStack_158 = local_c0._8_8_;
                      uStack_150 = local_c0._16_8_;
                      uStack_148 = local_c0._24_8_;
                      auVar173 = vcmpps_avx(auVar359._0_32_,auVar359._0_32_,0xf);
                      local_7a8[1] = auVar173;
                      *local_7a8 = auVar173;
                      local_140 = (local_8b0.context)->instID[0];
                      uStack_13c = local_140;
                      uStack_138 = local_140;
                      uStack_134 = local_140;
                      uStack_130 = local_140;
                      uStack_12c = local_140;
                      uStack_128 = local_140;
                      uStack_124 = local_140;
                      local_120 = (local_8b0.context)->instPrimID[0];
                      uStack_11c = local_120;
                      uStack_118 = local_120;
                      uStack_114 = local_120;
                      uStack_110 = local_120;
                      uStack_10c = local_120;
                      uStack_108 = local_120;
                      uStack_104 = local_120;
                      local_7e0 = local_820;
                      uStack_7d8 = uStack_818;
                      uStack_7d0 = uStack_810;
                      uStack_7c8 = uStack_808;
                      local_8b0.valid = (int *)&local_7e0;
                      local_8b0.geometryUserPtr = pGVar165->userPtr;
                      local_8b0.hit = local_220;
                      local_8b0.N = 8;
                      auVar208 = local_880._0_16_;
                      auVar171 = local_800._0_16_;
                      local_8b0.ray = (RTCRayN *)ray;
                      if (pGVar165->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar374 = ZEXT1664(auVar374._0_16_);
                        local_840 = auVar173;
                        (*pGVar165->intersectionFilterN)(&local_8b0);
                        auVar342 = ZEXT1664(auVar342._0_16_);
                        auVar427 = ZEXT3264(local_600);
                        auVar359 = ZEXT1664(ZEXT816(0) << 0x40);
                        auVar208._8_8_ = uStack_7d8;
                        auVar208._0_8_ = local_7e0;
                        auVar171._8_8_ = uStack_7c8;
                        auVar171._0_8_ = uStack_7d0;
                        pGVar165 = (Geometry *)local_7a0._0_8_;
                        auVar173 = local_840;
                      }
                      auVar169 = vpcmpeqd_avx(auVar208,ZEXT816(0) << 0x40);
                      auVar235 = vpcmpeqd_avx(auVar171,ZEXT816(0) << 0x40);
                      auVar265 = ZEXT1664(auVar235);
                      auVar245._16_16_ = auVar235;
                      auVar245._0_16_ = auVar169;
                      auVar180 = auVar173 & ~auVar245;
                      if ((((((((auVar180 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar180 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar180 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar180 >> 0x7f,0) == '\0') &&
                            (auVar180 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar180 >> 0xbf,0) == '\0') &&
                          (auVar180 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar180[0x1f]) {
                        auVar186._0_4_ = auVar169._0_4_ ^ auVar173._0_4_;
                        auVar186._4_4_ = auVar169._4_4_ ^ auVar173._4_4_;
                        auVar186._8_4_ = auVar169._8_4_ ^ auVar173._8_4_;
                        auVar186._12_4_ = auVar169._12_4_ ^ auVar173._12_4_;
                        auVar186._16_4_ = auVar235._0_4_ ^ auVar173._16_4_;
                        auVar186._20_4_ = auVar235._4_4_ ^ auVar173._20_4_;
                        auVar186._24_4_ = auVar235._8_4_ ^ auVar173._24_4_;
                        auVar186._28_4_ = auVar235._12_4_ ^ auVar173._28_4_;
                      }
                      else {
                        p_Var38 = context->args->filter;
                        if ((p_Var38 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar165->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar265 = ZEXT1664(auVar235);
                          auVar374 = ZEXT1664(auVar374._0_16_);
                          local_840 = auVar173;
                          (*p_Var38)(&local_8b0);
                          auVar342 = ZEXT1664(auVar342._0_16_);
                          auVar427 = ZEXT3264(local_600);
                          auVar359 = ZEXT1664(ZEXT816(0) << 0x40);
                          auVar208._8_8_ = uStack_7d8;
                          auVar208._0_8_ = local_7e0;
                          auVar171._8_8_ = uStack_7c8;
                          auVar171._0_8_ = uStack_7d0;
                          pGVar165 = (Geometry *)local_7a0._0_8_;
                          auVar173 = local_840;
                        }
                        auVar169 = vpcmpeqd_avx(auVar208,ZEXT816(0) << 0x40);
                        auVar235 = vpcmpeqd_avx(auVar171,ZEXT816(0) << 0x40);
                        auVar219._16_16_ = auVar235;
                        auVar219._0_16_ = auVar169;
                        auVar186._0_4_ = auVar169._0_4_ ^ auVar173._0_4_;
                        auVar186._4_4_ = auVar169._4_4_ ^ auVar173._4_4_;
                        auVar186._8_4_ = auVar169._8_4_ ^ auVar173._8_4_;
                        auVar186._12_4_ = auVar169._12_4_ ^ auVar173._12_4_;
                        auVar186._16_4_ = auVar235._0_4_ ^ auVar173._16_4_;
                        auVar186._20_4_ = auVar235._4_4_ ^ auVar173._20_4_;
                        auVar186._24_4_ = auVar235._8_4_ ^ auVar173._24_4_;
                        auVar186._28_4_ = auVar235._12_4_ ^ auVar173._28_4_;
                        auVar173 = auVar173 & ~auVar219;
                        if ((((((((auVar173 >> 0x1f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0 ||
                                 (auVar173 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                                 ) || (auVar173 >> 0x5f & (undefined1  [32])0x1) !=
                                      (undefined1  [32])0x0) || SUB321(auVar173 >> 0x7f,0) != '\0')
                              || (auVar173 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0
                              ) || SUB321(auVar173 >> 0xbf,0) != '\0') ||
                            (auVar173 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                            auVar173[0x1f] < '\0') {
                          auVar173 = vmaskmovps_avx(auVar186,*(undefined1 (*) [32])local_8b0.hit);
                          *(undefined1 (*) [32])(local_8b0.ray + 0x180) = auVar173;
                          auVar173 = vmaskmovps_avx(auVar186,*(undefined1 (*) [32])
                                                              (local_8b0.hit + 0x20));
                          *(undefined1 (*) [32])(local_8b0.ray + 0x1a0) = auVar173;
                          auVar173 = vmaskmovps_avx(auVar186,*(undefined1 (*) [32])
                                                              (local_8b0.hit + 0x40));
                          *(undefined1 (*) [32])(local_8b0.ray + 0x1c0) = auVar173;
                          auVar173 = vmaskmovps_avx(auVar186,*(undefined1 (*) [32])
                                                              (local_8b0.hit + 0x60));
                          *(undefined1 (*) [32])(local_8b0.ray + 0x1e0) = auVar173;
                          auVar173 = vmaskmovps_avx(auVar186,*(undefined1 (*) [32])
                                                              (local_8b0.hit + 0x80));
                          *(undefined1 (*) [32])(local_8b0.ray + 0x200) = auVar173;
                          auVar173 = vmaskmovps_avx(auVar186,*(undefined1 (*) [32])
                                                              (local_8b0.hit + 0xa0));
                          *(undefined1 (*) [32])(local_8b0.ray + 0x220) = auVar173;
                          auVar173 = vmaskmovps_avx(auVar186,*(undefined1 (*) [32])
                                                              (local_8b0.hit + 0xc0));
                          *(undefined1 (*) [32])(local_8b0.ray + 0x240) = auVar173;
                          auVar173 = vmaskmovps_avx(auVar186,*(undefined1 (*) [32])
                                                              (local_8b0.hit + 0xe0));
                          *(undefined1 (*) [32])(local_8b0.ray + 0x260) = auVar173;
                          auVar173 = vmaskmovps_avx(auVar186,*(undefined1 (*) [32])
                                                              (local_8b0.hit + 0x100));
                          *(undefined1 (*) [32])(local_8b0.ray + 0x280) = auVar173;
                        }
                      }
                      if ((((((((auVar186 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (auVar186 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (auVar186 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(auVar186 >> 0x7f,0) == '\0') &&
                            (auVar186 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(auVar186 >> 0xbf,0) == '\0') &&
                          (auVar186 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < auVar186[0x1f]) {
                        *(int *)(ray + k * 4 + 0x100) = auVar342._0_4_;
                      }
                      else {
                        auVar342 = ZEXT464(*(uint *)(ray + k * 4 + 0x100));
                      }
                      *(undefined4 *)(local_6a0 + uVar159 * 4) = 0;
                      auVar169 = vshufps_avx(auVar342._0_16_,auVar342._0_16_,0);
                      auVar187._16_16_ = auVar169;
                      auVar187._0_16_ = auVar169;
                      auVar180 = vcmpps_avx(auVar427._0_32_,auVar187,2);
                      auVar173 = vandps_avx(auVar180,local_6a0);
                      auVar190 = ZEXT3264(auVar173);
                      local_6a0 = local_6a0 & auVar180;
                      if ((((((((local_6a0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0
                               && (local_6a0 >> 0x3f & (undefined1  [32])0x1) ==
                                  (undefined1  [32])0x0) &&
                              (local_6a0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0)
                             && SUB321(local_6a0 >> 0x7f,0) == '\0') &&
                            (local_6a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                           SUB321(local_6a0 >> 0xbf,0) == '\0') &&
                          (local_6a0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                          -1 < local_6a0[0x1f]) break;
                      auVar220._8_4_ = 0x7f800000;
                      auVar220._0_8_ = 0x7f8000007f800000;
                      auVar220._12_4_ = 0x7f800000;
                      auVar220._16_4_ = 0x7f800000;
                      auVar220._20_4_ = 0x7f800000;
                      auVar220._24_4_ = 0x7f800000;
                      auVar220._28_4_ = 0x7f800000;
                      auVar180 = vblendvps_avx(auVar220,auVar427._0_32_,auVar173);
                      auVar39 = vshufps_avx(auVar180,auVar180,0xb1);
                      auVar39 = vminps_avx(auVar180,auVar39);
                      auVar40 = vshufpd_avx(auVar39,auVar39,5);
                      auVar39 = vminps_avx(auVar39,auVar40);
                      auVar40 = vperm2f128_avx(auVar39,auVar39,1);
                      auVar39 = vminps_avx(auVar39,auVar40);
                      auVar39 = vcmpps_avx(auVar180,auVar39,0);
                      auVar40 = auVar173 & auVar39;
                      auVar180 = auVar173;
                      if ((((((((auVar40 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar40 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               ) || (auVar40 >> 0x5f & (undefined1  [32])0x1) !=
                                    (undefined1  [32])0x0) || SUB321(auVar40 >> 0x7f,0) != '\0') ||
                            (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar40 >> 0xbf,0) != '\0') ||
                          (auVar40 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar40[0x1f] < '\0') {
                        auVar180 = vandps_avx(auVar39,auVar173);
                      }
                      uVar158 = vmovmskps_avx(auVar180);
                      uVar162 = 0;
                      if (uVar158 != 0) {
                        for (; (uVar158 >> uVar162 & 1) == 0; uVar162 = uVar162 + 1) {
                        }
                      }
                      uVar159 = (ulong)uVar162;
                      local_6a0 = auVar173;
                    }
                    auVar427 = ZEXT3264(local_640);
                  }
                }
              }
            }
            fVar251 = (float)local_6e0._0_4_;
            fVar270 = (float)local_6e0._4_4_;
            fVar272 = fStack_6d8;
            fVar274 = fStack_6d4;
            fVar275 = fStack_6d0;
            fVar283 = fStack_6cc;
            fVar284 = fStack_6c8;
            fVar285 = fStack_6c4;
          }
          lVar166 = lVar166 + 8;
          fVar381 = (float)local_780._0_4_;
          fVar411 = (float)local_780._4_4_;
          fVar418 = fStack_778;
          fVar421 = fStack_774;
          fVar250 = fStack_770;
          fVar267 = fStack_76c;
          fVar269 = fStack_768;
        } while ((int)lVar166 < (int)uVar34);
      }
      uVar11 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar181._4_4_ = uVar11;
      auVar181._0_4_ = uVar11;
      auVar181._8_4_ = uVar11;
      auVar181._12_4_ = uVar11;
      auVar181._16_4_ = uVar11;
      auVar181._20_4_ = uVar11;
      auVar181._24_4_ = uVar11;
      auVar181._28_4_ = uVar11;
      auVar173 = vcmpps_avx(local_80,auVar181,2);
      uVar162 = vmovmskps_avx(auVar173);
      uVar156 = uVar156 & uVar156 + 0xff & uVar162;
    } while (uVar156 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }